

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReactorCvodeJacobian.cpp
# Opt level: O3

int pele::physics::reactions::cvode::cJac
              (Real param_1,N_Vector u,N_Vector param_3,SUNMatrix J,void *user_data,N_Vector param_6
              ,N_Vector param_7,N_Vector param_8)

{
  int iVar1;
  long lVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double *__s;
  undefined1 auVar7 [8];
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  int i;
  realtype *prVar11;
  long lVar12;
  double *pdVar13;
  double *pdVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  double dVar41;
  undefined1 auVar32 [16];
  undefined8 extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined8 extraout_XMM0_Qb_03;
  undefined1 auVar37 [16];
  undefined8 extraout_XMM0_Qb_04;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  ulong extraout_XMM0_Qb_05;
  undefined1 auVar40 [16];
  undefined8 extraout_XMM0_Qb_06;
  double dVar42;
  double dVar43;
  double dVar44;
  double dVar45;
  double dVar46;
  double dVar47;
  double dVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  double dVar59;
  double dVar60;
  double dVar61;
  double dVar62;
  double dVar70;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  double dVar71;
  double dVar72;
  double dVar73;
  double dVar74;
  double dVar75;
  double dVar76;
  double dVar77;
  double dVar78;
  double dVar79;
  double dVar80;
  double dVar81;
  double dVar82;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  double dVar92;
  double dVar93;
  double dVar94;
  double dVar95;
  double dVar96;
  double dVar97;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  double dVar101;
  double dVar102;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  double dVar105;
  double dVar106;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  double dVar109;
  double dVar110;
  double dVar113;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  Real T_1;
  undefined4 uVar114;
  Real invT_1;
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  double dVar118;
  undefined1 auVar119 [16];
  Real invT;
  Real c [21];
  Real h_RT [21];
  Real T;
  Real c_R [21];
  Real dcRdT [21];
  Real massfrac [21];
  undefined1 local_2138 [16];
  double local_2128;
  double local_2118;
  double local_20f8;
  double local_20e8;
  double local_20b8;
  double local_2088;
  double dStack_2080;
  double local_1f38 [7];
  undefined1 auStack_1f00 [8];
  double local_1ef8;
  double dStack_1ef0;
  undefined1 local_1ee8 [8];
  double dStack_1ee0;
  double local_1ed8;
  double dStack_1ed0;
  double local_1ec8;
  double dStack_1ec0;
  double local_1eb8;
  double dStack_1eb0;
  double local_1ea8;
  undefined8 uStack_1ea0;
  undefined8 local_1e98;
  undefined1 local_1e88 [16];
  double local_1e78;
  double dStack_1e70;
  double local_1e68;
  double dStack_1e60;
  double local_1e58;
  double dStack_1e50;
  double local_1e48;
  double dStack_1e40;
  double local_1e38;
  double dStack_1e30;
  undefined1 local_1e28 [16];
  double local_1e18;
  double dStack_1e10;
  undefined1 local_1e08 [16];
  double local_1df8 [22];
  double local_1d48;
  double dStack_1d40;
  double local_1d38;
  undefined8 uStack_1d30;
  double local_1d28;
  double dStack_1d20;
  double local_1d18;
  undefined8 uStack_1d10;
  double local_1d08;
  undefined8 uStack_1d00;
  undefined1 local_1cf8 [16];
  double local_1ce8;
  double dStack_1ce0;
  double local_1cd8;
  double dStack_1cd0;
  double local_1cc8;
  double dStack_1cc0;
  double local_1cb8;
  double dStack_1cb0;
  double local_1ca8;
  double dStack_1ca0;
  double local_1c98;
  double dStack_1c90;
  double local_1c88;
  double dStack_1c80;
  double local_1c78;
  double dStack_1c70;
  double local_1c68;
  double dStack_1c60;
  double local_1c58;
  double dStack_1c50;
  double local_1c48;
  undefined1 local_1c38 [16];
  double local_1c28;
  double dStack_1c20;
  double local_1c18;
  undefined8 uStack_1c10;
  double local_1c08;
  undefined8 uStack_1c00;
  double local_1bf8;
  undefined8 uStack_1bf0;
  double local_1be8;
  undefined8 uStack_1be0;
  double local_1bd8;
  double dStack_1bd0;
  double local_1bc8;
  undefined8 uStack_1bc0;
  realtype local_1bb8;
  ulong uStack_1bb0;
  double local_1ba8 [22];
  double local_1af8;
  double dStack_1af0;
  double local_1ae8;
  double dStack_1ae0;
  double local_1ad8;
  double dStack_1ad0;
  double local_1ac0;
  undefined1 local_1ab8 [16];
  double local_1aa8;
  double dStack_1aa0;
  double local_1a98;
  double dStack_1a90;
  double local_1a88;
  double dStack_1a80;
  double local_1a78;
  undefined8 uStack_1a70;
  undefined1 local_1a68 [16];
  double local_1a58;
  ulong uStack_1a50;
  double local_1a48;
  ulong uStack_1a40;
  undefined1 local_1a38 [16];
  double local_1a28;
  undefined8 uStack_1a20;
  double local_1a18;
  undefined8 uStack_1a10;
  double local_1a08;
  double dStack_1a00;
  double local_19f8;
  double dStack_19f0;
  undefined1 local_19e8 [16];
  double local_19d8;
  double dStack_19d0;
  double local_19c8;
  double dStack_19c0;
  double local_19b8;
  undefined8 uStack_19b0;
  double local_19a8;
  double local_1998;
  undefined8 uStack_1990;
  double local_1988;
  undefined8 uStack_1980;
  double local_1978;
  double dStack_1970;
  double local_1968;
  double dStack_1960;
  double local_1958;
  undefined8 uStack_1950;
  double local_1948;
  double dStack_1940;
  double local_1930;
  double local_1928;
  double dStack_1920;
  double local_1918;
  undefined8 uStack_1910;
  double local_1908;
  double dStack_1900;
  undefined1 local_18f8 [16];
  double local_18e8;
  double dStack_18e0;
  double local_18d8;
  double dStack_18d0;
  undefined1 local_18c8 [16];
  double local_18b8;
  undefined8 uStack_18b0;
  double local_18a8;
  undefined8 uStack_18a0;
  double local_1898;
  undefined8 uStack_1890;
  double local_1888;
  double dStack_1880;
  double local_1878;
  ulong uStack_1870;
  double local_1868;
  double dStack_1860;
  double local_1858;
  double dStack_1850;
  double local_1848;
  double dStack_1840;
  double local_1838;
  undefined8 uStack_1830;
  double local_1828;
  undefined8 uStack_1820;
  undefined8 local_1818;
  double dStack_1810;
  double local_1808;
  undefined8 uStack_1800;
  double local_17f8;
  undefined8 uStack_17f0;
  double local_17e8;
  undefined8 uStack_17e0;
  double local_17d8;
  double dStack_17d0;
  double local_17c8;
  undefined8 uStack_17c0;
  double local_17b8;
  double dStack_17b0;
  double local_17a8;
  double dStack_17a0;
  double local_1798;
  undefined8 uStack_1790;
  double local_1788;
  double local_1778;
  double local_1768;
  double dStack_1760;
  double local_1758;
  double dStack_1750;
  double local_1748;
  undefined8 uStack_1740;
  double local_1738;
  undefined8 uStack_1730;
  double local_1728;
  double dStack_1720;
  double local_1718;
  double dStack_1710;
  double local_1708;
  undefined8 uStack_1700;
  undefined1 local_16f8 [16];
  undefined1 local_16e8 [16];
  double local_16d8;
  undefined8 uStack_16d0;
  double local_16c8;
  undefined8 uStack_16c0;
  double local_16b8;
  double dStack_16b0;
  double local_16a0 [2];
  double local_1690;
  double dStack_1688;
  double local_1680;
  double local_1678;
  double local_1670;
  double local_1668;
  double local_1660;
  double local_1658;
  double local_1650;
  double local_1648;
  double local_1640;
  double local_1638;
  double local_1630;
  double local_1628;
  double local_1620;
  double local_1618;
  double local_1610;
  double local_1608 [3];
  double local_15f0 [2];
  undefined1 auStack_15e0 [16];
  double local_15d0;
  double dStack_15c8;
  double local_15c0;
  double local_15b8;
  double local_15b0;
  double local_15a8;
  double dStack_15a0;
  double local_1598;
  double local_1590;
  double local_1588;
  double local_1580;
  double local_1578;
  double dStack_1570;
  double local_1568;
  double local_1560;
  double local_1558;
  double local_1538;
  double local_1530;
  double dStack_1528;
  double local_1520;
  double dStack_1518;
  double local_1510;
  double local_1508;
  double local_1500;
  double local_14f8;
  double local_14f0;
  double local_14e8;
  double local_14e0;
  double local_14d8;
  double local_14d0;
  double local_14c8;
  double local_14c0;
  double local_14b8;
  double local_14b0;
  double local_14a8;
  double local_1488;
  double local_1480;
  double dStack_1478;
  double local_1470;
  double dStack_1468;
  double local_1460;
  double dStack_1458;
  double local_1450;
  double local_1448;
  double local_1440;
  double local_1438;
  double local_1430;
  double local_1428;
  double local_1420;
  double local_1418;
  double local_1410;
  double local_1408;
  double local_1400;
  double local_13d8;
  double local_13d0;
  double dStack_13c8;
  undefined1 local_13c0 [16];
  double local_13b0;
  double local_13a8;
  double dStack_13a0;
  double local_1398;
  double local_1390;
  double local_1388;
  double local_1380;
  double local_1378;
  double local_1370;
  double local_1368;
  double local_1360;
  double local_1350;
  double local_1348;
  double local_1328;
  double local_1320;
  double dStack_1318;
  double local_1310;
  double local_1308;
  double local_1300;
  double local_12f8;
  double local_12f0;
  double local_12e8;
  double local_12e0;
  double local_12d8;
  double local_12d0;
  double local_12c8;
  double local_12c0;
  double local_12b8;
  double local_12b0;
  double local_12a8;
  double local_12a0;
  double local_1298;
  double local_1278;
  double local_1270;
  double local_1268;
  double local_1260;
  double dStack_1258;
  double local_1250;
  double dStack_1248;
  double dStack_1240;
  double local_1230;
  double local_1228;
  double local_1220;
  double local_1218;
  double local_1210;
  double local_1208;
  double local_1200;
  double local_11f8;
  double local_11f0;
  double local_11c8;
  double local_11c0;
  double local_11b8;
  double local_11b0;
  double local_11a8;
  double local_11a0;
  double local_1198;
  double dStack_1190;
  double local_1188;
  double local_1180;
  double local_1178;
  double local_1160;
  double local_1158;
  double local_1148;
  double local_1118;
  double local_1110;
  double local_1108;
  double local_1100;
  double local_10f8;
  double local_10f0;
  double local_10e0;
  double local_10d8;
  double local_10d0;
  double local_10c8;
  double local_10c0;
  double local_10b8;
  double local_10b0;
  double local_10a8;
  double local_1098;
  double local_1068;
  double local_1060;
  double local_1058;
  double local_1050;
  double local_1048;
  double local_1040;
  double local_1038;
  double local_1030;
  double local_1028;
  double local_1020;
  double local_1018;
  double dStack_1010;
  double local_1000;
  double dStack_ff8;
  double local_ff0;
  double local_fe8;
  double local_fe0;
  double local_fd8;
  double local_fb8;
  double local_fb0;
  double dStack_fa8;
  double local_fa0;
  double local_f98;
  double local_f90;
  double local_f88;
  double local_f80;
  double local_f78;
  double local_f70;
  double local_f68;
  double dStack_f60;
  double local_f58;
  double local_f50;
  double local_f48;
  double local_f40;
  double local_f38;
  double local_f30;
  double local_f28;
  double local_f08;
  double local_f00;
  double dStack_ef8;
  double local_ef0;
  double local_ee8;
  double local_ee0;
  double local_ed8;
  double local_ed0;
  double local_ec8;
  double local_ec0;
  double local_eb8;
  double dStack_eb0;
  double dStack_ea8;
  double local_ea0;
  double local_e98;
  double local_e90;
  double local_e88;
  double local_e80;
  double local_e78;
  double local_e58;
  double local_e50;
  double dStack_e48;
  double local_e40;
  double local_e38;
  double local_e28;
  double local_e20;
  double local_e18;
  double local_e10;
  double local_e08;
  double local_e00;
  double local_df8;
  double local_df0;
  double local_de8;
  double local_de0;
  double local_dd8;
  double local_dd0;
  double local_dc8;
  double local_da8;
  double local_da0;
  double local_d98;
  double local_d90;
  double local_d88;
  double local_d80;
  double local_d78;
  double local_d70;
  double local_d68;
  double local_d60;
  double local_d58;
  double local_d50;
  double local_d48;
  double local_d40;
  double local_d38;
  double local_d28;
  double local_cf8;
  double local_cf0;
  double local_ce8;
  double local_ce0;
  double local_cd8;
  double local_cd0;
  double local_cc8;
  double dStack_cc0;
  double local_cb8;
  double local_cb0;
  double local_ca8;
  double local_ca0;
  double local_c98;
  double local_c90;
  double local_c88;
  double local_c80;
  double local_c70;
  double local_c40;
  double local_c38;
  double local_c30;
  double local_c28;
  double local_c18;
  double local_c00;
  double local_bd8;
  double local_bd0;
  double local_b90;
  double local_b88;
  double local_b80;
  double local_b68;
  double local_b60;
  double local_b58;
  double dStack_b50;
  double local_b30;
  double local_b18;
  double local_b10;
  double local_ae8;
  double local_ae0;
  double local_ad8;
  double local_ad0;
  double local_ac8;
  double local_ac0;
  double local_ab8;
  double local_aa0;
  double local_a98;
  double local_a78;
  double local_a68;
  double local_a60;
  double local_a58;
  double local_a38;
  double local_a30;
  double dStack_a28;
  double local_a20;
  double local_a18;
  double local_a10;
  double local_a08;
  double local_a00;
  double local_9f0;
  double local_9e8;
  double local_9e0;
  double local_9d8;
  double local_9d0;
  double local_9c8;
  double local_9c0;
  double local_9b8;
  double local_9b0;
  double local_9a8;
  double local_980;
  double local_970;
  double local_958;
  double local_950;
  double local_948;
  double local_8d8;
  double local_8d0;
  double dStack_8c8;
  double local_8c0;
  double local_8b8;
  double local_8b0;
  double local_8a8;
  double local_8a0;
  double local_898;
  double local_890;
  double local_888;
  double local_880;
  double local_878;
  double local_870;
  double local_868;
  double local_858;
  double local_850;
  double local_848;
  double local_828 [10];
  undefined1 local_7d8 [16];
  double local_7c8;
  double dStack_7c0;
  double dStack_7b8;
  double dStack_7b0;
  double dStack_7a8;
  double dStack_7a0;
  double local_798;
  double local_780;
  double local_778;
  ulong uStack_770;
  double local_768;
  ulong uStack_760;
  double local_758;
  double dStack_750;
  double local_748;
  undefined8 uStack_740;
  double local_738;
  ulong uStack_730;
  double local_728;
  double dStack_720;
  double local_718;
  double dStack_710;
  double local_708;
  undefined8 uStack_700;
  double local_6f8;
  double dStack_6f0;
  double local_6e8;
  double dStack_6e0;
  double local_6d8;
  undefined8 uStack_6d0;
  double local_6c8;
  undefined8 uStack_6c0;
  double local_6b8;
  ulong uStack_6b0;
  double local_6a8;
  double dStack_6a0;
  double local_698;
  double dStack_690;
  double local_688;
  undefined8 uStack_680;
  double local_678;
  undefined8 uStack_670;
  double local_668;
  double dStack_660;
  double local_658;
  double dStack_650;
  double local_648;
  ulong uStack_640;
  double local_638;
  double dStack_630;
  double local_628;
  undefined8 uStack_620;
  double local_618;
  undefined8 uStack_610;
  double local_608;
  double dStack_600;
  double local_5f8;
  double dStack_5f0;
  double local_5e8;
  double dStack_5e0;
  double local_5d8;
  double local_5c8;
  undefined8 uStack_5c0;
  double local_5b8;
  double dStack_5b0;
  double local_5a8;
  double dStack_5a0;
  double local_598;
  double dStack_590;
  double local_588;
  double dStack_580;
  double local_578;
  undefined8 uStack_570;
  realtype *local_560;
  double local_558 [22];
  double local_4a8 [22];
  double local_3f8;
  double dStack_3f0;
  double local_3e8;
  double local_3d8;
  undefined8 uStack_3d0;
  double local_3c8;
  double dStack_3c0;
  double local_3b8;
  double dStack_3b0;
  double local_3a8;
  double local_398;
  double dStack_390;
  undefined8 local_388;
  double dStack_380;
  double local_378;
  ulong uStack_370;
  long local_360;
  SUNMatrix local_358;
  double local_350;
  double local_348;
  double local_340;
  undefined1 local_338 [16];
  double local_328;
  ulong uStack_320;
  double local_318;
  ulong uStack_310;
  double local_308;
  double dStack_300;
  double local_2f8;
  double dStack_2f0;
  double local_2e8;
  double dStack_2e0;
  double local_2d8;
  double dStack_2d0;
  double local_2c8;
  double dStack_2c0;
  double local_2b8;
  double dStack_2b0;
  double local_2a8;
  double dStack_2a0;
  double local_298;
  double dStack_290;
  double local_288;
  double dStack_280;
  double local_278;
  double dStack_270;
  double local_268;
  double local_260;
  double local_258;
  double local_248;
  undefined8 uStack_240;
  double local_238 [22];
  double local_188 [22];
  double adStack_d8 [21];
  
  local_358 = J;
  prVar11 = N_VGetArrayPointer(u);
  local_360 = (long)*(int *)((long)user_data + 8);
  if (0 < local_360) {
    iVar1 = *(int *)((long)user_data + 0x14);
    lVar18 = 0;
    __s = local_16a0 + 1;
    lVar15 = 0;
    local_560 = prVar11;
    do {
      local_238[0] = 2.016;
      local_238[1] = 1.008;
      local_238[2] = 15.999;
      local_238[3] = 31.998;
      local_238[4] = 17.007;
      local_238[5] = 18.015;
      local_238[6] = 33.006;
      local_238[7] = 14.027;
      local_238[8] = 14.027;
      local_238[9] = 15.035;
      local_238[10] = 16.043;
      local_238[0xb] = 28.01;
      local_238[0xc] = 44.009;
      local_238[0xd] = 29.018;
      local_238[0xe] = 30.026;
      local_238[0xf] = 31.034;
      local_238[0x10] = 28.054;
      local_238[0x11] = 29.062;
      local_238[0x12] = 30.07;
      local_238[0x13] = 28.014;
      local_238[0x14] = 39.95;
      lVar12 = 0;
      dVar42 = 0.0;
      do {
        dVar42 = dVar42 + prVar11[lVar12];
        lVar12 = lVar12 + 1;
      } while (lVar12 != 0x15);
      local_1bb8 = local_560[lVar15 * 0x16 + 0x15];
      uStack_1bb0 = 0;
      memset(local_188,0,0xa8);
      lVar12 = 0;
      do {
        local_188[lVar12] = prVar11[lVar12] / dVar42;
        lVar12 = lVar12 + 1;
      } while (lVar12 != 0x15);
      memset(__s,0,0xf20);
      local_1f38[0] = 0.49603174603174605;
      local_1f38[1] = 0.9920634920634921;
      local_1f38[2] = 0.06250390649415588;
      local_1f38[3] = 0.03125195324707794;
      local_1f38[4] = 0.05879931792791203;
      local_1f38[5] = 0.055509297807382736;
      local_1f38[6] = 0.030297521662727988;
      auStack_1f00 = (undefined1  [8])0x3fb24021df7a429e;
      local_1ef8 = 0.07129108148570615;
      dStack_1ef0 = 0.06651147322913202;
      local_1ee8 = (undefined1  [8])0x3fafea0b02aa32d7;
      dStack_1ee0 = 0.035701535166012134;
      local_1ed8 = 0.022722624917630486;
      dStack_1ed0 = 0.03446136880556896;
      local_1ec8 = 0.033304469459801506;
      dStack_1ec0 = 0.032222723464587225;
      local_1eb8 = 0.035645540742853074;
      dStack_1eb0 = 0.034409194136673316;
      local_1ea8 = 0.03325573661456601;
      uStack_1ea0 = 0x3fa246cdaf410bdd;
      local_1e98 = 0x3f99a1cd6070c7ee;
      lVar12 = 0;
      do {
        adStack_d8[lVar12] = local_188[lVar12] * dVar42 * local_1f38[lVar12];
        lVar12 = lVar12 + 1;
      } while (lVar12 != 0x15);
      lVar12 = 0;
      do {
        local_1df8[lVar12] = adStack_d8[lVar12] * 1000000.0;
        lVar12 = lVar12 + 1;
      } while (lVar12 != 0x15);
      memset(__s,0,0xf20);
      memset(local_1f38,0,0xa8);
      local_1e08._0_8_ = log(local_1bb8);
      local_768 = local_1bb8 * local_1bb8;
      uStack_760 = uStack_1bb0;
      local_648 = local_1bb8 * local_768;
      dVar42 = 1.0 / local_1bb8;
      local_19b8 = 12186.6002121605 / local_1bb8;
      uStack_19b0 = 0;
      local_1d38 = 0.0;
      lVar12 = 0;
      uStack_640 = uStack_1bb0;
      do {
        local_1d38 = local_1d38 + local_1df8[lVar12];
        lVar12 = lVar12 + 1;
      } while (lVar12 != 0x15);
      local_6b8 = local_1bb8 * local_648;
      if (1000.0 <= local_1bb8) {
        local_1878 = local_6b8 * -1.00127688e-15 +
                     local_648 * 1.496386616666667e-11 +
                     local_768 * -8.324279633333333e-08 +
                     local_1bb8 * 2.470123655e-05 +
                     (double)local_1e08._0_8_ * -3.3372792 + dVar42 * -950.158922 + 6.54230251;
        local_1d28 = local_6b8 * -2.490986785e-23 +
                     local_648 * 3.945960291666667e-19 +
                     local_768 * -2.692699133333334e-15 +
                     local_1bb8 * 1.154214865e-11 +
                     (double)local_1e08._0_8_ * -2.50000001 + dVar42 * 25473.6599 + 2.946682924;
        local_1858 = local_6b8 * 2.667543555e-15 +
                     local_648 * -4.909681483333334e-11 +
                     local_768 * 4.140760216666667e-07 +
                     local_1bb8 * -0.00247847763 +
                     (double)local_1e08._0_8_ * -2.77217438 + dVar42 * 4011.91815 + -7.02617054;
        dStack_1850 = local_6b8 * 2.33577197e-15 +
                      local_648 * -4.9640387e-11 +
                      local_768 * 4.978572466666667e-07 +
                      local_1bb8 * -0.003619950185 +
                      (double)local_1e08._0_8_ * -2.28571772 + dVar42 * 16775.5843 + -6.19435407;
        local_1868 = local_6b8 * 1.01823858e-15 +
                     local_648 * -1.9171084e-11 +
                     local_768 * 1.664709618333334e-07 +
                     local_1bb8 * -0.001031263715 +
                     (double)local_1e08._0_8_ * -2.71518561 + dVar42 * -14151.8724 + -5.10350211;
        dStack_1860 = local_6b8 * -5.8706188e-16 +
                      local_648 * 7.3288463e-12 +
                      local_768 * -2.108420466666667e-08 +
                      local_1bb8 * -0.000274214858 +
                      (double)local_1e08._0_8_ * -3.09288767 + dVar42 * 3858.657 + -1.38380843;
        local_1c38._8_8_ =
             local_6b8 * 4.419278200000001e-15 +
             local_648 * -8.386767666666666e-11 +
             local_768 * 7.370980216666666e-07 +
             local_1bb8 * -0.00460000041 +
             (double)local_1e08._0_8_ * -1.76069008 + dVar42 * -13995.8323 + -11.89563292;
        local_1c38._0_8_ =
             local_6b8 * 1.08358897e-15 +
             local_648 * -1.745587958333333e-11 +
             local_768 * 1.263277781666667e-07 +
             local_1bb8 * -0.00074154377 +
             (double)local_1e08._0_8_ * -3.28253784 + dVar42 * -1088.45772 + -2.17069345;
        local_1bd8 = local_6b8 * 1.698581825e-15 +
                     local_648 * -3.48255e-11 +
                     local_768 * 3.353199116666667e-07 +
                     local_1bb8 * -0.002327943185 +
                     (double)local_1e08._0_8_ * -2.29203842 + dVar42 * 50925.9997 + -6.33446327;
        dStack_1bd0 = local_6b8 * 9.38637835e-16 +
                      local_648 * -2.168162908333333e-11 +
                      local_768 * 2.348243283333333e-07 +
                      local_1bb8 * -0.00182819646 +
                      (double)local_1e08._0_8_ * -2.87410113 + dVar42 * 46263.604 + -3.29709211;
        local_758 = local_6b8 * 7.4820788e-15 +
                    local_648 * -1.460147408333333e-10 +
                    local_768 * 1.330344446666667e-06 +
                    local_1bb8 * -0.0086986361 +
                    (double)local_1e08._0_8_ * -1.95465642 + dVar42 * 12857.52 + -11.50777788;
        dStack_750 = local_6b8 * -6.141684549999999e-17 +
                     local_648 * 8.348149916666666e-13 +
                     local_768 * -6.991409816666667e-09 +
                     local_1bb8 * 4.298705685e-05 +
                     (double)local_1e08._0_8_ * -2.56942078 +
                     dVar42 * 29217.5791 + -2.214917859999999;
        local_1cf8._8_8_ =
             local_6b8 * -8.4100496e-16 +
             local_648 * 8.08683225e-12 +
             local_768 * 2.734541966666666e-08 +
             local_1bb8 * -0.00108845902 +
             (double)local_1e08._0_8_ * -3.03399249 + dVar42 * -30004.2971 + -1.93277761;
        local_1cf8._0_8_ =
             local_6b8 * 5.39542675e-16 +
             local_648 * -9.520530833333334e-12 +
             local_768 * 1.056096916666667e-07 +
             local_1bb8 * -0.001119910065 +
             (double)local_1e08._0_8_ * -4.0172109 + dVar42 * 111.856713 + 0.2321087500000001;
        local_1d48 = local_6b8 * 2.36042082e-15 +
                     local_648 * -4.362418233333334e-11 +
                     local_768 * 3.691356733333334e-07 +
                     local_1bb8 * -0.00220718513 +
                     (double)local_1e08._0_8_ * -3.85746029 + dVar42 * -48759.166 + 1.58582223;
        dStack_1d40 = local_6b8 * 5.0907615e-15 +
                      local_648 * -1.019104458333333e-10 +
                      local_768 * 9.554763483333333e-07 +
                      local_1bb8 * -0.00669547335 +
                      (double)local_1e08._0_8_ * -0.074851495 + dVar42 * -9468.34459 + -18.362466505
        ;
        local_6a8 = local_6b8 * 6.28530305e-15 +
                    local_648 * -1.226857691666667e-10 +
                    local_768 * 1.118463191666667e-06 +
                    local_1bb8 * -0.00732270755 +
                    (double)local_1e08._0_8_ * -2.03611116 +
                    dVar42 * 4939.88614 + -8.269258140000002;
        dStack_6a0 = local_6b8 * 1.056308e-15 +
                     local_648 * -3.287025833333333e-11 +
                     local_768 * 4.427306666666667e-07 +
                     local_1bb8 * -0.0039357485 +
                     (double)local_1e08._0_8_ * -3.770799 + dVar42 * 127.83252 + 0.841224;
        local_778 = local_6b8 * 9.5001445e-15 +
                    local_648 * -1.845100008333333e-10 +
                    local_768 * 1.67093445e-06 +
                    local_1bb8 * -0.01084263385 +
                    (double)local_1e08._0_8_ * -1.0718815 + dVar42 * -11426.3932 + -14.0437292;
        dVar19 = local_648 * -8.414198333333333e-12 +
                 local_768 * 9.474600000000001e-08 +
                 local_1bb8 * -0.0007439884 +
                 (double)local_1e08._0_8_ * -2.92664 + dVar42 * -922.7977 + -3.053888;
        dVar43 = local_6b8 * 3.3766755e-16;
      }
      else {
        local_1878 = local_6b8 * 3.688058805e-13 +
                     local_648 * -1.67976745e-09 +
                     local_768 * 3.2463585e-06 +
                     local_1bb8 * -0.003990260375 +
                     (double)local_1e08._0_8_ * -2.34433112 + dVar42 * -917.935173 + 1.661320882;
        local_1d28 = local_6b8 * 4.63866166e-23 +
                     local_648 * -1.917346933333333e-19 +
                     local_768 * 3.326532733333333e-16 +
                     local_1bb8 * -3.526664095e-13 +
                     (double)local_1e08._0_8_ * -2.5 + dVar42 * 25473.6599 + 2.946682853;
        local_1858 = local_6b8 * -2.168844325e-13 +
                     local_648 * 1.109534108333333e-09 +
                     local_768 * -2.296657433333333e-06 +
                     local_1bb8 * 0.00162196266 +
                     (double)local_1e08._0_8_ * -4.22118584 +
                     dVar42 * 3839.56496 + 0.8268134100000002;
        dStack_1850 = local_6b8 * -1.27192867e-13 +
                      local_648 * 5.725978541666666e-10 +
                      local_768 * -9.550364266666668e-07 +
                      local_1bb8 * -0.001005475875 +
                      (double)local_1e08._0_8_ * -3.6735904 + dVar42 * 16444.9988 + 2.06902607;
        local_1868 = local_6b8 * 4.522122495e-14 +
                     local_648 * -7.558382366666667e-11 +
                     local_768 * -1.69469055e-07 +
                     local_1bb8 * 0.00030517684 +
                     (double)local_1e08._0_8_ * -3.57953347 +
                     dVar42 * -14344.086 + 0.07112418999999992;
        dStack_1860 = local_6b8 * -6.8205735e-14 +
                      local_648 * 3.234277775e-10 +
                      local_768 * -7.696564016666666e-07 +
                      local_1bb8 * 0.00120065876 +
                      (double)local_1e08._0_8_ * -3.99201543 + dVar42 * 3615.08056 + 4.095940888;
        local_1c38._8_8_ =
             local_6b8 * -6.5886326e-13 +
             local_648 * 3.160710508333333e-09 +
             local_768 * -6.220333466666666e-06 +
             local_1bb8 * 0.004954166845 +
             (double)local_1e08._0_8_ * -4.79372315 + dVar42 * -14308.9567 + 4.19091025;
        local_1c38._0_8_ =
             local_6b8 * -1.621864185e-13 +
             local_648 * 8.067745908333334e-10 +
             local_768 * -1.641217001666667e-06 +
             local_1bb8 * 0.00149836708 +
             (double)local_1e08._0_8_ * -3.78245636 + dVar42 * -1063.94356 + 0.1247806300000001;
        local_1bd8 = local_6b8 * -9.71573685e-14 +
                     local_648 * 5.573466508333334e-10 +
                     local_768 * -1.372160366666667e-06 +
                     local_1bb8 * 0.001183307095 +
                     (double)local_1e08._0_8_ * -4.19860411 + dVar42 * 50496.8163 + 4.967723077;
        dStack_1bd0 = local_6b8 * -8.43708595e-14 +
                      local_648 * 3.209092941666667e-10 +
                      local_768 * -4.658164016666667e-07 +
                      local_1bb8 * -0.0004844360715 +
                      (double)local_1e08._0_8_ * -3.76267867 + dVar42 * 46004.0401 + 2.20014682;
        local_758 = local_6b8 * -1.15254502e-12 +
                    local_648 * 4.992721716666666e-09 +
                    local_768 * -8.28571345e-06 +
                    local_1bb8 * 0.00209329446 +
                    (double)local_1e08._0_8_ * -4.30646568 +
                    dVar42 * 12841.6265 + -0.4007435600000004;
        dStack_750 = local_6b8 * -1.056329855e-13 +
                     local_648 * 5.106721866666666e-10 +
                     local_768 * -1.107177326666667e-06 +
                     local_1bb8 * 0.00163965942 +
                     (double)local_1e08._0_8_ * -3.1682671 + dVar42 * 29122.2592 + 1.11633364;
        local_1cf8._8_8_ =
             local_6b8 * -8.85989085e-14 +
             local_648 * 4.57330885e-10 +
             local_768 * -1.086733685e-06 +
             local_1bb8 * 0.00101821705 +
             (double)local_1e08._0_8_ * -4.19864056 + dVar42 * -30293.7267 + 5.047672768;
        local_1cf8._0_8_ =
             local_6b8 * -4.646125620000001e-13 +
             local_648 * 2.02303245e-09 +
             local_768 * -3.526381516666666e-06 +
             local_1bb8 * 0.002374560255 +
             (double)local_1e08._0_8_ * -4.30179801 + dVar42 * 294.80804 + 0.5851355599999999;
        local_1d48 = local_6b8 * 7.184977399999999e-15 +
                     local_648 * -2.049325183333333e-10 +
                     local_768 * 1.187260448333333e-06 +
                     local_1bb8 * -0.004492298385 +
                     (double)local_1e08._0_8_ * -2.35677352 + dVar42 * -48371.9697 + -7.5442787;
        dStack_1d40 = local_6b8 * -8.3346978e-13 +
                      local_648 * 4.039525216666667e-09 +
                      local_768 * -8.19667665e-06 +
                      local_1bb8 * 0.0068354894 +
                      (double)local_1e08._0_8_ * -5.14987613 +
                      dVar42 * -10246.6476 + 9.791179889999999;
        local_6a8 = local_6b8 * -1.349421865e-12 +
                    local_648 * 5.763239608333333e-09 +
                    local_768 * -9.516504866666667e-06 +
                    local_1bb8 * 0.003785261235 +
                    (double)local_1e08._0_8_ * -3.95920148 +
                    dVar42 * 5089.77593 + -0.1381294799999999;
        dStack_6a0 = local_6b8 * -1.037805e-13 +
                     local_648 * 6.14803e-10 +
                     local_768 * -8.897453333333333e-07 +
                     local_1bb8 * -0.0036082975 +
                     (double)local_1e08._0_8_ * -2.106204 + dVar42 * 978.6011 + -11.045973;
        local_778 = local_6b8 * -1.343428855e-12 +
                    local_648 * 5.903885708333334e-09 +
                    local_768 * -9.990638133333334e-06 +
                    local_1bb8 * 0.00275077135 +
                    (double)local_1e08._0_8_ * -4.29142492 + dVar42 * -11522.2055 + 1.62460176;
        dVar19 = local_648 * -4.701262500000001e-10 +
                 local_768 * 6.605369999999999e-07 +
                 local_1bb8 * -0.0007041202 +
                 (double)local_1e08._0_8_ * -3.298677 + dVar42 * -1020.8999 + -0.6516950000000001;
        dVar43 = local_6b8 * 1.222427e-13;
      }
      dStack_1d20 = (double)uStack_1bb0;
      local_1bc8 = dVar42 * dVar42;
      uStack_1bc0 = 0;
      dVar20 = 1.0 / (12186.6002121605 / local_1bb8);
      dVar118 = (double)local_1e08._0_8_ * -2.5;
      if (1000.0 <= local_1bb8) {
        local_1ce8 = dVar42 * -950.158922 +
                     local_6b8 * 4.00510752e-15 +
                     local_648 * -4.48915985e-11 +
                     local_768 * 1.66485593e-07 + local_1bb8 * -2.47012365e-05 + 3.3372792;
        dStack_1ce0 = dVar42 * 25473.6599 +
                      local_6b8 * 9.96394714e-23 +
                      local_648 * -1.18378809e-18 +
                      local_768 * 5.38539827e-15 + local_1bb8 * -1.15421486e-11 + 2.50000001;
        local_1cd8 = dVar42 * 29217.5791 +
                     local_6b8 * 2.45667382e-16 +
                     local_648 * -2.50444497e-12 +
                     local_768 * 1.39828196e-08 + local_1bb8 * -4.29870569e-05 + 2.56942078;
        dStack_1cd0 = dVar42 * -1088.45772 +
                      local_6b8 * -4.33435588e-15 +
                      local_648 * 5.23676387e-11 +
                      local_768 * -2.52655556e-07 + local_1bb8 * 0.00074154377 + 3.28253784;
        local_1cc8 = dVar42 * 3858.657 +
                     local_6b8 * 2.34824752e-15 +
                     local_648 * -2.19865389e-11 +
                     local_768 * 4.21684093e-08 + local_1bb8 * 0.000274214858 + 3.09288767;
        dStack_1cc0 = dVar42 * -30004.2971 +
                      local_6b8 * 3.36401984e-15 +
                      local_648 * -2.42604967e-11 +
                      local_768 * -5.46908393e-08 + local_1bb8 * 0.00108845902 + 3.03399249;
        local_1cb8 = dVar42 * 111.856713 +
                     local_6b8 * -2.1581707e-15 +
                     local_648 * 2.85615925e-11 +
                     local_768 * -2.11219383e-07 + local_1bb8 * 0.00111991006 + 4.0172109;
        dVar113 = dVar42 * 46263.604 +
                  local_6b8 * -3.75455134e-15 +
                  local_648 * 6.50448872e-11 +
                  local_768 * -4.69648657e-07 + local_1bb8 * 0.00182819646 + 2.87410113;
        local_1ca8 = dVar42 * 50925.9997 +
                     local_6b8 * -6.7943273e-15 +
                     local_648 * 1.044765e-10 +
                     local_768 * -6.70639823e-07 + local_1bb8 * 0.00232794318 + 2.29203842;
        local_1c98 = dVar42 * -9468.34459 +
                     local_6b8 * -2.0363046e-14 +
                     local_648 * 3.05731338e-10 +
                     local_768 * -1.9109527e-06 + local_1bb8 * 0.00669547335 + 0.074851495;
        dStack_1c90 = dVar42 * -14151.8724 +
                      local_6b8 * -4.07295432e-15 +
                      local_648 * 5.7513252e-11 +
                      local_768 * -3.32941924e-07 + local_1bb8 * 0.00103126372 + 2.71518561;
        local_1c88 = dVar42 * -48759.166 +
                     local_6b8 * -9.44168328e-15 +
                     local_648 * 1.30872547e-10 +
                     local_768 * -7.38271347e-07 + local_1bb8 * 0.00220718513 + 3.85746029;
        dStack_1c80 = dVar42 * 4011.91815 +
                      local_6b8 * -1.06701742e-14 +
                      local_648 * 1.47290445e-10 +
                      local_768 * -8.28152043e-07 + local_1bb8 * 0.00247847763 + 2.77217438;
        local_1c78 = dVar42 * -13995.8323 +
                     local_6b8 * -1.76771128e-14 +
                     local_648 * 2.5160303e-10 +
                     local_768 * -1.47419604e-06 + local_1bb8 * 0.00460000041 + 1.76069008;
        dStack_1c70 = dVar42 * 127.83252 +
                      local_6b8 * -4.225232e-15 +
                      local_648 * 9.8610775e-11 +
                      local_768 * -8.85461333e-07 + local_1bb8 * 0.0039357485 + 3.770799;
        local_1c68 = dVar42 * 4939.88614 +
                     local_6b8 * -2.51412122e-14 +
                     local_648 * 3.68057308e-10 +
                     local_768 * -2.23692638e-06 + local_1bb8 * 0.00732270755 + 2.03611116;
        dStack_1c60 = dVar42 * 12857.52 +
                      local_6b8 * -2.99283152e-14 +
                      local_648 * 4.38044223e-10 +
                      local_768 * -2.66068889e-06 + local_1bb8 * 0.0086986361 + 1.95465642;
        local_1c58 = dVar42 * -11426.3932 +
                     local_6b8 * -3.8000578e-14 +
                     local_648 * 5.53530003e-10 +
                     local_768 * -3.3418689e-06 + local_1bb8 * 0.0108426339 + 1.0718815;
        dStack_1c50 = local_6b8 * -1.3506702e-15 +
                      local_648 * 2.5242595e-11 +
                      local_768 * -1.89492e-07 + local_1bb8 * 0.0007439884 + 2.92664;
        dVar70 = local_6b8 * -9.34308788e-15 +
                 local_648 * 1.48921161e-10 +
                 local_768 * -9.95714493e-07 + local_1bb8 * 0.00361995018 + 2.28571772;
        dVar22 = -922.7977;
        dVar27 = 16775.5843;
      }
      else {
        local_1ce8 = dVar42 * -917.935173 +
                     local_6b8 * -1.47522352e-12 +
                     local_648 * 5.03930235e-09 +
                     local_768 * -6.492717e-06 + local_1bb8 * 0.00399026037 + 2.34433112;
        dStack_1ce0 = dVar42 * 25473.6599 +
                      local_6b8 * -1.85546466e-22 +
                      local_648 * 5.7520408e-19 +
                      local_768 * -6.65306547e-16 + local_1bb8 * 3.52666409e-13 + 2.5;
        local_1cd8 = dVar42 * 29122.2592 +
                     local_6b8 * 4.22531942e-13 +
                     local_648 * -1.53201656e-09 +
                     local_768 * 2.21435465e-06 + local_1bb8 * -0.00163965942 + 3.1682671;
        dStack_1cd0 = dVar42 * -1063.94356 +
                      local_6b8 * 6.48745674e-13 +
                      local_648 * -2.42032377e-09 +
                      local_768 * 3.282434e-06 + local_1bb8 * -0.00149836708 + 3.78245636;
        local_1cc8 = dVar42 * 3615.08056 +
                     local_6b8 * 2.7282294e-13 +
                     local_648 * -9.70283332e-10 +
                     local_768 * 1.5393128e-06 + local_1bb8 * -0.00120065876 + 3.99201543;
        dStack_1cc0 = dVar42 * -30293.7267 +
                      local_6b8 * 3.54395634e-13 +
                      local_648 * -1.37199266e-09 +
                      local_768 * 2.17346737e-06 + local_1bb8 * -0.00101821705 + 4.19864056;
        local_1cb8 = dVar42 * 294.80804 +
                     local_6b8 * 1.85845025e-12 +
                     local_648 * -6.06909735e-09 +
                     local_768 * 7.05276303e-06 + local_1bb8 * -0.00237456025 + 4.30179801;
        dVar113 = dVar42 * 46004.0401 +
                  local_6b8 * 3.37483438e-13 +
                  local_648 * -9.62727883e-10 +
                  local_768 * 9.31632803e-07 + local_1bb8 * 0.000484436072 + 3.76267867;
        local_1ca8 = dVar42 * 50496.8163 +
                     local_6b8 * 3.88629474e-13 +
                     local_648 * -1.67203995e-09 +
                     local_768 * 2.74432073e-06 + local_1bb8 * -0.0011833071 + 4.19860411;
        local_1c98 = dVar42 * -10246.6476 +
                     local_6b8 * 3.33387912e-12 +
                     local_648 * -1.21185757e-08 +
                     local_768 * 1.63933533e-05 + local_1bb8 * -0.0068354894 + 5.14987613;
        dStack_1c90 = dVar42 * -14344.086 +
                      local_6b8 * -1.808849e-13 +
                      local_648 * 2.26751471e-10 +
                      local_768 * 3.3893811e-07 + local_1bb8 * -0.00030517684 + 3.57953347;
        local_1c88 = dVar42 * -48371.9697 +
                     local_6b8 * -2.87399096e-14 +
                     local_648 * 6.14797555e-10 +
                     local_768 * -2.3745209e-06 + local_1bb8 * 0.00449229839 + 2.35677352;
        dStack_1c80 = dVar42 * 3839.56496 +
                      local_6b8 * 8.6753773e-13 +
                      local_648 * -3.32860233e-09 +
                      local_768 * 4.59331487e-06 + local_1bb8 * -0.00162196266 + 4.22118584;
        local_1c78 = dVar42 * -14308.9567 +
                     local_6b8 * 2.63545304e-12 +
                     local_648 * -9.48213152e-09 +
                     local_768 * 1.24406669e-05 + local_1bb8 * -0.00495416684 + 4.79372315;
        dStack_1c70 = dVar42 * 978.6011 +
                      local_6b8 * 4.15122e-13 +
                      local_648 * -1.844409e-09 +
                      local_768 * 1.77949067e-06 + local_1bb8 * 0.0036082975 + 2.106204;
        local_1c68 = dVar42 * 5089.77593 +
                     local_6b8 * 5.39768746e-12 +
                     local_648 * -1.72897188e-08 +
                     local_768 * 1.90330097e-05 + local_1bb8 * -0.00378526124 + 3.95920148;
        dStack_1c60 = dVar42 * 12841.6265 +
                      local_6b8 * 4.61018008e-12 +
                      local_648 * -1.49781651e-08 +
                      local_768 * 1.65714269e-05 + local_1bb8 * -0.00209329446 + 4.30646568;
        local_1c58 = dVar42 * -11522.2055 +
                     local_6b8 * 5.37371542e-12 +
                     local_648 * -1.77116571e-08 +
                     local_768 * 1.99812763e-05 + local_1bb8 * -0.00275077135 + 4.29142492;
        dStack_1c50 = local_6b8 * -4.889708e-13 +
                      local_648 * 1.41037875e-09 +
                      local_768 * -1.321074e-06 + local_1bb8 * 0.0007041202 + 3.298677;
        dVar70 = local_6b8 * 5.08771468e-13 +
                 local_648 * -1.71779356e-09 +
                 local_768 * 1.91007285e-06 + local_1bb8 * 0.00100547588 + 3.6735904;
        dVar22 = -1020.8999;
        dVar27 = 16444.9988;
      }
      dStack_1c50 = dVar42 * dVar22 + dStack_1c50;
      dVar70 = dVar42 * dVar27 + dVar70;
      local_318 = local_1bb8 * 0.0;
      uStack_310 = uStack_1bb0;
      local_328 = local_768 * 0.0;
      uStack_320 = uStack_1bb0;
      local_338._8_4_ = (int)uStack_1bb0;
      local_338._0_8_ = local_648 * 0.0;
      local_338._12_4_ = (int)(uStack_1bb0 >> 0x20);
      uStack_6b0 = uStack_1bb0;
      local_378 = local_6b8 * 0.0;
      uStack_370 = uStack_1bb0;
      local_1c48 = dVar42 * -745.375 + local_318 + 2.5 + local_328 + local_648 * 0.0 + local_378;
      dVar59 = local_1df8[0x14] * -0.30000000000000004 +
               local_1df8[0x12] + local_1df8[0x12] +
               local_1df8[0xb] * 0.5 +
               local_1df8[5] * 5.0 + local_1df8[0] + local_1d38 + local_1df8[10] + local_1df8[0xc];
      dVar71 = local_1df8[1] * local_1df8[7];
      dVar44 = dVar42 * -0.0;
      local_1c18 = (double)local_1e08._0_8_ * -0.8 + dVar44;
      dStack_1cb0 = dVar113;
      dStack_1ca0 = dVar70;
      uStack_1870 = (ulong)dStack_1d20;
      uStack_770 = (ulong)dStack_1d20;
      local_1e08._8_8_ = extraout_XMM0_Qb;
      dVar21 = exp(local_1c18);
      dVar21 = dVar21 * 25000000000.0;
      dVar22 = exp((double)local_1e08._0_8_ * -3.14 + dVar42 * -618.9564989398057);
      local_1e78 = ((dVar59 * 1e-12) / dVar21) * dVar22 * 3.2e+27;
      dVar23 = log10(local_1e78);
      local_1e68 = exp(local_1bb8 / -78.0);
      local_1e68 = local_1e68 * 0.31999999999999995;
      dVar24 = exp(local_1bb8 / -1995.0);
      dVar25 = exp(dVar42 * -5590.0);
      dVar45 = local_1e68 + dVar24 * 0.68 + dVar25;
      local_1e48 = log10(dVar45);
      local_1928 = local_1e48 * -1.27 + 0.75;
      dVar23 = local_1e48 * -0.67 + -0.4 + dVar23;
      dVar72 = 1.0 / (dVar23 * -0.14 + local_1928);
      dVar23 = dVar23 * dVar72;
      local_1c08 = 1.0 / (dVar23 * dVar23 + 1.0);
      dVar22 = pow(10.0,local_1e48 * local_1c08);
      dVar41 = dStack_1bd0;
      dVar73 = local_1df8[9];
      local_1848 = dStack_1850;
      dStack_1840 = dStack_1850;
      dVar26 = exp((dStack_1bd0 + local_1d28) - dStack_1850);
      dVar29 = dStack_1ce0;
      dVar28 = local_1df8[10];
      dVar27 = local_1df8[1];
      dVar101 = local_1e68 / -78.0;
      dVar60 = (local_1e48 + local_1e48) * local_1c08 * local_1c08 * dVar23 * dVar72;
      dVar72 = -local_1928 * dVar60 * dVar72;
      local_1e68 = local_1bc8 * 0.0;
      dStack_1e60 = (double)uStack_1bc0;
      dVar109 = dVar42 * -0.8 + local_1e68;
      dVar61 = local_1e78 + 1.0;
      dVar46 = ((dVar42 * -3.14 + local_1bc8 * 618.9564989398057) - dVar109) * 0.43429448190325176;
      dVar26 = dVar21 / (dVar26 * dVar20);
      dVar22 = (local_1e78 / dVar61) * dVar22;
      dVar92 = (dVar21 * dVar71 - dVar73 * dVar26) * dVar22;
      dVar70 = (dVar109 * dVar21 * dVar71 -
               (dVar109 - ((dVar70 - (dVar113 + dStack_1ce0)) + 1.0) * dVar42) * dVar26 * dVar73) *
               dVar22 + (dVar46 * dVar72 +
                         (dVar60 * dVar23 * -1.27 + dVar72 * -0.67 + local_1c08) *
                         (dVar25 * 5590.0 * local_1bc8 + (dVar24 * 0.68) / -1995.0 + dVar101) *
                         (0.43429448190325176 / dVar45) + dVar46 / dVar61) * 2.302585092994046 *
                        dVar92;
      local_1f38[1] = local_1f38[1] - dVar92;
      auStack_1f00 = (undefined1  [8])((double)auStack_1f00 - dVar92);
      dStack_1ef0 = dStack_1ef0 + dVar92;
      dVar21 = dVar21 * dVar22;
      dVar22 = dVar22 * dVar26;
      dVar113 = (1.0 / dVar61 + dVar72) * (dVar92 / dVar59);
      if (iVar1 == 2) {
        local_1690 = local_1690 - dVar113;
        local_1660 = local_1660 - dVar113;
        local_1650 = local_1650 + dVar113;
        dVar23 = local_1df8[7] * dVar21;
        auStack_15e0._0_8_ = (double)auStack_15e0._0_8_ - dVar23;
        local_15b0 = local_15b0 - dVar23;
        dStack_15a0 = dVar23 + dStack_15a0;
        dVar23 = dVar113 * 5.0;
        local_1320 = local_1320 - dVar23;
        local_12f0 = local_12f0 - dVar23;
        local_12e0 = dVar23 + local_12e0;
        dVar21 = dVar21 * local_1df8[1];
        local_11c0 = local_11c0 - dVar21;
        dStack_1190 = dStack_1190 - dVar21;
        local_1180 = dVar21 + local_1180;
        local_1060 = local_1060 + dVar22;
        local_1030 = local_1030 + dVar22;
        local_1020 = local_1020 - dVar22;
        local_fb0 = local_fb0 - dVar113;
        local_f80 = local_f80 - dVar113;
        local_f70 = local_f70 + dVar113;
        dVar22 = dVar113 * 0.5;
        local_f00 = local_f00 - dVar22;
        local_ed0 = local_ed0 - dVar22;
        local_ec0 = dVar22 + local_ec0;
        local_e50 = local_e50 - dVar113;
        local_e20 = local_e20 - dVar113;
        local_e10 = local_e10 + dVar113;
        dVar22 = dVar113 + dVar113;
        local_a30 = local_a30 - dVar22;
        local_a00 = local_a00 - dVar22;
        local_9f0 = dVar22 + local_9f0;
        dVar113 = dVar113 * -0.30000000000000004;
        local_8d0 = local_8d0 - dVar113;
        local_8a0 = local_8a0 - dVar113;
        local_890 = dVar113 + local_890;
      }
      else {
        local_1ba8[0] = dVar113 * 2.0;
        local_1ba8[1] = local_1df8[7] * dVar21 + dVar113;
        local_1ba8[2] = dVar113;
        local_1ba8[3] = dVar113;
        local_1ba8[4] = dVar113;
        local_1ba8[5] = dVar113 * 6.0;
        local_1ba8[6] = dVar113;
        local_1ba8[7] = dVar21 * local_1df8[1] + dVar113;
        local_1ba8[8] = dVar113;
        local_1ba8[9] = dVar113 - dVar22;
        local_1ba8[10] = local_1ba8[0];
        local_1ba8[0xb] = dVar113 * 1.5;
        local_1ba8[0xc] = local_1ba8[0];
        local_1ba8[0xf] = dVar113;
        local_1ba8[0x10] = dVar113;
        local_1ba8[0xd] = dVar113;
        local_1ba8[0xe] = dVar113;
        local_1ba8[0x11] = dVar113;
        local_1ba8[0x12] = dVar113 * 3.0;
        local_1ba8[0x13] = dVar113;
        local_1ba8[0x14] = dVar113 * 0.7;
        pdVar13 = &local_1650;
        lVar12 = 0;
        do {
          dVar22 = local_1ba8[lVar12];
          pdVar13[-8] = pdVar13[-8] - dVar22;
          pdVar13[-2] = pdVar13[-2] - dVar22;
          *pdVar13 = dVar22 + *pdVar13;
          lVar12 = lVar12 + 1;
          pdVar13 = pdVar13 + 0x16;
        } while (lVar12 != 0x15);
      }
      local_828[1] = local_828[1] - dVar70;
      local_828[7] = local_828[7] - dVar70;
      local_828[9] = dVar70 + local_828[9];
      dVar24 = local_1df8[0x14] * -0.30000000000000004 +
               local_1df8[0x12] + local_1df8[0x12] +
               local_1df8[0xb] * 0.5 +
               local_1df8[5] * 5.0 + local_1df8[0] + local_1d38 + local_1df8[10] + local_1df8[0xc];
      dVar22 = exp((double)local_1e08._0_8_ * -0.63 + dVar42 * -192.73198300320777);
      dVar22 = dVar22 * 12700000000.0;
      dVar70 = exp((double)local_1e08._0_8_ * -4.76 + dVar42 * -1227.8486645635169);
      dVar25 = ((dVar24 * 1e-12) / dVar22) * dVar70 * 2.477e+33;
      local_1928 = log10(dVar25);
      dVar70 = exp(local_1bb8 / -74.0);
      dVar113 = exp(local_1bb8 / -2941.0);
      local_1e78 = exp(dVar42 * -6964.0);
      dVar26 = dVar70 * 0.21699999999999997 + dVar113 * 0.783 + local_1e78;
      dVar21 = log10(dVar26);
      dVar45 = dVar21 * -1.27 + 0.75;
      local_1c08 = dVar21 * -0.67 + -0.4 + local_1928;
      dVar59 = 1.0 / (local_1c08 * -0.14 + dVar45);
      local_1c08 = local_1c08 * dVar59;
      local_1e48 = 1.0 / (local_1c08 * local_1c08 + 1.0);
      local_1928 = pow(10.0,dVar21 * local_1e48);
      local_658 = dStack_1d40;
      dStack_650 = dStack_1d40;
      dVar23 = exp((local_1848 + local_1d28) - dStack_1d40);
      dVar46 = dVar42 * -0.63 + local_1bc8 * 192.73198300320777;
      dVar61 = (dVar21 + dVar21) * local_1e48 * local_1e48 * local_1c08 * dVar59;
      dVar59 = -dVar45 * dVar61 * dVar59;
      dVar60 = dVar25 + 1.0;
      dVar45 = ((dVar42 * -4.76 + local_1bc8 * 1227.8486645635169) - dVar46) * 0.43429448190325176;
      dVar23 = dVar22 / (dVar23 * dVar20);
      dVar25 = (dVar25 / dVar60) * local_1928;
      dVar21 = (dVar22 * dVar27 * dVar73 - dVar28 * dVar23) * dVar25;
      dVar70 = (dVar46 * dVar22 * dVar27 * dVar73 -
               (dVar46 - ((local_1c98 - (dVar29 + dStack_1ca0)) + 1.0) * dVar42) * dVar23 * dVar28)
               * dVar25 +
               (dVar45 * dVar59 +
                (dVar61 * local_1c08 * -1.27 + dVar59 * -0.67 + local_1e48) *
                (local_1e78 * 6964.0 * local_1bc8 +
                (dVar113 * 0.783) / -2941.0 + (dVar70 * 0.21699999999999997) / -74.0) *
                (0.43429448190325176 / dVar26) + dVar45 / dVar60) * 2.302585092994046 * dVar21;
      local_1f38[1] = local_1f38[1] - dVar21;
      dStack_1ef0 = dStack_1ef0 - dVar21;
      local_1ee8 = (undefined1  [8])((double)local_1ee8 + dVar21);
      dVar22 = dVar25 * dVar22;
      dVar27 = (1.0 / dVar60 + dVar59) * (dVar21 / dVar24);
      if (iVar1 == 2) {
        local_1690 = local_1690 - dVar27;
        local_1650 = local_1650 - dVar27;
        local_1648 = local_1648 + dVar27;
        dVar113 = local_1df8[9] * dVar22;
        auStack_15e0._0_8_ = (double)auStack_15e0._0_8_ - dVar113;
        dStack_15a0 = dStack_15a0 - dVar113;
        local_1598 = dVar113 + local_1598;
        dVar113 = dVar27 * 5.0;
        local_1320 = local_1320 - dVar113;
        local_12e0 = local_12e0 - dVar113;
        local_12d8 = dVar113 + local_12d8;
        dVar22 = dVar22 * local_1df8[1];
        local_1060 = local_1060 - dVar22;
        local_1020 = local_1020 - dVar22;
        local_1018 = dVar22 + local_1018;
        dVar22 = dVar27 - dVar23 * dVar25;
        local_fb0 = local_fb0 - dVar22;
        local_f70 = local_f70 - dVar22;
        local_f68 = dVar22 + local_f68;
        dVar22 = dVar27 * 0.5;
        local_f00 = local_f00 - dVar22;
        local_ec0 = local_ec0 - dVar22;
        local_eb8 = dVar22 + local_eb8;
        local_e50 = local_e50 - dVar27;
        local_e10 = local_e10 - dVar27;
        local_e08 = local_e08 + dVar27;
        dVar22 = dVar27 + dVar27;
        local_a30 = local_a30 - dVar22;
        local_9f0 = local_9f0 - dVar22;
        local_9e8 = dVar22 + local_9e8;
        dVar27 = dVar27 * -0.30000000000000004;
        local_8d0 = local_8d0 - dVar27;
        local_890 = local_890 - dVar27;
        local_888 = dVar27 + local_888;
      }
      else {
        local_1ba8[0] = dVar27 * 2.0;
        local_1ba8[1] = local_1df8[9] * dVar22 + dVar27;
        local_1ba8[2] = dVar27;
        local_1ba8[3] = dVar27;
        local_1ba8[4] = dVar27;
        local_1ba8[5] = dVar27 * 6.0;
        local_1ba8[6] = dVar27;
        local_1ba8[7] = dVar27;
        local_1ba8[8] = dVar27;
        local_1ba8[9] = local_1df8[1] * dVar22 + dVar27;
        local_1ba8[10] = dVar27 * 2.0 + -(dVar23 * dVar25);
        local_1ba8[0xb] = dVar27 * 1.5;
        local_1ba8[0xc] = dVar27 * 2.0;
        local_1ba8[0xf] = dVar27;
        local_1ba8[0x10] = dVar27;
        local_1ba8[0xd] = dVar27;
        local_1ba8[0xe] = dVar27;
        local_1ba8[0x11] = dVar27;
        local_1ba8[0x12] = dVar27 * 3.0;
        local_1ba8[0x13] = dVar27;
        local_1ba8[0x14] = dVar27 * 0.7;
        pdVar13 = &local_1648;
        lVar12 = 0;
        do {
          dVar22 = local_1ba8[lVar12];
          pdVar13[-9] = pdVar13[-9] - dVar22;
          pdVar13[-1] = pdVar13[-1] - dVar22;
          *pdVar13 = dVar22 + *pdVar13;
          lVar12 = lVar12 + 1;
          pdVar13 = pdVar13 + 0x16;
        } while (lVar12 != 0x15);
      }
      local_828[1] = local_828[1] - dVar70;
      local_828[9] = local_828[9] - dVar70;
      local_7d8._0_8_ = dVar70 + (double)local_7d8._0_8_;
      dVar28 = local_1df8[0x14] * -0.30000000000000004 +
               local_1df8[0x12] + local_1df8[0x12] +
               local_1df8[0xb] * 0.5 +
               local_1df8[5] * 5.0 + local_1df8[0] + local_1d38 + local_1df8[10] + local_1df8[0xc];
      dVar72 = local_1df8[1] * local_1df8[0xd];
      dVar29 = exp((double)local_1e08._0_8_ * 0.48 + dVar42 * 130.8363331092272);
      dVar29 = dVar29 * 1090000.0;
      dVar22 = exp((double)local_1e08._0_8_ * -2.57 + dVar42 * -717.083748771726);
      local_1e78 = ((dVar28 * 1e-12) / dVar29) * dVar22 * 1.35e+24;
      dVar21 = log10(local_1e78);
      dVar23 = exp(local_1bb8 / -271.0);
      dVar24 = exp(local_1bb8 / -2755.0);
      dVar25 = exp(dVar42 * -6570.0);
      dVar45 = dVar23 * 0.21760000000000002 + dVar24 * 0.7824 + dVar25;
      local_1e48 = log10(dVar45);
      dVar46 = local_1e48 * -1.27 + 0.75;
      dVar21 = local_1e48 * -0.67 + -0.4 + dVar21;
      dVar61 = 1.0 / (dVar21 * -0.14 + dVar46);
      dVar21 = dVar21 * dVar61;
      local_1c08 = 1.0 / (dVar21 * dVar21 + 1.0);
      dVar22 = pow(10.0,local_1e48 * local_1c08);
      dVar70 = local_1df8[0xe];
      local_1928 = (double)local_1c38._8_8_;
      dStack_1920 = (double)local_1c38._8_8_;
      dVar26 = exp((local_1858 + local_1d28) - (double)local_1c38._8_8_);
      dVar73 = local_1c78;
      dVar113 = dStack_1ce0;
      dVar27 = local_1df8[1];
      dVar59 = dVar42 * 0.48 + local_1bc8 * -130.8363331092272;
      dVar71 = local_1e78 + 1.0;
      dVar60 = ((dVar42 * -2.57 + local_1bc8 * 717.083748771726) - dVar59) * 0.43429448190325176;
      dVar92 = (local_1e48 + local_1e48) * local_1c08 * local_1c08 * dVar21 * dVar61;
      dVar61 = -dVar46 * dVar92 * dVar61;
      dVar26 = dVar29 / (dVar26 * dVar20);
      dVar22 = (local_1e78 / dVar71) * dVar22;
      dVar46 = (dVar29 * dVar72 - dVar70 * dVar26) * dVar22;
      dVar21 = (dVar59 * dVar29 * dVar72 -
               (dVar59 - ((local_1c78 - (dStack_1c80 + dStack_1ce0)) + 1.0) * dVar42) * dVar26 *
               dVar70) * dVar22 +
               (dVar60 * dVar61 +
                (dVar92 * dVar21 * -1.27 + dVar61 * -0.67 + local_1c08) *
                (dVar25 * 6570.0 * local_1bc8 +
                (dVar24 * 0.7824) / -2755.0 + (dVar23 * 0.21760000000000002) / -271.0) *
                (0.43429448190325176 / dVar45) + dVar60 / dVar71) * 2.302585092994046 * dVar46;
      local_1f38[1] = local_1f38[1] - dVar46;
      dStack_1ed0 = dStack_1ed0 - dVar46;
      local_1ec8 = local_1ec8 + dVar46;
      dVar29 = dVar29 * dVar22;
      dVar22 = dVar22 * dVar26;
      dVar28 = (1.0 / dVar71 + dVar61) * (dVar46 / dVar28);
      if (iVar1 == 2) {
        local_1690 = local_1690 - dVar28;
        local_1630 = local_1630 - dVar28;
        local_1628 = local_1628 + dVar28;
        dVar23 = local_1df8[0xd] * dVar29;
        auStack_15e0._0_8_ = (double)auStack_15e0._0_8_ - dVar23;
        local_1580 = local_1580 - dVar23;
        local_1578 = dVar23 + local_1578;
        dVar23 = dVar28 * 5.0;
        local_1320 = local_1320 - dVar23;
        local_12c0 = local_12c0 - dVar23;
        local_12b8 = dVar23 + local_12b8;
        local_fb0 = local_fb0 - dVar28;
        local_f50 = local_f50 - dVar28;
        local_f48 = local_f48 + dVar28;
        dVar23 = dVar28 * 0.5;
        local_f00 = local_f00 - dVar23;
        local_ea0 = local_ea0 - dVar23;
        local_e98 = dVar23 + local_e98;
        local_e50 = local_e50 - dVar28;
        local_df0 = local_df0 - dVar28;
        local_de8 = local_de8 + dVar28;
        dVar29 = dVar29 * local_1df8[1];
        local_da0 = local_da0 - dVar29;
        local_d40 = local_d40 - dVar29;
        local_d38 = dVar29 + local_d38;
        local_cf0 = local_cf0 + dVar22;
        local_c90 = local_c90 + dVar22;
        local_c88 = local_c88 - dVar22;
        dVar22 = dVar28 + dVar28;
        local_a30 = local_a30 - dVar22;
        local_9d0 = local_9d0 - dVar22;
        local_9c8 = dVar22 + local_9c8;
        dVar28 = dVar28 * -0.30000000000000004;
        local_8d0 = local_8d0 - dVar28;
        local_870 = local_870 - dVar28;
        local_868 = dVar28 + local_868;
      }
      else {
        local_1ba8[0] = dVar28 * 2.0;
        local_1ba8[1] = local_1df8[0xd] * dVar29 + dVar28;
        local_1ba8[2] = dVar28;
        local_1ba8[3] = dVar28;
        local_1ba8[4] = dVar28;
        local_1ba8[5] = dVar28 * 6.0;
        local_1ba8[8] = dVar28;
        local_1ba8[9] = dVar28;
        local_1ba8[6] = dVar28;
        local_1ba8[7] = dVar28;
        local_1ba8[10] = local_1ba8[0];
        local_1ba8[0xb] = dVar28 * 1.5;
        local_1ba8[0xc] = local_1ba8[0];
        local_1ba8[0xd] = dVar29 * local_1df8[1] + dVar28;
        local_1ba8[0xe] = dVar28 - dVar22;
        local_1ba8[0xf] = dVar28;
        local_1ba8[0x10] = dVar28;
        local_1ba8[0x11] = dVar28;
        local_1ba8[0x12] = dVar28 * 3.0;
        local_1ba8[0x13] = dVar28;
        local_1ba8[0x14] = dVar28 * 0.7;
        pdVar13 = &local_1628;
        lVar12 = 0;
        do {
          dVar22 = local_1ba8[lVar12];
          pdVar13[-0xd] = pdVar13[-0xd] - dVar22;
          pdVar13[-1] = pdVar13[-1] - dVar22;
          *pdVar13 = dVar22 + *pdVar13;
          lVar12 = lVar12 + 1;
          pdVar13 = pdVar13 + 0x16;
        } while (lVar12 != 0x15);
      }
      local_828[1] = local_828[1] - dVar21;
      dStack_7c0 = dStack_7c0 - dVar21;
      dStack_7b8 = dVar21 + dStack_7b8;
      dVar25 = local_1df8[0x12] + local_1df8[0x12] +
               local_1df8[0xb] * 0.5 +
               local_1df8[5] * 5.0 + local_1df8[0] + local_1d38 + local_1df8[10] + local_1df8[0xc];
      dVar59 = (double)local_1e08._0_8_ * 0.454;
      dVar29 = exp(dVar42 * -1308.3633310922721 + dVar59);
      dVar29 = dVar29 * 540000.0;
      dVar22 = exp((double)local_1e08._0_8_ * -4.8 + dVar42 * -2797.884661874243);
      local_1c08 = ((dVar25 * 1e-12) / dVar29) * dVar22 * 2.2e+30;
      local_1e78 = log10(local_1c08);
      dVar21 = exp(local_1bb8 / -94.0);
      dVar23 = exp(local_1bb8 / -1555.0);
      dVar24 = exp(dVar42 * -4200.0);
      dVar26 = dVar21 * 0.242 + dVar23 * 0.758 + dVar24;
      local_1e58 = log10(dVar26);
      dVar45 = local_1e58 * -1.27 + 0.75;
      local_1e38 = local_1e58 * -0.67 + -0.4 + local_1e78;
      local_1e48 = 1.0 / (local_1e38 * -0.14 + dVar45);
      local_1e38 = local_1e38 * local_1e48;
      dVar22 = 1.0 / (local_1e38 * local_1e38 + 1.0);
      local_1e88._0_8_ = dVar22;
      local_1e78 = pow(10.0,local_1e58 * dVar22);
      dVar28 = local_1df8[0xf];
      local_308 = dStack_6a0;
      dStack_300 = dStack_6a0;
      dVar22 = exp((local_1928 + local_1d28) - dStack_6a0);
      dVar92 = (local_1e58 + local_1e58) * (double)local_1e88._0_8_ * (double)local_1e88._0_8_ *
               local_1e38 * local_1e48;
      dVar45 = -dVar45 * dVar92 * local_1e48;
      dVar46 = local_1bc8 * 1308.3633310922721 + dVar42 * 0.454;
      dVar60 = ((dVar42 * -4.8 + local_1bc8 * 2797.884661874243) - dVar46) * 0.43429448190325176;
      dVar61 = local_1c08 + 1.0;
      dVar71 = dVar29 / (dVar22 * dVar20);
      dVar22 = (local_1c08 / dVar61) * local_1e78;
      dVar72 = (dVar29 * dVar27 * dVar70 - dVar28 * dVar71) * dVar22;
      dVar70 = (dVar46 * dVar29 * dVar27 * dVar70 -
               (dVar46 - ((dStack_1c70 - (dVar113 + dVar73)) + 1.0) * dVar42) * dVar71 * dVar28) *
               dVar22 + (dVar60 * dVar45 +
                         (dVar92 * local_1e38 * -1.27 + dVar45 * -0.67 + (double)local_1e88._0_8_) *
                         (dVar24 * 4200.0 * local_1bc8 +
                         (dVar23 * 0.758) / -1555.0 + (dVar21 * 0.242) / -94.0) *
                         (0.43429448190325176 / dVar26) + dVar60 / dVar61) * 2.302585092994046 *
                        dVar72;
      local_1f38[1] = local_1f38[1] - dVar72;
      local_1ec8 = local_1ec8 - dVar72;
      dStack_1ec0 = dStack_1ec0 + dVar72;
      dVar29 = dVar29 * dVar22;
      dVar22 = dVar22 * dVar71;
      dVar27 = (1.0 / dVar61 + dVar45) * (dVar72 / dVar25);
      if (iVar1 == 2) {
        local_1690 = local_1690 - dVar27;
        local_1628 = local_1628 - dVar27;
        local_1620 = local_1620 + dVar27;
        dVar113 = local_1df8[0xe] * dVar29;
        auStack_15e0._0_8_ = (double)auStack_15e0._0_8_ - dVar113;
        local_1578 = local_1578 - dVar113;
        dStack_1570 = dVar113 + dStack_1570;
        dVar113 = dVar27 * 5.0;
        local_1320 = local_1320 - dVar113;
        local_12b8 = local_12b8 - dVar113;
        local_12b0 = dVar113 + local_12b0;
        local_fb0 = local_fb0 - dVar27;
        local_f48 = local_f48 - dVar27;
        local_f40 = local_f40 + dVar27;
        dVar113 = dVar27 * 0.5;
        local_f00 = local_f00 - dVar113;
        local_e98 = local_e98 - dVar113;
        local_e90 = dVar113 + local_e90;
        local_e50 = local_e50 - dVar27;
        local_de8 = local_de8 - dVar27;
        local_de0 = local_de0 + dVar27;
        dVar29 = dVar29 * local_1df8[1];
        local_cf0 = local_cf0 - dVar29;
        local_c88 = local_c88 - dVar29;
        local_c80 = dVar29 + local_c80;
        local_c40 = local_c40 + dVar22;
        local_bd8 = local_bd8 + dVar22;
        local_bd0 = local_bd0 - dVar22;
        dVar27 = dVar27 + dVar27;
        local_a30 = local_a30 - dVar27;
        local_9c8 = local_9c8 - dVar27;
        local_9c0 = dVar27 + local_9c0;
      }
      else {
        local_1ba8[0] = dVar27 * 2.0;
        local_1ba8[1] = local_1df8[0xe] * dVar29 + dVar27;
        local_1ba8[2] = dVar27;
        local_1ba8[3] = dVar27;
        local_1ba8[4] = dVar27;
        local_1ba8[5] = dVar27 * 6.0;
        local_1ba8[8] = dVar27;
        local_1ba8[9] = dVar27;
        local_1ba8[6] = dVar27;
        local_1ba8[7] = dVar27;
        local_1ba8[10] = local_1ba8[0];
        local_1ba8[0xb] = dVar27 * 1.5;
        local_1ba8[0xc] = local_1ba8[0];
        local_1ba8[0xd] = dVar27;
        local_1ba8[0xe] = dVar29 * local_1df8[1] + dVar27;
        local_1ba8[0xf] = dVar27 - dVar22;
        local_1ba8[0x10] = dVar27;
        local_1ba8[0x11] = dVar27;
        local_1ba8[0x12] = dVar27 * 3.0;
        local_1ba8[0x13] = dVar27;
        local_1ba8[0x14] = dVar27;
        pdVar13 = &local_1620;
        lVar12 = 0;
        do {
          dVar22 = local_1ba8[lVar12];
          pdVar13[-0xe] = pdVar13[-0xe] - dVar22;
          pdVar13[-1] = pdVar13[-1] - dVar22;
          *pdVar13 = dVar22 + *pdVar13;
          lVar12 = lVar12 + 1;
          pdVar13 = pdVar13 + 0x16;
        } while (lVar12 != 0x15);
      }
      local_828[1] = local_828[1] - dVar70;
      dStack_7b8 = dStack_7b8 - dVar70;
      dStack_7b0 = dVar70 + dStack_7b0;
      dVar27 = local_1df8[1] * local_1df8[0x10];
      dVar21 = local_1df8[0x14] * -0.30000000000000004 +
               local_1df8[0x12] + local_1df8[0x12] +
               local_1df8[0xb] * 0.5 +
               local_1df8[5] * 5.0 + local_1df8[0] + local_1d38 + local_1df8[10] + local_1df8[0xc];
      dVar23 = exp(dVar59 + dVar42 * -915.8543317645905);
      dVar23 = dVar23 * 1080000.0;
      dVar22 = exp((double)local_1e08._0_8_ * -7.62 + dVar42 * -3507.4201606588986);
      dVar59 = ((dVar21 * 1e-12) / dVar23) * dVar22 * 1.2e+42;
      dVar24 = log10(dVar59);
      dVar25 = exp(local_1bb8 / -210.0);
      dVar26 = exp(local_1bb8 / -984.0);
      local_1e78 = exp(dVar42 * -4374.0);
      local_1c08 = dVar25 * 0.024700000000000055 + dVar26 * 0.9753 + local_1e78;
      dVar45 = log10(local_1c08);
      dVar60 = dVar45 * -1.27 + 0.75;
      dVar24 = dVar45 * -0.67 + -0.4 + dVar24;
      dVar72 = 1.0 / (dVar24 * -0.14 + dVar60);
      dVar24 = dVar24 * dVar72;
      local_1e48 = 1.0 / (dVar24 * dVar24 + 1.0);
      dVar22 = pow(10.0,dVar45 * local_1e48);
      dVar113 = local_1df8[0x11];
      dVar46 = exp((local_6a8 + local_1d28) - local_758);
      dVar29 = dStack_1c60;
      dVar28 = dStack_1ce0;
      dVar73 = local_1df8[0x12];
      dVar70 = local_1df8[1];
      dVar92 = dVar42 * 0.454 + local_1bc8 * 915.8543317645905;
      dVar71 = dVar59 + 1.0;
      dVar61 = ((dVar42 * -7.62 + local_1bc8 * 3507.4201606588986) - dVar92) * 0.43429448190325176;
      dVar101 = (dVar45 + dVar45) * local_1e48 * local_1e48 * dVar24 * dVar72;
      dVar72 = -dVar60 * dVar101 * dVar72;
      dVar45 = dVar23 / (dVar46 * dVar20);
      dVar22 = (dVar59 / dVar71) * dVar22;
      dVar46 = (dVar23 * dVar27 - dVar113 * dVar45) * dVar22;
      dVar24 = (dVar92 * dVar23 * dVar27 -
               (dVar92 - ((dStack_1c60 - (local_1c68 + dStack_1ce0)) + 1.0) * dVar42) * dVar45 *
               dVar113) * dVar22 +
               (dVar61 * dVar72 +
                (dVar101 * dVar24 * -1.27 + dVar72 * -0.67 + local_1e48) *
                (local_1e78 * 4374.0 * local_1bc8 +
                (dVar26 * 0.9753) / -984.0 + (dVar25 * 0.024700000000000055) / -210.0) *
                (0.43429448190325176 / local_1c08) + dVar61 / dVar71) * 2.302585092994046 * dVar46;
      local_1f38[1] = local_1f38[1] - dVar46;
      local_1eb8 = local_1eb8 - dVar46;
      dStack_1eb0 = dStack_1eb0 + dVar46;
      dVar23 = dVar23 * dVar22;
      dVar22 = dVar22 * dVar45;
      dVar27 = (1.0 / dVar71 + dVar72) * (dVar46 / dVar21);
      if (iVar1 == 2) {
        local_1690 = local_1690 - dVar27;
        local_1618 = local_1618 - dVar27;
        local_1610 = local_1610 + dVar27;
        dVar21 = local_1df8[0x10] * dVar23;
        auStack_15e0._0_8_ = (double)auStack_15e0._0_8_ - dVar21;
        local_1568 = local_1568 - dVar21;
        local_1560 = dVar21 + local_1560;
        dVar21 = dVar27 * 5.0;
        local_1320 = local_1320 - dVar21;
        local_12a8 = local_12a8 - dVar21;
        local_12a0 = dVar21 + local_12a0;
        local_fb0 = local_fb0 - dVar27;
        local_f38 = local_f38 - dVar27;
        local_f30 = local_f30 + dVar27;
        dVar21 = dVar27 * 0.5;
        local_f00 = local_f00 - dVar21;
        local_e88 = local_e88 - dVar21;
        local_e80 = dVar21 + local_e80;
        local_e50 = local_e50 - dVar27;
        local_dd8 = local_dd8 - dVar27;
        local_dd0 = local_dd0 + dVar27;
        dVar23 = dVar23 * local_1df8[1];
        local_b90 = local_b90 - dVar23;
        local_b18 = local_b18 - dVar23;
        local_b10 = dVar23 + local_b10;
        local_ae0 = local_ae0 + dVar22;
        local_a68 = local_a68 + dVar22;
        local_a60 = local_a60 - dVar22;
        dVar22 = dVar27 + dVar27;
        local_a30 = local_a30 - dVar22;
        local_9b8 = local_9b8 - dVar22;
        local_9b0 = dVar22 + local_9b0;
        dVar27 = dVar27 * -0.30000000000000004;
        local_8d0 = local_8d0 - dVar27;
        local_858 = local_858 - dVar27;
        local_850 = dVar27 + local_850;
      }
      else {
        local_1ba8[0] = dVar27 * 2.0;
        local_1ba8[1] = local_1df8[0x10] * dVar23 + dVar27;
        local_1ba8[2] = dVar27;
        local_1ba8[3] = dVar27;
        local_1ba8[4] = dVar27;
        local_1ba8[5] = dVar27 * 6.0;
        local_1ba8[8] = dVar27;
        local_1ba8[9] = dVar27;
        local_1ba8[6] = dVar27;
        local_1ba8[7] = dVar27;
        local_1ba8[10] = local_1ba8[0];
        local_1ba8[0xb] = dVar27 * 1.5;
        local_1ba8[0xc] = local_1ba8[0];
        local_1ba8[0xd] = dVar27;
        local_1ba8[0xe] = dVar27;
        local_1ba8[0xf] = dVar27;
        local_1ba8[0x10] = dVar23 * local_1df8[1] + dVar27;
        local_1ba8[0x11] = dVar27 - dVar22;
        local_1ba8[0x12] = dVar27 * 3.0;
        local_1ba8[0x13] = dVar27;
        local_1ba8[0x14] = dVar27 * 0.7;
        pdVar13 = &local_1610;
        lVar12 = 0;
        do {
          dVar22 = local_1ba8[lVar12];
          pdVar13[-0x10] = pdVar13[-0x10] - dVar22;
          pdVar13[-1] = pdVar13[-1] - dVar22;
          *pdVar13 = dVar22 + *pdVar13;
          lVar12 = lVar12 + 1;
          pdVar13 = pdVar13 + 0x16;
        } while (lVar12 != 0x15);
      }
      local_828[1] = local_828[1] - dVar24;
      dStack_7a8 = dStack_7a8 - dVar24;
      dStack_7a0 = dVar24 + dStack_7a0;
      dVar21 = local_1df8[0x14] * -0.30000000000000004 +
               local_1df8[0x12] + local_1df8[0x12] +
               local_1df8[0xb] * 0.5 +
               local_1df8[5] * 5.0 + local_1df8[0] + local_1d38 + local_1df8[10] + local_1df8[0xc];
      dVar23 = exp((double)local_1e08._0_8_ * -0.99 + dVar42 * -795.0823319714576);
      dVar23 = dVar23 * 521000000000.0;
      dVar22 = exp((double)local_1e08._0_8_ * -7.08 + dVar42 * -3364.003410904553);
      local_1e78 = ((dVar21 * 1e-12) / dVar23) * dVar22 * 1.99e+41;
      dStack_1e70 = 0.0;
      dVar24 = log10(local_1e78);
      dVar25 = exp(local_1bb8 / -125.0);
      dVar26 = exp(local_1bb8 / -2219.0);
      dVar45 = exp(dVar42 * -6882.0);
      local_1e48 = dVar25 * 0.15780000000000005 + dVar26 * 0.8422 + dVar45;
      local_1e88._0_8_ = log10(local_1e48);
      dVar60 = (double)local_1e88._0_8_ * -1.27 + 0.75;
      dVar24 = (double)local_1e88._0_8_ * -0.67 + -0.4 + dVar24;
      local_1c08 = 1.0 / (dVar24 * -0.14 + dVar60);
      dVar24 = dVar24 * local_1c08;
      local_1e38 = 1.0 / (dVar24 * dVar24 + 1.0);
      dVar46 = pow(10.0,(double)local_1e88._0_8_ * local_1e38);
      dVar59 = exp((local_758 + local_1d28) - local_778);
      dVar27 = local_1df8[0xb];
      dVar22 = local_1df8[0];
      dVar61 = dVar42 * -0.99 + local_1bc8 * 795.0823319714576;
      dVar101 = ((double)local_1e88._0_8_ + (double)local_1e88._0_8_) * local_1e38 * local_1e38 *
                dVar24 * local_1c08;
      dVar92 = -dVar60 * dVar101 * local_1c08;
      dVar71 = ((dVar42 * -7.08 + local_1bc8 * 3364.003410904553) - dVar61) * 0.43429448190325176;
      dVar72 = local_1e78 + 1.0;
      dVar60 = dVar23 / (dVar59 * dVar20);
      dVar46 = (local_1e78 / dVar72) * dVar46;
      dVar59 = (dVar23 * dVar70 * dVar113 - dVar73 * dVar60) * dVar46;
      dVar113 = (dVar61 * dVar23 * dVar70 * dVar113 -
                (dVar61 - ((local_1c58 - (dVar28 + dVar29)) + 1.0) * dVar42) * dVar60 * dVar73) *
                dVar46 + (dVar71 * dVar92 +
                          (dVar101 * dVar24 * -1.27 + dVar92 * -0.67 + local_1e38) *
                          (dVar45 * 6882.0 * local_1bc8 +
                          (dVar26 * 0.8422) / -2219.0 + (dVar25 * 0.15780000000000005) / -125.0) *
                          (0.43429448190325176 / local_1e48) + dVar71 / dVar72) * 2.302585092994046
                         * dVar59;
      local_1f38[1] = local_1f38[1] - dVar59;
      dStack_1eb0 = dStack_1eb0 - dVar59;
      local_1ea8 = local_1ea8 + dVar59;
      dVar23 = dVar46 * dVar23;
      dVar70 = (1.0 / dVar72 + dVar92) * (dVar59 / dVar21);
      if (iVar1 == 2) {
        local_1690 = local_1690 - dVar70;
        local_1610 = local_1610 - dVar70;
        local_1608[0] = local_1608[0] + dVar70;
        dVar73 = local_1df8[0x11] * dVar23;
        auStack_15e0._0_8_ = (double)auStack_15e0._0_8_ - dVar73;
        local_1560 = local_1560 - dVar73;
        local_1558 = dVar73 + local_1558;
        dVar73 = dVar70 * 5.0;
        local_1320 = local_1320 - dVar73;
        local_12a0 = local_12a0 - dVar73;
        local_1298 = dVar73 + local_1298;
        local_fb0 = local_fb0 - dVar70;
        local_f30 = local_f30 - dVar70;
        local_f28 = local_f28 + dVar70;
        dVar73 = dVar70 * 0.5;
        local_f00 = local_f00 - dVar73;
        local_e80 = local_e80 - dVar73;
        local_e78 = dVar73 + local_e78;
        local_e50 = local_e50 - dVar70;
        local_dd0 = local_dd0 - dVar70;
        local_dc8 = local_dc8 + dVar70;
        dVar23 = dVar23 * local_1df8[1];
        local_ae0 = local_ae0 - dVar23;
        local_a60 = local_a60 - dVar23;
        local_a58 = dVar23 + local_a58;
        dVar73 = (dVar70 + dVar70) - dVar60 * dVar46;
        local_a30 = local_a30 - dVar73;
        local_9b0 = local_9b0 - dVar73;
        local_9a8 = dVar73 + local_9a8;
        dVar70 = dVar70 * -0.30000000000000004;
        local_8d0 = local_8d0 - dVar70;
        local_850 = local_850 - dVar70;
        local_848 = dVar70 + local_848;
      }
      else {
        local_1ba8[0] = dVar70 * 2.0;
        local_1ba8[1] = local_1df8[0x11] * dVar23 + dVar70;
        local_1ba8[2] = dVar70;
        local_1ba8[3] = dVar70;
        local_1ba8[4] = dVar70;
        local_1ba8[5] = dVar70 * 6.0;
        local_1ba8[8] = dVar70;
        local_1ba8[9] = dVar70;
        local_1ba8[6] = dVar70;
        local_1ba8[7] = dVar70;
        local_1ba8[10] = local_1ba8[0];
        local_1ba8[0xb] = dVar70 * 1.5;
        local_1ba8[0xc] = local_1ba8[0];
        local_1ba8[0xf] = dVar70;
        local_1ba8[0x10] = dVar70;
        local_1ba8[0xd] = dVar70;
        local_1ba8[0xe] = dVar70;
        local_1ba8[0x11] = local_1df8[1] * dVar23 + dVar70;
        local_1ba8[0x12] = dVar70 * 3.0 + -(dVar60 * dVar46);
        local_1ba8[0x13] = dVar70;
        local_1ba8[0x14] = dVar70 * 0.7;
        pdVar13 = local_1608;
        lVar12 = 0;
        do {
          dVar70 = local_1ba8[lVar12];
          pdVar13[-0x11] = pdVar13[-0x11] - dVar70;
          pdVar13[-1] = pdVar13[-1] - dVar70;
          *pdVar13 = dVar70 + *pdVar13;
          lVar12 = lVar12 + 1;
          pdVar13 = pdVar13 + 0x16;
        } while (lVar12 != 0x15);
      }
      local_828[1] = local_828[1] - dVar113;
      dStack_7a0 = dStack_7a0 - dVar113;
      local_798 = dVar113 + local_798;
      dVar29 = local_1df8[0x14] * -0.30000000000000004 +
               local_1df8[0x12] + local_1df8[0x12] +
               local_1df8[0xb] * 0.5 +
               local_1df8[5] * 5.0 + local_1d38 + local_1df8[0] + local_1df8[10] + local_1df8[0xc];
      dVar46 = (double)local_1e08._0_8_ * 1.5;
      dVar21 = exp(dVar42 * -40056.04659805571 + dVar46);
      dVar21 = dVar21 * 43.0;
      dVar70 = exp((double)local_1e08._0_8_ * -3.42 + dVar42 * -42446.32576062813);
      dVar59 = ((dVar29 * 1e-12) / dVar21) * dVar70 * 5.07e+27;
      dVar23 = log10(dVar59);
      dVar24 = exp(local_1bb8 / -197.0);
      dVar25 = exp(local_1bb8 / -1540.0);
      local_1e78 = exp(dVar42 * -10300.0);
      local_1c08 = dVar24 * 0.06799999999999995 + dVar25 * 0.932 + local_1e78;
      dVar26 = log10(local_1c08);
      dVar60 = dVar26 * -1.27 + 0.75;
      dVar23 = dVar26 * -0.67 + -0.4 + dVar23;
      dVar71 = 1.0 / (dVar23 * -0.14 + dVar60);
      dVar23 = dVar23 * dVar71;
      local_1e48 = 1.0 / (dVar23 * dVar23 + 1.0);
      dVar113 = pow(10.0,dVar26 * local_1e48);
      dVar73 = local_1df8[0xe];
      dVar45 = exp((local_1868 + local_1878) - local_1928);
      dVar28 = local_1df8[0x12];
      dVar70 = local_1df8[9];
      dVar72 = (dVar26 + dVar26) * local_1e48 * local_1e48 * dVar23 * dVar71;
      dVar71 = -dVar60 * dVar72 * dVar71;
      dVar60 = local_1bc8 * 40056.04659805571 + dVar42 * 1.5;
      dVar92 = dVar59 + 1.0;
      dVar61 = ((dVar42 * -3.42 + local_1bc8 * 42446.32576062813) - dVar60) * 0.43429448190325176;
      dVar45 = dVar21 / (dVar45 * dVar20);
      dVar113 = (dVar59 / dVar92) * dVar113;
      dVar26 = (dVar21 * dVar22 * dVar27 - dVar73 * dVar45) * dVar113;
      dVar22 = (dVar60 * dVar21 * dVar22 * dVar27 -
               (dVar60 - ((local_1c78 - (local_1ce8 + dStack_1c90)) + 1.0) * dVar42) * dVar45 *
               dVar73) * dVar113 +
               (dVar61 * dVar71 +
                (dVar72 * dVar23 * -1.27 + dVar71 * -0.67 + local_1e48) *
                (local_1e78 * 10300.0 * local_1bc8 +
                (dVar25 * 0.932) / -1540.0 + (dVar24 * 0.06799999999999995) / -197.0) *
                (0.43429448190325176 / local_1c08) + dVar61 / dVar92) * 2.302585092994046 * dVar26;
      local_1f38[0] = local_1f38[0] - dVar26;
      dStack_1ee0 = dStack_1ee0 - dVar26;
      local_1ec8 = local_1ec8 + dVar26;
      dVar21 = dVar21 * dVar113;
      dVar113 = dVar113 * dVar45;
      dVar27 = (1.0 / dVar92 + dVar71) * (dVar26 / dVar29);
      if (iVar1 == 2) {
        dVar73 = dVar21 * local_1df8[0xb] + dVar27;
        local_16a0[1] = local_16a0[1] - dVar73;
        local_1640 = local_1640 - dVar73;
        local_1628 = dVar73 + local_1628;
        dVar73 = dVar27 * 5.0;
        local_1328 = local_1328 - dVar73;
        local_12d0 = local_12d0 - dVar73;
        local_12b8 = dVar73 + local_12b8;
        local_fb8 = local_fb8 - dVar27;
        dStack_f60 = dStack_f60 - dVar27;
        local_f48 = local_f48 + dVar27;
        dVar73 = dVar27 * 0.5 + dVar21 * local_1df8[0];
        local_f08 = local_f08 - dVar73;
        dStack_eb0 = dStack_eb0 - dVar73;
        local_e98 = dVar73 + local_e98;
        local_e58 = local_e58 - dVar27;
        local_e00 = local_e00 - dVar27;
        local_de8 = local_de8 + dVar27;
        local_cf8 = local_cf8 + dVar113;
        local_ca0 = local_ca0 + dVar113;
        local_c88 = local_c88 - dVar113;
        dVar113 = dVar27 + dVar27;
        local_a38 = local_a38 - dVar113;
        local_9e0 = local_9e0 - dVar113;
        local_9c8 = dVar113 + local_9c8;
        dVar27 = dVar27 * -0.30000000000000004;
        local_8d8 = local_8d8 - dVar27;
        local_880 = local_880 - dVar27;
        local_868 = dVar27 + local_868;
      }
      else {
        local_1ba8[10] = dVar27 + dVar27;
        local_1ba8[0] = dVar21 * local_1df8[0xb] + local_1ba8[10];
        local_1ba8[3] = dVar27;
        local_1ba8[4] = dVar27;
        local_1ba8[1] = dVar27;
        local_1ba8[2] = dVar27;
        local_1ba8[5] = dVar27 * 6.0;
        local_1ba8[8] = dVar27;
        local_1ba8[9] = dVar27;
        local_1ba8[6] = dVar27;
        local_1ba8[7] = dVar27;
        local_1ba8[0xb] = dVar27 * 1.5 + dVar21 * local_1df8[0];
        local_1ba8[0xc] = local_1ba8[10];
        local_1ba8[0xd] = dVar27;
        local_1ba8[0xe] = dVar27 - dVar113;
        local_1ba8[0xf] = dVar27;
        local_1ba8[0x10] = dVar27;
        local_1ba8[0x11] = dVar27;
        local_1ba8[0x12] = dVar27 * 3.0;
        local_1ba8[0x13] = dVar27;
        local_1ba8[0x14] = dVar27 * 0.7;
        pdVar13 = &local_1628;
        lVar12 = 0;
        do {
          dVar27 = local_1ba8[lVar12];
          pdVar13[-0xe] = pdVar13[-0xe] - dVar27;
          pdVar13[-3] = pdVar13[-3] - dVar27;
          *pdVar13 = dVar27 + *pdVar13;
          lVar12 = lVar12 + 1;
          pdVar13 = pdVar13 + 0x16;
        } while (lVar12 != 0x15);
      }
      local_828[0] = local_828[0] - dVar22;
      local_7d8._8_8_ = (double)local_7d8._8_8_ - dVar22;
      dStack_7b8 = dVar22 + dStack_7b8;
      dVar25 = local_1df8[0x14] * -0.30000000000000004 +
               local_1df8[0x12] + local_1df8[0x12] +
               local_1df8[0xb] * 0.5 +
               local_1df8[5] * 5.0 + local_1df8[0] + local_1d38 + local_1df8[10] + local_1df8[0xc];
      dVar26 = exp((double)local_1e08._0_8_ * -0.97 + dVar42 * -311.9943327989264);
      dVar26 = dVar26 * 21200000000.0;
      dVar22 = exp((double)local_1e08._0_8_ * -9.67 + dVar42 * -3130.0076613053584);
      dVar101 = ((dVar25 * 1e-12) / dVar26) * dVar22 * 1.77e+50;
      dVar22 = log10(dVar101);
      dVar45 = exp(local_1bb8 / -151.0);
      dVar59 = exp(local_1bb8 / -1038.0);
      dVar60 = exp(dVar42 * -4970.0);
      dVar47 = dVar45 * 0.4675 + dVar59 * 0.5325 + dVar60;
      dVar61 = log10(dVar47);
      local_1e78 = dVar61 * -1.27 + 0.75;
      dVar22 = dVar61 * -0.67 + -0.4 + dVar22;
      dVar74 = 1.0 / (dVar22 * -0.14 + local_1e78);
      local_1c08 = dVar22 * dVar74;
      local_1e48 = 1.0 / (local_1c08 * local_1c08 + 1.0);
      dVar71 = pow(10.0,dVar61 * local_1e48);
      dVar72 = local_1848 + local_1848;
      dVar92 = exp(dVar72 - local_778);
      dVar24 = local_1df8[0x14];
      dVar23 = local_1df8[0x12];
      dVar21 = local_1df8[0xc];
      dVar29 = local_1df8[0xb];
      dVar73 = local_1df8[10];
      dVar113 = local_1df8[5];
      dVar27 = local_1df8[2];
      dVar22 = local_1df8[1];
      dVar48 = dVar42 * -0.97 + local_1bc8 * 311.9943327989264;
      dVar93 = (dVar61 + dVar61) * local_1e48 * local_1e48 * local_1c08 * dVar74;
      dVar74 = -local_1e78 * dVar93 * dVar74;
      dVar70 = dVar70 * dVar70;
      dVar75 = dVar101 + 1.0;
      dVar61 = ((dVar42 * -9.67 + local_1bc8 * 3130.0076613053584) - dVar48) * 0.43429448190325176;
      dVar92 = dVar26 / (dVar92 * dVar20);
      dVar71 = (dVar101 / dVar75) * dVar71;
      dVar101 = (dVar26 * dVar70 - dVar28 * dVar92) * dVar71;
      dVar28 = (dVar48 * dVar26 * dVar70 -
               (dVar48 - ((local_1c58 - (dStack_1ca0 + dStack_1ca0)) + 1.0) * dVar42) * dVar92 *
               dVar28) * dVar71 +
               (dVar61 * dVar74 +
                (dVar93 * local_1c08 * -1.27 + dVar74 * -0.67 + local_1e48) *
                (dVar60 * 4970.0 * local_1bc8 +
                (dVar59 * 0.5325) / -1038.0 + (dVar45 * 0.4675) / -151.0) *
                (0.43429448190325176 / dVar47) + dVar61 / dVar75) * 2.302585092994046 * dVar101;
      dStack_1ef0 = dStack_1ef0 - (dVar101 + dVar101);
      local_1ea8 = local_1ea8 + dVar101;
      dVar26 = dVar26 * dVar71;
      dVar70 = (1.0 / dVar75 + dVar74) * (dVar101 / dVar25);
      if (iVar1 == 2) {
        dVar25 = dVar70 * -2.0;
        local_1650 = local_1650 + dVar25;
        local_1608[0] = local_1608[0] + dVar70;
        dVar45 = dVar70 * 5.0;
        local_12e0 = local_12e0 - (dVar45 + dVar45);
        local_1298 = dVar45 + local_1298;
        dVar26 = (dVar26 + dVar26) * local_1df8[9];
        local_1020 = local_1020 - (dVar26 + dVar26);
        local_fd8 = dVar26 + local_fd8;
        local_f70 = local_f70 + dVar25;
        local_f28 = local_f28 + dVar70;
        dVar26 = dVar70 * 0.5;
        local_ec0 = local_ec0 - (dVar26 + dVar26);
        local_e78 = dVar26 + local_e78;
        local_e10 = dVar25 + local_e10;
        local_dc8 = local_dc8 + dVar70;
        dVar25 = (dVar70 + dVar70) - dVar71 * dVar92;
        local_9f0 = local_9f0 - (dVar25 + dVar25);
        local_9a8 = dVar25 + local_9a8;
        dVar70 = dVar70 * -0.30000000000000004;
        local_890 = local_890 - (dVar70 + dVar70);
        local_848 = dVar70 + local_848;
      }
      else {
        local_1ba8[0] = dVar70 * 2.0;
        local_1ba8[3] = dVar70;
        local_1ba8[4] = dVar70;
        local_1ba8[1] = dVar70;
        local_1ba8[2] = dVar70;
        local_1ba8[5] = dVar70 * 6.0;
        local_1ba8[6] = dVar70;
        local_1ba8[7] = dVar70;
        local_1ba8[8] = dVar70;
        local_1ba8[9] = (dVar26 + dVar26) * local_1df8[9] + dVar70;
        local_1ba8[10] = local_1ba8[0];
        local_1ba8[0xb] = dVar70 * 1.5;
        local_1ba8[0xc] = local_1ba8[0];
        local_1ba8[0xf] = dVar70;
        local_1ba8[0x10] = dVar70;
        local_1ba8[0xd] = dVar70;
        local_1ba8[0xe] = dVar70;
        local_1ba8[0x11] = dVar70;
        local_1ba8[0x12] = dVar70 * 3.0 - dVar71 * dVar92;
        local_1ba8[0x13] = dVar70;
        local_1ba8[0x14] = dVar70 * 0.7;
        pdVar13 = &local_1650;
        lVar12 = 0;
        do {
          dVar70 = local_1ba8[lVar12];
          *pdVar13 = *pdVar13 - (dVar70 + dVar70);
          pdVar13[9] = dVar70 + pdVar13[9];
          lVar12 = lVar12 + 1;
          pdVar13 = pdVar13 + 0x16;
        } while (lVar12 != 0x15);
      }
      local_828[9] = local_828[9] - (dVar28 + dVar28);
      local_798 = dVar28 + local_798;
      dVar26 = local_1df8[0] + local_1d38;
      dVar45 = dVar44 - (double)local_1e08._0_8_;
      dVar70 = exp(dVar45);
      dVar25 = local_1df8[4];
      local_1e78 = dStack_750;
      dStack_1e70 = dStack_750;
      local_1e48 = dStack_1860;
      dStack_1e40 = dStack_1860;
      dVar59 = exp((dStack_750 + local_1d28) - dStack_1860);
      dVar28 = local_1df8[3];
      dVar70 = dVar70 * 500000.0;
      local_1e58 = local_1e68 - dVar42;
      dVar71 = dVar70 / (dVar59 * dVar20);
      local_1a88 = dStack_1ce0;
      local_1e38 = local_1cd8;
      dVar60 = dVar24 * -0.30000000000000004 +
               dVar29 * 0.5 + dVar113 * 5.0 + dVar26 + dVar73 + dVar21 + dVar23 + dVar23;
      dVar59 = dVar27 * dVar22 * dVar70 + -dVar71 * dVar25;
      dVar101 = dVar60 * dVar59;
      dStack_1e50 = dStack_1e60;
      dVar61 = local_1f38[1] - dVar101;
      dVar92 = local_1f38[2] - dVar101;
      local_1f38[1] = dVar61;
      local_1f38[2] = dVar92;
      local_1f38[4] = dVar101 + local_1f38[4];
      dVar25 = (local_1e58 * dVar70 * dVar27 * dVar22 -
               (local_1e58 - ((local_1cc8 - (dStack_1ce0 + local_1cd8)) + 1.0) * dVar42) * dVar71 *
               dVar25) * dVar60;
      dVar70 = dVar70 * dVar60;
      dVar60 = dVar60 * dVar71;
      if (iVar1 == 2) {
        local_1690 = local_1690 - dVar59;
        dStack_1688 = dStack_1688 - dVar59;
        local_1678 = local_1678 + dVar59;
        dVar71 = dVar70 * dVar27;
        auStack_15e0._8_8_ = (double)auStack_15e0._8_8_ - dVar71;
        auStack_15e0._0_8_ = (double)auStack_15e0._0_8_ - dVar71;
        dStack_15c8 = dVar71 + dStack_15c8;
        dVar70 = dVar70 * dVar22;
        local_1530 = local_1530 - dVar70;
        dStack_1528 = dStack_1528 - dVar70;
        dStack_1518 = dVar70 + dStack_1518;
        local_13d0 = dVar60 + local_13d0;
        dStack_13c8 = dVar60 + dStack_13c8;
        local_13c0._8_8_ = (double)local_13c0._8_8_ - dVar60;
        dVar70 = dVar59 * 5.0;
        local_1320 = local_1320 - dVar70;
        dStack_1318 = dStack_1318 - dVar70;
        local_1308 = dVar70 + local_1308;
        local_fb0 = local_fb0 - dVar59;
        dStack_fa8 = dStack_fa8 - dVar59;
        local_f98 = local_f98 + dVar59;
        dVar70 = dVar59 * 0.5;
        local_f00 = local_f00 - dVar70;
        dStack_ef8 = dStack_ef8 - dVar70;
        local_ee8 = dVar70 + local_ee8;
        local_e50 = local_e50 - dVar59;
        dStack_e48 = dStack_e48 - dVar59;
        local_e38 = local_e38 + dVar59;
        dVar70 = dVar59 + dVar59;
        local_a30 = local_a30 - dVar70;
        dStack_a28 = dStack_a28 - dVar70;
        local_a18 = dVar70 + local_a18;
        dVar59 = dVar59 * -0.30000000000000004;
        local_8d0 = local_8d0 - dVar59;
        dStack_8c8 = dStack_8c8 - dVar59;
        local_8b8 = dVar59 + local_8b8;
      }
      else {
        local_1ba8[0] = dVar59 * 2.0;
        local_1ba8[1] = dVar70 * dVar27 + dVar59;
        local_1ba8[2] = dVar70 * dVar22 + dVar59;
        local_1ba8[3] = dVar59;
        local_1ba8[4] = dVar59 - dVar60;
        local_1ba8[5] = dVar59 * 6.0;
        local_1ba8[8] = dVar59;
        local_1ba8[9] = dVar59;
        local_1ba8[6] = dVar59;
        local_1ba8[7] = dVar59;
        local_1ba8[10] = local_1ba8[0];
        local_1ba8[0xb] = dVar59 * 1.5;
        local_1ba8[0xc] = local_1ba8[0];
        local_1ba8[0xf] = dVar59;
        local_1ba8[0x10] = dVar59;
        local_1ba8[0xd] = dVar59;
        local_1ba8[0xe] = dVar59;
        local_1ba8[0x11] = dVar59;
        local_1ba8[0x12] = dVar59 * 3.0;
        local_1ba8[0x13] = dVar59;
        local_1ba8[0x14] = dVar59 * 0.7;
        pdVar13 = local_16a0 + 2;
        lVar12 = 0;
        do {
          dVar70 = local_1ba8[lVar12];
          *pdVar13 = *pdVar13 - dVar70;
          pdVar13[1] = pdVar13[1] - dVar70;
          pdVar13[3] = dVar70 + pdVar13[3];
          lVar12 = lVar12 + 1;
          pdVar13 = pdVar13 + 0x16;
        } while (lVar12 != 0x15);
      }
      dVar59 = local_828[1] - dVar25;
      dVar101 = local_828[2] - dVar25;
      local_828[4] = dVar25 + local_828[4];
      dVar74 = local_1bb8 * -0.0;
      local_1c08 = (double)local_1e08._0_8_ * 0.0;
      uStack_1c00 = local_1e08._8_8_;
      local_828[1] = dVar59;
      local_828[2] = dVar101;
      local_1e88._0_8_ = exp(dVar42 * -1509.64999741416 + local_1c08);
      dVar60 = exp((local_1868 + local_1e78) - local_1d48);
      dVar25 = local_768;
      dVar47 = dVar24 * -0.5 +
               dVar23 + dVar23 +
               dVar21 * 2.5 + dVar29 * 0.5 + dVar113 * 5.0 + dVar28 * 5.0 + dVar26 + dVar73;
      dVar70 = (double)local_1e88._0_8_ * 602.0;
      dVar71 = dVar42 * 0.0;
      dVar26 = local_1bc8 * 1509.64999741416 + dVar71;
      dVar60 = dVar70 / (dVar60 * dVar20);
      dVar73 = dVar70 * dVar29 * dVar27 - dVar21 * dVar60;
      dVar26 = (dVar26 * dVar70 * dVar29 * dVar27 -
               (dVar26 - ((local_1c88 - (local_1e38 + dStack_1c90)) + 1.0) * dVar42) * dVar60 *
               dVar21) * dVar47;
      dVar70 = dVar70 * dVar47;
      dVar48 = dVar47 * dVar73;
      local_1f38[2] = dVar92 - dVar48;
      dStack_1ee0 = dStack_1ee0 - dVar48;
      local_1ed8 = dVar48 + local_1ed8;
      if (iVar1 == 2) {
        dStack_1688 = dStack_1688 - dVar73;
        local_1640 = local_1640 - dVar73;
        local_1638 = local_1638 + dVar73;
        dVar92 = dVar70 * dVar29;
        dStack_1528 = dStack_1528 - dVar92;
        local_14e0 = local_14e0 - dVar92;
        local_14d8 = dVar92 + local_14d8;
        dVar92 = dVar73 * 5.0;
        dStack_1478 = dStack_1478 - dVar92;
        local_1430 = local_1430 - dVar92;
        local_1428 = local_1428 + dVar92;
        dStack_1318 = dStack_1318 - dVar92;
        local_12d0 = local_12d0 - dVar92;
        local_12c8 = dVar92 + local_12c8;
        dStack_fa8 = dStack_fa8 - dVar73;
        dStack_f60 = dStack_f60 - dVar73;
        local_f58 = local_f58 + dVar73;
        dVar27 = dVar73 * 0.5 + dVar27 * dVar70;
        dStack_ef8 = dStack_ef8 - dVar27;
        dStack_eb0 = dStack_eb0 - dVar27;
        dStack_ea8 = dVar27 + dStack_ea8;
        dVar27 = dVar73 * 2.5 - dVar60 * dVar47;
        dStack_e48 = dStack_e48 - dVar27;
        local_e00 = local_e00 - dVar27;
        local_df8 = dVar27 + local_df8;
        dVar27 = dVar73 + dVar73;
        dStack_a28 = dStack_a28 - dVar27;
        local_9e0 = local_9e0 - dVar27;
        local_9d8 = dVar27 + local_9d8;
        dVar73 = dVar73 * -0.5;
        dStack_8c8 = dStack_8c8 - dVar73;
        local_880 = local_880 - dVar73;
        local_878 = dVar73 + local_878;
        local_828[2] = dVar101;
      }
      else {
        local_1ba8[0] = dVar73 + dVar73;
        local_1ba8[1] = dVar73;
        local_1ba8[2] = dVar70 * dVar29 + dVar73;
        local_1ba8[3] = dVar73 * 6.0;
        local_1ba8[4] = dVar73;
        local_1ba8[5] = dVar73 * 6.0;
        local_1ba8[8] = dVar73;
        local_1ba8[9] = dVar73;
        local_1ba8[6] = dVar73;
        local_1ba8[7] = dVar73;
        local_1ba8[10] = dVar73 + dVar73;
        local_1ba8[0xb] = dVar73 * 1.5 + dVar27 * dVar70;
        local_1ba8[0xc] = dVar73 * 3.5 + -(dVar60 * dVar47);
        local_1ba8[0xf] = dVar73;
        local_1ba8[0x10] = dVar73;
        local_1ba8[0xd] = dVar73;
        local_1ba8[0xe] = dVar73;
        local_1ba8[0x11] = dVar73;
        local_1ba8[0x12] = dVar73 * 3.0;
        local_1ba8[0x13] = dVar73;
        local_1ba8[0x14] = dVar73 * 0.5;
        pdVar13 = &local_1638;
        lVar12 = 0;
        do {
          dVar27 = local_1ba8[lVar12];
          pdVar13[-10] = pdVar13[-10] - dVar27;
          pdVar13[-1] = pdVar13[-1] - dVar27;
          *pdVar13 = dVar27 + *pdVar13;
          lVar12 = lVar12 + 1;
          pdVar13 = pdVar13 + 0x16;
        } while (lVar12 != 0x15);
      }
      local_828[2] = local_828[2] - dVar26;
      local_7d8._8_8_ = (double)local_7d8._8_8_ - dVar26;
      local_7c8 = dVar26 + local_7c8;
      dVar27 = (dVar23 * 0.5 + dVar21 * 0.5 + dVar29 * -0.25 + ((local_1d38 - dVar28) - dVar113)) -
               local_1df8[0x13];
      dVar70 = exp((double)local_1e08._0_8_ * -0.86 + dVar44);
      local_1e38 = local_1df8[6];
      dVar73 = ((double)local_1c38._0_8_ + local_1d28) - (double)local_1cf8._0_8_;
      dVar29 = exp(dVar73);
      dVar27 = dVar27 - dVar24;
      dVar24 = dVar28 * dVar22;
      dVar70 = dVar70 * 2800000.0;
      dVar23 = dVar42 * -0.86 + local_1e68;
      dVar21 = dVar70 / (dVar29 * dVar20);
      local_1d18 = dStack_1cd0;
      local_1be8 = local_1cb8;
      local_1828 = local_1a88 + dStack_1cd0;
      dVar29 = dVar70 * dVar24 - local_1e38 * dVar21;
      local_1d08 = dVar27 * dVar29;
      dVar26 = (dVar23 * dVar70 * dVar24 -
               (dVar23 - ((local_1cb8 - (local_1a88 + dStack_1cd0)) + 1.0) * dVar42) * dVar21 *
               local_1e38) * dVar27;
      dVar61 = dVar61 - local_1d08;
      local_1f38[1] = dVar61;
      dVar23 = local_1f38[3] - local_1d08;
      local_1f38[3] = dVar23;
      local_1d08 = local_1d08 + local_1f38[6];
      local_1f38[6] = local_1d08;
      dVar70 = dVar70 * dVar27;
      dVar21 = dVar21 * dVar27;
      dVar27 = dVar70 * dVar28;
      if (iVar1 == 2) {
        local_2118 = (double)auStack_15e0._0_8_ - dVar27;
        auStack_15e0._0_8_ = local_2118;
        local_15d0 = local_15d0 - dVar27;
        local_15b8 = dVar27 + local_15b8;
        dVar27 = dVar70 * dVar22 - dVar29;
        local_2128 = local_1480 - dVar27;
        local_1480 = local_2128;
        local_1470 = local_1470 - dVar27;
        dStack_1458 = dVar27 + dStack_1458;
        local_1320 = local_1320 + dVar29;
        local_1310 = local_1310 + dVar29;
        local_12f8 = local_12f8 - dVar29;
        local_1270 = local_1270 + dVar21;
        local_1260 = local_1260 + dVar21;
        dStack_1248 = dStack_1248 - dVar21;
        dVar27 = dVar29 * -0.25;
        local_f00 = local_f00 - dVar27;
        local_ef0 = local_ef0 - dVar27;
        local_ed8 = dVar27 + local_ed8;
        dVar27 = dVar29 * 0.5;
        local_e50 = local_e50 - dVar27;
        local_e40 = local_e40 - dVar27;
        local_e28 = local_e28 + dVar27;
        local_a30 = local_a30 - dVar27;
        local_a20 = local_a20 - dVar27;
        local_a08 = dVar27 + local_a08;
        local_980 = local_980 + dVar29;
        local_970 = local_970 + dVar29;
        local_958 = local_958 - dVar29;
        local_8d0 = local_8d0 + dVar29;
        local_8c0 = local_8c0 + dVar29;
        local_8a8 = local_8a8 - dVar29;
      }
      else {
        local_1ba8[0] = dVar29;
        local_1ba8[1] = dVar27 + dVar29;
        local_1ba8[2] = dVar29;
        local_1ba8[3] = dVar70 * dVar22;
        local_1ba8[4] = dVar29;
        local_1ba8[6] = dVar29 - dVar21;
        local_1ba8[9] = dVar29;
        local_1ba8[10] = dVar29;
        local_1ba8[7] = dVar29;
        local_1ba8[8] = dVar29;
        local_1ba8[0xb] = dVar29 * 0.75;
        local_1ba8[0xc] = dVar29 * 1.5;
        local_1ba8[0xf] = dVar29;
        local_1ba8[0x10] = dVar29;
        local_1ba8[0xd] = dVar29;
        local_1ba8[0xe] = dVar29;
        local_1ba8[0x11] = dVar29;
        local_1ba8[0x12] = dVar29 * 1.5;
        pdVar13 = local_16a0 + 2;
        lVar12 = 0;
        do {
          dVar27 = local_1ba8[lVar12];
          *pdVar13 = *pdVar13 - dVar27;
          pdVar13[2] = pdVar13[2] - dVar27;
          pdVar13[5] = dVar27 + pdVar13[5];
          lVar12 = lVar12 + 1;
          pdVar13 = pdVar13 + 0x16;
        } while (lVar12 != 0x15);
        local_2118 = (double)auStack_15e0._0_8_;
        local_2128 = local_1480;
        dVar59 = local_828[1];
      }
      dVar70 = dStack_1248;
      dVar47 = local_1260;
      dVar101 = local_1270;
      dVar27 = dStack_1458;
      dVar92 = local_1470;
      dVar60 = local_15d0;
      dVar48 = local_828[3] - dVar26;
      local_6c8 = dVar26 + local_828[6];
      uStack_6c0 = 0;
      local_1e18 = local_648 * -0.0;
      dStack_1e10 = (double)uStack_640;
      local_6d8 = dVar22 * dVar28 * dVar28;
      dVar93 = (double)local_1e08._0_8_ * -1.72 + dVar44;
      local_1e28._0_8_ = local_15b8;
      dVar29 = exp(dVar93);
      dVar29 = dVar29 * 300000000.0;
      local_1e88._8_8_ = 0;
      local_1e88._0_8_ = dVar42 * -1.72 + local_1e68;
      local_1838 = dVar28 * local_1e38;
      dVar21 = exp(dVar73);
      dVar21 = dVar29 / (dVar21 * dVar20);
      dVar102 = dVar29 * local_6d8 - local_1838 * dVar21;
      dVar76 = (double)local_1e88._0_8_ * dVar29 * local_6d8 -
               ((double)local_1e88._0_8_ -
               (((local_1d18 + local_1be8) - (local_1d18 + local_1d18 + local_1a88)) + 1.0) * dVar42
               ) * dVar21 * local_1838;
      local_1a88 = dVar102 + local_1d08;
      dVar77 = dVar28 * dVar28 * dVar29;
      dVar78 = dVar77 + (double)local_1e28._0_8_;
      dVar62 = (dVar29 * dVar22 + dVar29 * dVar22) * dVar28 - dVar21 * local_1e38;
      dVar28 = -dVar21 * dVar28;
      dVar94 = dVar76 + local_6c8;
      local_1d08 = exp((double)local_1e08._0_8_ * -0.76 + dVar44);
      local_1d08 = local_1d08 * 9380000.0;
      dVar22 = dVar42 * -0.76 + local_1e68;
      dVar21 = dVar113 * local_1e38;
      dVar75 = exp(dVar73);
      dVar29 = local_1df8[0x13];
      dVar75 = local_1d08 / (dVar75 * dVar20);
      dVar95 = local_1d08 * dVar24 * dVar113 - dVar21 * dVar75;
      dVar110 = dVar22 * local_1d08 * dVar24 * dVar113 -
                (dVar22 - (((dStack_1cc0 + local_1be8) - (local_1828 + dStack_1cc0)) + 1.0) * dVar42
                ) * dVar75 * dVar21;
      dVar96 = dVar95 + local_1a88;
      dVar105 = local_1d08 * local_1df8[3] * local_1df8[5];
      local_1d18 = local_1df8[1];
      dVar79 = -dVar75 * local_1df8[5];
      dVar106 = local_1df8[5] * local_1d08 * local_1df8[1];
      local_1828 = dVar106 + dVar62 + dVar27;
      local_1e38 = local_1df8[6];
      local_1e28._0_8_ = local_1df8[3];
      dVar22 = local_1d08 * local_1df8[1] * local_1df8[3] - dVar75 * local_1df8[6];
      local_1320 = local_1320 - dVar22;
      local_1310 = local_1310 - dVar22;
      local_12f8 = dVar22 + local_12f8;
      local_1d08 = dVar79 + dVar28 + dVar70;
      uStack_1d00 = 0x8000000000000000;
      dVar24 = local_1df8[3] * local_1df8[1];
      dVar22 = dVar24 * local_1df8[0x13];
      dVar27 = exp(dVar93);
      dVar27 = dVar27 * 375000000.0;
      dVar70 = local_1e38 * dVar29;
      dVar113 = exp(dVar73);
      dVar21 = local_1df8[0x14];
      dVar113 = dVar27 / (dVar113 * dVar20);
      local_1a88 = dStack_1ce0 + dStack_1cd0;
      local_1be8 = local_1cb8;
      dVar97 = dVar27 * dVar22 - dVar70 * dVar113;
      dVar75 = (double)local_1e88._0_8_ * dVar27 * dVar22 -
               ((double)local_1e88._0_8_ -
               (((dStack_1c50 + local_1cb8) - (local_1a88 + dStack_1c50)) + 1.0) * dVar42) * dVar113
               * dVar70;
      dVar93 = dVar27 * (double)local_1e28._0_8_ * dVar29;
      dVar80 = dVar29 * dVar27 * local_1d18;
      dVar81 = dVar80 + local_1828;
      dVar29 = -dVar113 * dVar29;
      dVar82 = dVar29 + local_1d08;
      dVar22 = dVar27 * local_1d18 * (double)local_1e28._0_8_ - dVar113 * local_1e38;
      local_980 = local_980 - dVar22;
      local_970 = local_970 - dVar22;
      local_958 = dVar22 + local_958;
      local_1e88._0_8_ = dVar75 + dVar110 + dVar94;
      dVar24 = dVar24 * local_1df8[0x14];
      local_1c18 = exp(local_1c18);
      dVar22 = local_1df8[6];
      local_1c18 = local_1c18 * 700000.0;
      local_1e38 = local_1df8[6] * dVar21;
      dVar73 = exp(dVar73);
      dVar113 = local_1df8[0x12];
      dVar27 = local_1df8[5];
      dVar70 = local_1df8[0];
      dVar73 = local_1c18 / (dVar73 * dVar20);
      local_1f38[6] = local_1c18 * dVar24 - local_1e38 * dVar73;
      local_828[6] = dVar109 * local_1c18 * dVar24 -
                     (dVar109 -
                     (((local_1c48 + local_1be8) - (local_1a88 + local_1c48)) + 1.0) * dVar42) *
                     dVar73 * local_1e38;
      dVar24 = (((dVar61 - dVar102) - dVar95) - dVar97) - local_1f38[6];
      local_1f38[3] = (((dVar23 - dVar102) - dVar95) - dVar97) - local_1f38[6];
      local_1f38[6] = local_1f38[6] + dVar97 + dVar96;
      local_15b8 = local_1c18 * local_1df8[3] * dVar21;
      local_2118 = (((local_2118 - dVar77) - dVar105) - dVar93) - local_15b8;
      auStack_15e0._0_8_ = local_2118;
      local_15d0 = (((dVar60 - dVar77) - dVar105) - dVar93) - local_15b8;
      local_15b8 = local_15b8 + dVar93 + dVar105 + dVar78;
      local_1e38 = local_1df8[1];
      dStack_1458 = dVar21 * local_1c18 * local_1df8[1];
      local_1480 = (((local_2128 - dVar62) - dVar106) - dVar80) - dStack_1458;
      local_1470 = (((dVar92 - dVar62) - dVar106) - dVar80) - dStack_1458;
      dStack_1458 = dStack_1458 + dVar81;
      dStack_1248 = -dVar73 * dVar21;
      local_1270 = (((dVar101 - dVar28) - dVar79) - dVar29) - dStack_1248;
      local_1260 = (((dVar47 - dVar28) - dVar79) - dVar29) - dStack_1248;
      dStack_1248 = dStack_1248 + dVar82;
      dVar22 = local_1c18 * local_1df8[1] * local_1df8[3] - dVar73 * dVar22;
      dVar60 = local_8d0 - dVar22;
      local_8c0 = local_8c0 - dVar22;
      local_8a8 = dVar22 + local_8a8;
      local_2088 = ((((dVar59 - dVar26) - dVar76) - dVar110) - dVar75) - local_828[6];
      local_828[3] = (((dVar48 - dVar76) - dVar110) - dVar75) - local_828[6];
      local_828[6] = local_828[6] + (double)local_1e88._0_8_;
      dVar22 = (((local_1d38 - local_1df8[0]) - local_1df8[5]) + local_1df8[10]) - local_1df8[0xc];
      local_1f38[1] = dVar24;
      local_8d0 = dVar60;
      local_828[1] = local_2088;
      dVar28 = exp(dVar45);
      dVar29 = (local_1d28 + local_1d28) - local_1878;
      dVar23 = exp(dVar29);
      dVar73 = local_6b8;
      dVar22 = dVar21 * -0.37 + dVar113 + dVar113 + dVar22;
      dVar45 = local_1e38 * local_1e38;
      dVar28 = dVar28 * 1000000.0;
      dVar21 = dVar28 / (dVar23 * dVar20);
      local_1c18 = local_1ce8;
      local_1be8 = dStack_1ce0 + dStack_1ce0;
      dVar113 = dVar28 * dVar45 - dVar70 * dVar21;
      dVar26 = dVar22 * dVar113;
      dVar23 = local_1f38[0] + dVar26;
      local_1e58 = (local_1e58 * dVar28 * dVar45 -
                   (local_1e58 - ((local_1ce8 - (dStack_1ce0 + dStack_1ce0)) + 1.0) * dVar42) *
                   dVar21 * dVar70) * dVar22;
      dVar28 = dVar28 * dVar22;
      if (iVar1 == 2) {
        dVar22 = -dVar22 * dVar21 - dVar113;
        local_20f8 = local_16a0[1] + dVar22;
        local_20b8 = local_1690 - (dVar22 + dVar22);
        dVar22 = (dVar28 + dVar28) * local_1e38;
        local_20e8 = local_15f0[1] + dVar22;
        local_2118 = local_2118 - (dVar22 + dVar22);
        local_1a88 = local_1328 - dVar113;
        dVar22 = dVar113 + dVar113;
        local_1320 = local_1320 + dVar22;
        local_fb8 = local_fb8 + dVar113;
        local_fb0 = local_fb0 - dVar22;
        local_e58 = local_e58 - dVar113;
        local_e50 = local_e50 + dVar22;
        local_a38 = local_a38 + dVar22;
        local_a30 = local_a30 - (dVar22 + dVar22);
        dVar113 = dVar113 * -0.37;
        local_8d8 = local_8d8 + dVar113;
        local_8d0 = dVar60 - (dVar113 + dVar113);
      }
      else {
        local_1ba8[0] = -dVar22 * dVar21;
        local_1ba8[1] = (dVar28 + dVar28) * local_1e38 + dVar113;
        local_1ba8[2] = dVar113;
        local_1ba8[3] = dVar113;
        local_1ba8[4] = dVar113;
        local_1ba8[8] = dVar113;
        local_1ba8[9] = dVar113;
        local_1ba8[6] = dVar113;
        local_1ba8[7] = dVar113;
        local_1ba8[10] = dVar113 + dVar113;
        local_1ba8[0xb] = dVar113;
        local_1ba8[0xf] = dVar113;
        local_1ba8[0x10] = dVar113;
        local_1ba8[0xd] = dVar113;
        local_1ba8[0xe] = dVar113;
        local_1ba8[0x11] = dVar113;
        local_1ba8[0x12] = dVar113 * 3.0;
        local_1ba8[0x13] = dVar113;
        local_1ba8[0x14] = dVar113 * 0.63;
        lVar12 = 1;
        pdVar13 = local_1ba8;
        do {
          dVar22 = *pdVar13;
          local_16a0[lVar12] = local_16a0[lVar12] + dVar22;
          local_16a0[lVar12 + 1] = local_16a0[lVar12 + 1] - (dVar22 + dVar22);
          pdVar13 = pdVar13 + 1;
          lVar12 = lVar12 + 0x16;
        } while (lVar12 != 0x1cf);
        local_2088 = local_828[1];
        local_20f8 = local_16a0[1];
        local_20b8 = local_1690;
        local_20e8 = local_15f0[1];
        local_2118 = (double)auStack_15e0._0_8_;
        local_1a88 = local_1328;
      }
      local_1e18 = local_1e18 + dVar25 * -0.0 + dVar74 + dVar118 + dVar42 * -745.375 + -1.866;
      dVar101 = local_828[0] + local_1e58;
      local_1c28 = exp((double)local_1e08._0_8_ * -0.6 + dVar44);
      dVar118 = exp(dVar29);
      local_1ab8._0_8_ = dVar118;
      local_1d08 = exp((double)local_1e08._0_8_ * -1.25 + dVar44);
      dVar28 = exp(dVar29);
      dVar92 = local_1320;
      local_1838 = dStack_1cc0;
      local_1d18 = local_1df8[0xc];
      local_1828 = (double)local_1e08._0_8_ + (double)local_1e08._0_8_;
      uStack_1820 = local_1e08._8_8_;
      dVar118 = dVar44 - local_1828;
      dVar109 = exp(dVar118);
      dVar113 = local_1df8[0];
      dVar109 = dVar109 * 550000000.0;
      dVar22 = exp(dVar29);
      dVar60 = dStack_1ce0;
      dVar25 = local_1df8[5];
      dVar21 = local_1df8[4];
      dVar29 = local_1df8[1];
      dVar47 = dVar109 / (dVar22 * dVar20);
      local_1aa8 = local_1c88;
      local_1a98 = local_1ce8 + local_1c88;
      dVar22 = local_1df8[1] * local_1df8[1] * dVar109 - dVar113 * dVar47;
      local_e58 = local_e58 + dVar22;
      local_e50 = local_e50 - (dVar22 + dVar22);
      dVar93 = local_1df8[5] * 2.65 + dVar113 * -0.27 + local_1d38 + local_1df8[10];
      local_6c8 = local_1df8[0x12];
      local_1e88._8_8_ = 0;
      local_1e88._0_8_ = local_1df8[0x14];
      local_1e28._0_8_ = exp(dVar118);
      uVar8 = local_1cf8._8_8_;
      local_6d8 = exp((local_1e48 + local_1d28) - (double)local_1cf8._8_8_);
      dVar61 = dStack_1cc0;
      dVar59 = local_1df8[0xd];
      uStack_6d0 = extraout_XMM0_Qb_00;
      dVar48 = local_1e58 + local_1e58;
      dVar118 = local_1c28 * 90000.0;
      dVar75 = dVar118 / ((double)local_1ab8._0_8_ * dVar20);
      dVar22 = dVar42 * -0.6 + local_1e68;
      dVar79 = dVar118 * dVar70 * dVar45 - dVar70 * dVar70 * dVar75;
      dVar74 = dVar22 * dVar118 * dVar70 * dVar45 -
               (dVar22 - (((local_1c18 + local_1c18) - (local_1be8 + local_1c18)) + 1.0) * dVar42) *
               dVar75 * dVar70 * dVar70;
      dVar62 = dVar118 * dVar45 + dVar75 * -2.0 * dVar70;
      dVar76 = (dVar118 * dVar70 + dVar118 * dVar70) * local_1e38;
      dVar22 = local_1be8 + local_1838;
      dVar75 = local_1838 + local_1c18;
      dVar78 = dVar42 * -1.25 + local_1e68;
      local_1e58 = dVar42 + dVar42;
      dStack_1e50 = 0.0;
      local_1c18 = local_1e68 - local_1e58;
      local_1838 = dVar45 * local_1d18;
      uStack_1830 = 0;
      uStack_1c10 = dStack_1e60;
      dVar80 = local_1c18 * dVar109 * local_1838 -
               (local_1c18 - ((local_1a98 - (dVar60 + dVar60 + local_1aa8)) + 1.0) * dVar42) *
               dVar47 * dVar113 * local_1d18;
      local_1a98 = dVar113 * local_1d18 * dVar47;
      dVar77 = -dVar47 * local_1d18;
      dVar118 = (dVar109 + dVar109) * dVar29 * local_1d18;
      dVar47 = (double)local_1e88._0_8_ * -0.62 + local_6c8 + local_6c8 + dVar93;
      local_1be8 = local_1c18 - ((dStack_1cc0 - (local_1cc8 + dVar60)) + 1.0) * dVar42;
      uStack_1be0 = dStack_1e60;
      auVar116._0_8_ = dVar28 * dVar20;
      auVar116._8_8_ = local_6d8 * dVar20;
      dVar93 = local_1d08 * 60000000.0;
      dVar113 = (double)local_1e28._0_8_ * 22000000000.0;
      auVar115._8_8_ = dVar113;
      auVar115._0_8_ = dVar93;
      auVar116 = divpd(auVar115,auVar116);
      dVar81 = auVar116._0_8_;
      dVar75 = dVar78 * dVar93 * dVar27 * dVar45 -
               (dVar78 - ((dVar75 - dVar22) + 1.0) * dVar42) * dVar81 * dVar70 * dVar27;
      dVar78 = auVar116._8_8_;
      dVar22 = dVar93 * dVar27 * dVar45 - dVar70 * dVar27 * dVar81;
      dVar28 = dVar113 * dVar21 * dVar29 - dVar25 * dVar78;
      dVar20 = dVar27 * -dVar81;
      dVar27 = (dVar93 + dVar93) * local_1e38 * dVar27;
      dVar70 = dVar45 * dVar93 + -dVar81 * dVar70;
      local_1328 = local_1a88 + dVar70;
      local_1320 = dVar92 - (dVar70 + dVar70);
      dVar70 = local_1838 * dVar109 - local_1a98;
      local_16a0[1] = local_20f8 + dVar62 + dVar20 + dVar77;
      local_1690 = ((local_20b8 - (dVar62 + dVar62)) - (dVar20 + dVar20)) - (dVar77 + dVar77);
      local_15f0[1] = local_20e8 + dVar76 + dVar27 + dVar118;
      dVar20 = ((local_2118 - (dVar76 + dVar76)) - (dVar27 + dVar27)) - (dVar118 + dVar118);
      auStack_15e0._0_8_ = dVar20;
      local_828[0] = dVar101 + dVar74 + dVar75 + dVar80;
      dVar118 = dVar47 * dVar28;
      dVar27 = ((((dVar24 - (dVar26 + dVar26)) - (dVar79 + dVar79)) - (dVar22 + dVar22)) -
               (dVar70 + dVar70)) - dVar118;
      local_1f38[0] = dVar23 + dVar79 + dVar22 + dVar70;
      local_1f38[1] = dVar27;
      local_1f38[4] = local_1f38[4] - dVar118;
      local_1f38[5] = dVar118 + local_1f38[5];
      local_828[1] = (((local_2088 - dVar48) - (dVar74 + dVar74)) - (dVar75 + dVar75)) -
                     (dVar80 + dVar80);
      dVar118 = (dVar21 * dVar29 * local_1c18 * dVar113 - local_1be8 * dVar78 * dVar25) * dVar47;
      dVar113 = dVar113 * dVar47;
      if (iVar1 == 2) {
        dVar22 = dVar28 * -0.27;
        local_1690 = local_1690 - dVar22;
        local_1678 = local_1678 - dVar22;
        local_1670 = dVar22 + local_1670;
        dVar21 = dVar21 * dVar113;
        auStack_15e0._0_8_ = dVar20 - dVar21;
        dStack_15c8 = dStack_15c8 - dVar21;
        local_15c0 = dVar21 + local_15c0;
        dVar113 = dVar113 * dVar29;
        local_13d0 = local_13d0 - dVar113;
        local_13c0._8_8_ = (double)local_13c0._8_8_ - dVar113;
        local_13b0 = dVar113 + local_13b0;
        dVar20 = dVar28 * 2.65 - dVar78 * dVar47;
        local_2128 = local_1320 - dVar20;
        local_1308 = local_1308 - dVar20;
        local_1300 = dVar20 + local_1300;
        local_fb0 = local_fb0 - dVar28;
        local_f98 = local_f98 - dVar28;
        local_f90 = local_f90 + dVar28;
        dVar20 = dVar28 + dVar28;
        local_a30 = local_a30 - dVar20;
        local_a18 = local_a18 - dVar20;
        local_a10 = dVar20 + local_a10;
        dVar28 = dVar28 * -0.62;
        local_8d0 = local_8d0 - dVar28;
        local_8b8 = local_8b8 - dVar28;
        local_8b0 = dVar28 + local_8b0;
      }
      else {
        local_1ba8[0] = dVar28 * 0.73;
        local_1ba8[1] = dVar21 * dVar113 + dVar28;
        local_1ba8[2] = dVar28;
        local_1ba8[3] = dVar28;
        local_1ba8[4] = dVar28 + dVar29 * dVar113;
        local_1ba8[5] = -(dVar78 * dVar47) + dVar28 * 3.65;
        local_1ba8[8] = dVar28;
        local_1ba8[9] = dVar28;
        local_1ba8[6] = dVar28;
        local_1ba8[7] = dVar28;
        local_1ba8[10] = dVar28 + dVar28;
        local_1ba8[0xd] = dVar28;
        local_1ba8[0xe] = dVar28;
        local_1ba8[0xb] = dVar28;
        local_1ba8[0xc] = dVar28;
        local_1ba8[0xf] = dVar28;
        local_1ba8[0x10] = dVar28;
        local_1ba8[0x11] = dVar28;
        local_1ba8[0x12] = dVar28 * 3.0;
        local_1ba8[0x13] = dVar28;
        local_1ba8[0x14] = dVar28 * 0.38;
        pdVar13 = &local_1670;
        lVar12 = 0;
        do {
          dVar20 = local_1ba8[lVar12];
          pdVar13[-4] = pdVar13[-4] - dVar20;
          pdVar13[-1] = pdVar13[-1] - dVar20;
          *pdVar13 = dVar20 + *pdVar13;
          lVar12 = lVar12 + 1;
          pdVar13 = pdVar13 + 0x16;
        } while (lVar12 != 0x15);
        local_2128 = local_1320;
      }
      uVar9 = auStack_15e0._0_8_;
      dVar92 = local_828[1] - dVar118;
      local_828[4] = local_828[4] - dVar118;
      local_828[5] = dVar118 + local_828[5];
      dVar26 = dVar73 * -0.0 + local_1e18;
      local_1e88._8_8_ = 0;
      local_1e88._0_8_ = dVar25 * local_1df8[0xd];
      dVar20 = dVar42 * -8554.68331868024 - (double)local_1e08._0_8_;
      dVar22 = exp(dVar20);
      dVar70 = local_1df8[0xb];
      dVar22 = dVar22 * 2244000000000.0;
      dVar21 = local_1bc8 * 8554.68331868024 - dVar42;
      local_1e18 = dVar29 * dVar25 * local_1df8[0xb];
      dStack_1e10 = 0.0;
      dVar45 = -local_1d28;
      dStack_1e30 = (double)((ulong)dStack_1d20 ^ 0x8000000000000000);
      local_1e38 = (dVar45 - local_1868) + local_1858;
      dVar113 = exp(local_1e38);
      dVar28 = dStack_1c80;
      dVar73 = dStack_1c90;
      dVar118 = local_1df8[0];
      dVar113 = dVar22 / (dVar113 * local_19b8);
      dVar74 = dVar22 * (double)local_1e88._0_8_ - local_1e18 * dVar113;
      dVar23 = dVar21 * dVar22 * (double)local_1e88._0_8_ -
               (dVar21 - (((dVar60 + dVar61 + dStack_1c90) - (dVar61 + dStack_1c80)) + -1.0) *
                         dVar42) * dVar113 * local_1e18;
      dVar101 = dVar25 * -dVar113 * dVar70;
      local_1d08 = local_1590 + dVar101;
      local_1d18 = local_1580 - dVar101;
      dVar29 = -dVar113 * dVar29;
      dVar75 = dVar22 * dVar59 + dVar70 * dVar29;
      local_12d0 = local_12d0 + dVar75;
      dVar109 = local_12c0 - dVar75;
      dVar29 = dVar29 * dVar25;
      local_1c18 = local_f00 + dVar29;
      dVar47 = dStack_eb0 + dVar29;
      dVar29 = local_ea0 - dVar29;
      dVar22 = dVar22 * dVar25;
      dVar60 = local_da0 + dVar22;
      local_1a88 = local_d50 + dVar22;
      local_1be8 = local_d40 - dVar22;
      dVar92 = dVar92 + dVar23;
      dVar61 = (double)local_7d8._8_8_ + dVar23;
      local_7d8._8_8_ = dVar61;
      dVar23 = dStack_7c0 - dVar23;
      dVar22 = local_1d38 + local_1df8[0];
      local_1d38 = dStack_1ee0 + dVar74;
      dVar93 = dVar70 * 0.5 + (dVar22 - dVar25) + local_1df8[10] + local_1df8[0xc];
      local_1e18 = dStack_1ed0;
      local_1e88._0_8_ = local_1df8[0x12];
      local_1590 = local_1d08;
      local_1580 = local_1d18;
      local_1320 = local_2128 + dVar75;
      local_12c0 = dVar109;
      local_f00 = local_1c18;
      dStack_eb0 = dVar47;
      local_ea0 = dVar29;
      local_da0 = dVar60;
      local_d50 = local_1a88;
      local_d40 = local_1be8;
      local_828[1] = dVar92;
      dStack_7c0 = dVar23;
      auStack_15e0._0_8_ = (double)uVar9 + dVar101;
      local_1e28._0_8_ = local_12d0;
      dVar20 = exp(dVar20);
      dVar22 = local_1df8[1];
      dVar24 = exp(local_1e38);
      dVar113 = dStack_1ce0;
      dVar93 = (double)local_1e88._0_8_ + (double)local_1e88._0_8_ + dVar93;
      dVar20 = dVar20 * 187000000000.0;
      dVar25 = dVar20 / (dVar24 * local_19b8);
      dVar24 = dVar20 * dVar59 - dVar70 * dVar22 * dVar25;
      dVar48 = dVar93 * dVar24;
      dVar27 = dVar27 + dVar74 + dVar48;
      local_1f38[1] = dVar27;
      dStack_1ee0 = local_1d38 + dVar48;
      dStack_1ed0 = (local_1e18 - dVar74) - dVar48;
      dVar70 = (dVar21 * dVar20 * dVar59 -
               (dVar21 - (((dVar73 + dStack_1ce0) - dVar28) + -1.0) * dVar42) * dVar25 *
               dVar70 * dVar22) * dVar93;
      dVar20 = dVar20 * dVar93;
      dVar25 = dVar25 * dVar93;
      if (iVar1 == 2) {
        local_1690 = local_1690 + dVar24;
        local_1640 = local_1640 + dVar24;
        local_1630 = local_1630 - dVar24;
        local_1580 = -dVar25 * local_1df8[0xb];
        auStack_15e0._0_8_ = (double)uVar9 + dVar101 + local_1580;
        local_1590 = local_1d08 + local_1580;
        local_1580 = local_1d18 - local_1580;
        local_1320 = (local_2128 + dVar75) - dVar24;
        local_12d0 = (double)local_1e28._0_8_ - dVar24;
        local_12c0 = dVar109 + dVar24;
        local_fb0 = local_fb0 + dVar24;
        dStack_f60 = dStack_f60 + dVar24;
        local_f50 = local_f50 - dVar24;
        local_ea0 = dVar24 * 0.5 - dVar25 * dVar22;
        local_f00 = local_1c18 + local_ea0;
        dStack_eb0 = dVar47 + local_ea0;
        local_ea0 = dVar29 - local_ea0;
        local_e50 = local_e50 + dVar24;
        local_e00 = local_e00 + dVar24;
        local_df0 = local_df0 - dVar24;
        local_da0 = dVar60 + dVar20;
        local_d50 = local_1a88 + dVar20;
        local_d40 = local_1be8 - dVar20;
        dVar24 = dVar24 + dVar24;
        local_a30 = local_a30 + dVar24;
        local_9e0 = local_9e0 + dVar24;
        local_9d0 = local_9d0 - dVar24;
        dStack_7c0 = dVar23;
        local_828[1] = dVar92;
      }
      else {
        local_1ba8[0] = dVar24 + dVar24;
        local_1ba8[1] = dVar24 - dVar25 * local_1df8[0xb];
        local_1ba8[2] = dVar24;
        local_1ba8[3] = dVar24;
        local_1ba8[4] = dVar24;
        local_1ba8[8] = dVar24;
        local_1ba8[9] = dVar24;
        local_1ba8[6] = dVar24;
        local_1ba8[7] = dVar24;
        local_1ba8[10] = local_1ba8[0];
        local_1ba8[0xb] = dVar24 * 1.5 - dVar22 * dVar25;
        local_1ba8[0xc] = local_1ba8[0];
        local_1ba8[0xd] = dVar20 + dVar24;
        local_1ba8[0x10] = dVar24;
        local_1ba8[0x11] = dVar24;
        local_1ba8[0xe] = dVar24;
        local_1ba8[0xf] = dVar24;
        local_1ba8[0x12] = dVar24 * 3.0;
        local_1ba8[0x13] = dVar24;
        local_1ba8[0x14] = dVar24;
        pdVar13 = &local_1630;
        lVar12 = 0;
        do {
          dVar20 = local_1ba8[lVar12];
          pdVar13[-0xc] = pdVar13[-0xc] + dVar20;
          pdVar13[-2] = pdVar13[-2] + dVar20;
          *pdVar13 = *pdVar13 - dVar20;
          lVar12 = lVar12 + 1;
          pdVar13 = pdVar13 + 0x16;
        } while (lVar12 != 0x15);
      }
      uVar9 = auStack_15e0._0_8_;
      dVar28 = local_1690;
      local_828[1] = local_828[1] + dVar70;
      local_7d8._8_8_ = (double)local_7d8._8_8_ + dVar70;
      dStack_7c0 = dStack_7c0 - dVar70;
      local_1d38 = local_1df8[2];
      uStack_1d30 = 0;
      dVar29 = dVar118 * local_1df8[2];
      dVar21 = exp((double)local_1e08._0_8_ * 2.67 + dVar42 * -3165.232827911689);
      dVar20 = local_1df8[4];
      dVar21 = dVar21 * 0.05;
      dVar23 = dVar42 * 2.67 + local_1bc8 * 3165.232827911689;
      dVar24 = dVar22 * local_1df8[4];
      local_1e38 = local_1878 - local_1d28;
      dVar70 = exp((local_1e78 + local_1e38) - local_1e48);
      dVar73 = local_1df8[6];
      dVar70 = dVar21 / dVar70;
      dVar25 = dVar21 * dVar29 - dVar24 * dVar70;
      local_1f38[0] = local_1f38[0] - dVar25;
      local_1f38[1] = dVar27 + dVar25;
      dVar27 = dVar21 * local_1d38;
      local_16a0[1] = local_16a0[1] - dVar27;
      local_1690 = dVar28 + dVar27;
      dStack_1688 = dStack_1688 - dVar27;
      local_1678 = dVar27 + local_1678;
      dVar20 = dVar20 * -dVar70;
      local_15f0[1] = local_15f0[1] - dVar20;
      auStack_15e0._0_8_ = (double)uVar9 + dVar20;
      auStack_15e0._8_8_ = (double)auStack_15e0._8_8_ - dVar20;
      local_18a8 = local_1f38[2] - dVar25;
      dVar25 = dVar25 + local_1f38[4];
      dStack_15c8 = dVar20 + dStack_15c8;
      dVar23 = dVar23 * dVar21 * dVar29 -
               (dVar23 - ((dVar113 + local_1cc8) - (local_1ce8 + local_1cd8)) * dVar42) * dVar70 *
               dVar24;
      dVar21 = dVar21 * dVar118;
      local_1538 = local_1538 - dVar21;
      local_1530 = local_1530 + dVar21;
      dVar47 = dStack_1528 - dVar21;
      dVar21 = dVar21 + dStack_1518;
      dVar22 = -dVar70 * dVar22;
      local_13d8 = local_13d8 - dVar22;
      local_13d0 = local_13d0 + dVar22;
      local_1718 = dStack_13c8 - dVar22;
      dVar22 = dVar22 + (double)local_13c0._8_8_;
      local_828[0] = local_828[0] - dVar23;
      local_828[1] = local_828[1] + dVar23;
      local_16d8 = local_828[2] - dVar23;
      dVar23 = dVar23 + local_828[4];
      dVar44 = dVar44 + local_1c08;
      dVar24 = exp(dVar44);
      dVar27 = local_1df8[3];
      local_6d8 = local_1df8[4];
      uStack_6d0 = 0;
      dVar113 = exp(((local_1e78 - (double)local_1c38._0_8_) - local_1e48) +
                    (double)local_1cf8._0_8_);
      dVar29 = local_1520;
      dVar118 = local_1cc8;
      dVar20 = dStack_1cd0;
      dVar70 = local_1df8[2];
      local_1758 = local_1cd8;
      dStack_1750 = dStack_1cd0;
      local_18c8._0_8_ = local_1f38[3];
      local_1a68._0_8_ = local_1508;
      local_1748 = dStack_1478;
      local_748 = dStack_1458;
      local_1728 = (double)local_13c0._0_8_;
      local_738 = local_13a8;
      local_19a8 = local_1268;
      local_1908 = dStack_1248;
      local_1a88 = local_1df8[7];
      dStack_1a80 = 0.0;
      dStack_1720 = dVar22;
      local_18c8._8_8_ = dVar25;
      dVar25 = exp(dVar44);
      dVar28 = local_1df8[0xd];
      local_1be8 = local_1df8[1];
      uStack_1be0 = 0;
      dVar48 = local_1e78 - local_1d28;
      auVar30._0_8_ = exp((dVar41 + dVar48) - local_1858);
      local_17b8 = dStack_1c80 + dStack_1ce0;
      dStack_17b0 = dVar118 + dVar20;
      dVar25 = dVar25 * 80000000.0;
      dVar24 = dVar24 * 20000000.0;
      auVar30._8_8_ = dVar113;
      auVar98._8_8_ = dVar24;
      auVar98._0_8_ = dVar25;
      local_18f8 = divpd(auVar98,auVar30);
      local_18d8 = dVar28 * local_1be8;
      dStack_18d0 = local_6d8 * dVar27;
      local_18e8 = dVar70 * local_1a88;
      dStack_18e0 = dVar73 * local_1d38;
      local_388 = -local_18f8._0_8_;
      dStack_380 = -local_18f8._8_8_;
      local_5f8 = dVar25 * local_18e8 - local_18d8 * local_18f8._0_8_;
      dStack_5f0 = dVar24 * dStack_18e0 - dStack_18d0 * local_18f8._8_8_;
      local_1808 = local_1f38[1] + local_5f8;
      local_17e8 = dStack_1ed0 + local_5f8;
      dVar28 = dVar28 * local_388;
      local_6c8 = (double)auStack_15e0._0_8_ + dVar28;
      dVar59 = local_1580 + dVar28;
      local_1a88 = local_1a88 * dVar25;
      local_688 = local_1530 + local_1a88;
      local_1aa8 = local_14d0 + local_1a88;
      local_588 = dVar25 * dVar70;
      local_698 = local_11c0 + local_588;
      local_1818 = local_1160 + local_588;
      local_1be8 = local_1be8 * local_388;
      local_1a98 = local_da0 + local_1be8;
      local_1838 = local_d40 + local_1be8;
      local_1c18 = (double)auStack_15e0._8_8_;
      local_608 = local_15b0;
      local_5e8 = local_1500;
      local_16a0[0] = local_11b8;
      local_5d8 = dStack_1190;
      local_5a8 = local_d98;
      local_5b8 = local_d70;
      local_17f8 = local_828[1];
      local_1778 = dStack_7c0;
      local_17c8 = local_1df8[8];
      uStack_17c0 = 0;
      dStack_580 = dVar24;
      dVar60 = exp(dVar44);
      local_1ab8._8_8_ = 0;
      local_1ab8._0_8_ = local_1df8[1];
      local_1c28 = local_1df8[0xd];
      dStack_1c20 = 0.0;
      local_3d8 = exp((local_1bd8 + dVar48) - local_1858);
      local_3b8 = local_1cd8;
      dStack_3b0 = dStack_1cd0;
      local_3c8 = local_1ca8;
      dStack_3c0 = dStack_1ca0;
      local_398 = dStack_1ce0;
      dStack_390 = local_1cd8;
      local_638 = dStack_1c80;
      dStack_630 = local_1c78;
      local_1768 = local_15a8;
      local_17d8 = local_14f8;
      local_17a8 = local_1110;
      local_1798 = local_1108;
      local_1ac0 = local_10d8;
      local_1788 = local_10b0;
      local_1918 = local_d68;
      local_598 = local_1df8[2];
      dStack_590 = 0.0;
      local_5c8 = local_1df8[9];
      uStack_5c0 = 0;
      local_3e8 = exp(dVar44);
      local_628 = local_1df8[1];
      uStack_620 = 0;
      local_618 = local_1df8[0xe];
      uStack_610 = 0;
      dVar61 = exp((local_1848 + dVar48) - local_1928);
      uVar9 = uStack_1bc0;
      dVar113 = local_1df8[2];
      dVar92 = dVar42 * 1.5 + local_1bc8 * 4327.663325920592;
      local_18b8 = (double)local_1e08._0_8_ * 1.83 + dVar42 * -110.7076664770384;
      uStack_18b0 = local_1e08._8_8_;
      local_1a78 = dVar42 * 1.83 + local_1bc8 * 110.7076664770384;
      uStack_1a70 = 0;
      local_1998 = (double)local_1e08._0_8_ * 1.92 + dVar42 * -2863.302828428857;
      uStack_1990 = local_1e08._8_8_;
      local_1988 = dVar42 * 1.92 + local_1bc8 * 2863.302828428857;
      uStack_1980 = 0;
      dVar101 = local_1d28 - local_1878;
      local_1a38._0_8_ = (double)local_1e08._0_8_ * 1.62 + dVar42 * -5454.868657323165;
      local_1a38._8_8_ = local_1e08._8_8_;
      local_1a28 = dVar42 * 1.62 + local_1bc8 * 5454.868657323165;
      uStack_1a20 = 0;
      local_1898 = (double)local_1e08._0_8_ * 1.05 + dVar42 * -1648.034580510458;
      uStack_1890 = local_1e08._8_8_;
      local_1e28._8_8_ = 0;
      local_1e28._0_8_ = dVar42 * 1.05 + local_1bc8 * 1648.034580510458;
      local_1708 = (double)local_1e08._0_8_ * 1.9 + dVar42 * -3789.2214935095417;
      uStack_1700 = local_1e08._8_8_;
      local_16f8._8_8_ = 0;
      local_16f8._0_8_ = dVar42 * 1.9 + local_1bc8 * 3789.2214935095417;
      local_16e8._0_8_ = (double)local_1e08._0_8_ * 1.51 + dVar42 * -1726.0331637101897;
      local_16e8._8_8_ = local_1e08._8_8_;
      local_1958 = (double)local_1e08._0_8_ * 2.4 + dVar42 * 1061.7871648479593;
      uStack_1950 = local_1e08._8_8_;
      local_1a18 = dVar42 * -2727.4343286615826 + (double)local_1e08._0_8_ * 1.6;
      uStack_1a10 = 0;
      local_19d8 = dVar42 * -1570.0359973107265 + (double)local_1e08._0_8_ * 1.6;
      dStack_19d0 = 0.0;
      local_1a08 = local_1bc8 * 2727.4343286615826 + dVar42 * 1.6;
      dStack_1a00 = (double)uStack_1bc0;
      local_1d18 = local_1bc8 * 1570.0359973107265 + dVar42 * 1.6;
      uStack_1d10 = uStack_1bc0;
      local_1bf8 = (double)local_1e08._0_8_ * 1.228 + dVar42 * -35.225166606330404;
      uStack_1bf0 = local_1e08._8_8_;
      local_1d08 = dVar42 * 1.228 + local_1bc8 * 35.225166606330404;
      uStack_1d00 = 0;
      local_1af8 = (double)local_1e08._0_8_ * 1.18 + dVar42 * 224.93784961470985;
      dStack_1af0 = (double)local_1e08._8_8_;
      local_1ad8 = dVar42 * 1.18 + local_1bc8 * -224.93784961470985;
      dStack_1ad0 = 0.0;
      local_1ae8 = (double)local_1e08._0_8_ * 2.12 + dVar42 * -437.79849925010643;
      dStack_1ae0 = (double)local_1e08._8_8_;
      local_19c8 = dVar42 * 2.12 + local_1bc8 * 437.79849925010643;
      dStack_19c0 = 0.0;
      local_708 = dVar42 * -3638.256493768126 + local_1828;
      uStack_700 = 0;
      local_678 = dVar42 * -4161.601826205035 + local_1828;
      uStack_670 = 0;
      dVar75 = local_1bc8 * 3638.256493768126 + local_1e58;
      local_1828 = local_1bc8 * 4161.601826205035 + local_1e58;
      uStack_1820 = uStack_1bc0;
      dVar109 = local_1bd8 - dVar41;
      local_6e8 = (dVar109 + dVar43 + dVar19) - (dVar43 + dVar19);
      dStack_6e0 = dStack_1bd0;
      local_668 = (dVar109 + dVar26) - dVar26;
      dStack_660 = dStack_1bd0;
      dVar26 = local_1e78 - local_1e48;
      dVar80 = local_1c38._0_8_;
      local_1738 = (local_1868 + (dVar80 - local_1e78)) - local_1d48;
      uVar114 = local_1cf8._12_4_;
      dVar43 = local_1cf8._0_8_;
      dVar77 = dVar80 - dVar43;
      local_1a58 = ((local_1d28 - local_1e78) + dVar80) - local_1e48;
      uStack_1a50 = (ulong)dStack_1d20;
      local_1a48 = (dVar101 - dVar80) + dVar43;
      uStack_1a40 = (ulong)dStack_1d20;
      local_1968 = (local_1d28 - (local_1e48 + local_1e48)) + dVar43;
      dStack_1960 = dStack_1d20;
      dVar20 = local_1e48 - local_1d28;
      local_728 = (local_1e48 + local_1e38) - (double)uVar8;
      local_1930 = ((local_1e48 + local_1e48) - local_1e78) - (double)uVar8;
      local_718 = ((local_1e48 - dVar80) - (double)uVar8) + dVar43;
      dVar106 = dVar43 - local_1e48;
      dVar81 = local_1e48 - (double)uVar8;
      dVar118 = (dVar20 + local_1868) - local_1d48;
      local_1e58 = local_1848 + dVar106;
      local_1948 = (dVar106 + local_1868) - local_1d48;
      dVar22 = (dVar80 - (double)uVar8) + local_1bd8;
      auVar4._8_4_ = local_1c38._8_4_;
      auVar4._0_8_ = dVar22;
      auVar4._12_4_ = local_1c38._12_4_;
      dVar105 = (((double)uVar8 - (double)uVar8) - dVar41) + local_1bd8;
      dVar19 = (dVar109 + local_1d48) - local_1d48;
      dVar74 = (local_1bd8 - local_1868) + local_1d48;
      local_248 = (double)local_1e08._0_8_ * 0.1 + dVar42 * -5334.096657530033;
      uStack_240 = local_1e08._8_8_;
      local_1878 = dVar42 * 0.1 + local_1bc8 * 5334.096657530033;
      uStack_1870 = 0;
      local_3a8 = (dVar26 - local_1848) + local_658;
      dVar93 = local_1e78 - local_1848;
      local_1978 = (dVar101 - local_1848) + local_658;
      dStack_1970 = dStack_1d20;
      dVar95 = (local_1d28 - local_1e48) - local_1848;
      local_1888 = (dVar81 - dVar41) + local_1848;
      local_16c8 = (dVar81 - local_1bd8) + local_1848;
      local_19f8 = (dVar81 - local_1848) + local_658;
      local_1cf8._8_4_ = local_1cf8._8_4_;
      local_1cf8._0_8_ = ((dVar43 - dVar80) + local_1848) - local_658;
      local_1cf8._12_4_ = uVar114;
      local_16b8 = (dVar41 + local_1e38) - local_1848;
      dVar78 = (dVar41 - local_1d28) + local_1848;
      local_6f8 = local_1848 * -2.0 + dVar41 + local_658;
      local_1e38 = (local_1e38 + local_1bd8) - local_1848;
      dVar79 = (local_1bd8 - local_1d28) + local_1848;
      local_578 = local_1848 * -2.0 + local_1bd8 + local_658;
      local_1d38 = (dVar80 - local_1e78) + local_1848;
      dVar82 = (dVar80 - local_1e48) + local_1848;
      local_1848 = local_1848 - local_658;
      dVar73 = dVar73 * dVar24;
      local_350 = dStack_15a0;
      local_348 = local_1058;
      local_340 = local_1020;
      local_1508 = (double)local_1a68._0_8_ - dVar73;
      local_1520 = dVar73 + dVar29;
      dStack_1518 = dVar73 + dVar21;
      auVar83._8_8_ = dVar61;
      auVar83._0_8_ = local_3d8;
      auVar31._0_8_ = dVar60 * 15000000.0;
      auVar31._8_8_ = local_3e8 * 84300000.0;
      auVar116 = divpd(auVar31,auVar83);
      local_638 = local_398 + local_638;
      local_398 = local_1bc8 * 1781.3869969487089 + dVar71;
      dStack_390 = (double)uStack_1bc0;
      local_1a68._0_8_ = local_1bc8 * 319.54258278599724 + dVar71;
      local_1a68._8_8_ = uStack_1bc0;
      dVar62 = local_1bc8 * -251.60833290236002 + dVar71;
      local_1e78 = local_1bc8 * 301.929999482832 + dVar71;
      dStack_1e70 = (double)uStack_1bc0;
      dVar94 = local_1bc8 * -286.8334995086904 + dVar71;
      local_658 = local_1bc8 * 14492.639975175936 + dVar71;
      dStack_650 = (double)uStack_1bc0;
      dVar76 = local_1e68 + dVar71;
      dStack_1e60 = local_1bc8 * 4498.756992294197 + dVar71;
      dVar29 = auVar116._0_8_;
      dVar43 = auVar116._8_8_;
      local_638 = (dVar76 - (local_638 - (local_3b8 + local_3c8)) * dVar42) * dVar29 *
                  (double)local_1ab8._0_8_ * local_1c28;
      dStack_630 = (dVar76 - ((local_1c78 + dStack_1ce0) - (dStack_1ca0 + local_1cd8)) * dVar42) *
                   dVar43 * local_618 * local_628;
      local_3f8 = (double)local_1ab8._0_8_ * local_1c28 * dVar29;
      dStack_3f0 = local_618 * local_628 * dVar43;
      local_3d8 = local_618 * -dVar43;
      uStack_3d0 = uStack_610;
      dVar21 = -dVar43 * local_628;
      dVar43 = dVar24 * dVar70;
      local_1268 = local_19a8 - dVar43;
      local_3e8 = local_1578;
      local_3c8 = local_1060;
      local_3b8 = dStack_ff8;
      local_628 = local_cf0;
      dStack_1248 = local_1908 - dVar43;
      local_1260 = dVar43 + local_1260;
      dStack_1258 = dVar43 + dStack_1258;
      local_1f38[3] = dStack_5f0 + (double)local_18c8._0_8_;
      local_1f38[4] = dStack_5f0 + (double)local_18c8._8_8_;
      local_6d8 = local_6d8 * (double)CONCAT44(local_388._4_4_,dStack_380._0_4_);
      dVar43 = local_1748 - local_6d8;
      dStack_1458 = local_748 - local_6d8;
      local_1470 = local_6d8 + local_1470;
      dStack_1468 = local_6d8 + dStack_1468;
      dVar27 = dVar27 * (double)CONCAT44(local_388._4_4_,dStack_380._0_4_);
      dStack_13c8 = local_1718 - dVar27;
      local_13a8 = local_738 - dVar27;
      local_13c0._0_8_ = dVar27 + local_1728;
      local_13c0._8_8_ = dVar27 + dStack_1720;
      local_1f38[6] = local_1f38[6] - dStack_5f0;
      auStack_1f00 = (undefined1  [8])((double)auStack_1f00 - local_5f8);
      local_15b0 = local_608 - dVar28;
      local_1500 = local_5e8 - local_1a88;
      local_11c0 = local_698;
      local_11b8 = local_16a0[0] - local_588;
      dStack_1190 = local_5d8 - local_588;
      local_1160 = local_1818;
      local_d70 = local_5b8 - local_1be8;
      dVar25 = dVar25 * dVar76 * local_18e8 -
               (dVar76 - (local_17b8 - (dStack_1cb0 + local_1758)) * dVar42) *
               (double)local_18f8._0_8_ * local_18d8;
      dVar24 = dVar24 * dVar76 * dStack_18e0 -
               (dVar76 - (dStack_17b0 - (local_1cb8 + local_1758)) * dVar42) *
               (double)local_18f8._8_8_ * dStack_18d0;
      local_828[4] = dVar24 + dVar23;
      local_828[3] = local_828[3] + dVar24;
      dVar23 = auVar31._8_8_ * local_5c8;
      dStack_1ed0 = auVar31._0_8_ * dVar70 * local_17c8 - local_3f8;
      dVar60 = auVar31._8_8_ * local_5c8 * local_598 - dStack_3f0;
      local_828[6] = local_828[6] - dVar24;
      local_828[7] = local_828[7] - dVar25;
      dVar27 = local_17c8 * auVar31._0_8_;
      dStack_1528 = ((dVar47 - dVar73) - local_1a88) - dVar27;
      local_14f8 = local_17d8 - dVar27;
      local_14d0 = dVar27 + local_1aa8;
      local_10b0 = local_598 * auVar31._0_8_;
      local_1110 = local_17a8 + local_10b0;
      local_1108 = local_1798 - local_10b0;
      local_10d8 = local_1ac0 - local_10b0;
      local_10b0 = local_10b0 + local_1788;
      local_1c28 = local_1c28 * -dVar29;
      local_15a8 = local_1768 - local_1c28;
      local_1580 = local_1c28 + dVar59;
      local_1ab8._0_8_ = -dVar29 * (double)local_1ab8._0_8_;
      local_da0 = local_1a98 + (double)local_1ab8._0_8_;
      local_d98 = (local_5a8 - local_1be8) - (double)local_1ab8._0_8_;
      local_d68 = local_1918 - (double)local_1ab8._0_8_;
      local_d40 = (double)local_1ab8._0_8_ + local_1838;
      local_1f38[1] = local_1808 + dStack_1ed0 + dVar60;
      local_1f38[2] = (((local_18a8 - dStack_5f0) - local_5f8) - dStack_1ed0) - dVar60;
      local_1ef8 = local_1ef8 - dStack_1ed0;
      dStack_1ef0 = dStack_1ef0 - dVar60;
      dStack_1ed0 = local_17e8 + dStack_1ed0;
      local_1ec8 = local_1ec8 + dVar60;
      auStack_15e0._0_8_ = local_6c8 + local_1c28 + local_3d8;
      auStack_15e0._8_8_ = ((local_1c18 - dVar28) - local_1c28) - local_3d8;
      local_1578 = local_1578 + local_3d8;
      dStack_15a0 = dStack_15a0 - local_3d8;
      local_1530 = local_688 + dVar27 + dVar23;
      local_14c8 = local_14c8 + dVar23;
      local_19a8 = dStack_1528 - dVar23;
      dVar23 = local_14f0 - dVar23;
      dVar27 = auVar31._8_8_ * local_1df8[2];
      local_1060 = local_1060 + dVar27;
      local_1058 = local_1058 - dVar27;
      dStack_ff8 = dStack_ff8 + dVar27;
      local_1020 = local_1020 - dVar27;
      dStack_7c0 = auVar31._0_8_ * dVar76 * dVar70 * local_17c8 - local_638;
      dVar27 = auVar31._8_8_ * dVar76 * local_5c8 * local_598 - dStack_630;
      local_cf0 = local_cf0 + dVar21;
      local_ce8 = local_ce8 - dVar21;
      local_c88 = local_c88 + dVar21;
      local_cb0 = local_cb0 - dVar21;
      local_828[1] = local_17f8 + dVar25 + dStack_7c0 + dVar27;
      local_828[2] = (((local_16d8 - dVar24) - dVar25) - dStack_7c0) - dVar27;
      local_828[8] = local_828[8] - dStack_7c0;
      local_828[9] = local_828[9] - dVar27;
      dStack_7c0 = dVar25 + local_1778 + dStack_7c0;
      dStack_7b8 = dStack_7b8 + dVar27;
      local_16a0[0] = (dVar26 - local_1868) + local_1858;
      dVar28 = (dVar48 - local_1d48) + local_1858;
      local_1768 = dVar42 * -1781.3869969487089 + local_1c08;
      dStack_1760 = 0.0;
      local_1918 = (dVar26 - local_1858) + local_1928;
      local_1908 = (dVar93 - local_1858) + local_6a8;
      dVar47 = (dVar93 - local_1928) + local_758;
      dVar61 = (dVar26 - local_758) + local_778;
      local_18f8._8_8_ = 0;
      local_18f8._0_8_ = dVar42 * -24053.756625465616 + local_1c08;
      dVar59 = local_1bc8 * 24053.756625465616;
      dVar60 = local_1bc8 * 20128.6666321888;
      local_18e8 = dVar42 * -20128.6666321888 + local_1c08;
      dStack_18e0 = 0.0;
      local_18d8 = (dVar77 - local_1858) + local_1928;
      local_1758 = dVar42 * -7252.86180424343 + local_1c08;
      dStack_1750 = 0.0;
      local_18c8._0_8_ = local_1bc8 * 537.435399079441;
      local_18c8._8_8_ = local_1bc8 * 7252.86180424343;
      local_1748 = dVar42 * -537.435399079441 + local_1c08;
      uStack_1740 = 0;
      local_748 = dVar42 * -319.54258278599724 + local_1c08;
      uStack_740 = 0;
      local_738 = (dVar101 - local_1868) + local_1858;
      uStack_730 = (ulong)dStack_1d20;
      local_1728 = (dVar101 - local_1858) + local_1928;
      dStack_1720 = dStack_1d20;
      dVar95 = dVar95 + local_308;
      dVar96 = (dVar101 - local_758) + local_778;
      local_1a88 = local_1bc8;
      dStack_1a80 = local_1bc8;
      local_1718 = local_1bc8 * 1726.0331637101897;
      dStack_1710 = local_1bc8 * -1061.7871648479593;
      local_18a8 = dVar42 * 251.60833290236002 + local_1c08;
      uStack_18a0 = 0;
      dVar97 = (dVar41 + dVar20) - local_1928;
      dVar102 = (local_1bd8 + dVar20) - local_1928;
      local_16d8 = (dVar81 - local_1868) + local_1858;
      local_1c28 = (dVar81 - local_1858) + local_1928;
      dVar81 = (dVar81 - local_758) + local_778;
      local_1e18 = (dVar41 + dVar106) - local_1928;
      local_1e58 = local_1e58 - local_308;
      local_1ab8._8_8_ = 0;
      local_1ab8._0_8_ = dVar42 * -11875.913312991392 + local_1c08;
      local_1a98 = local_1bc8 * 11875.913312991392;
      dStack_1a90 = local_1bc8 * 754.82499870708;
      local_1aa8 = dVar42 * -754.82499870708 + local_1c08;
      dStack_1aa0 = 0.0;
      local_1d48 = (dVar41 + (dVar80 - local_1e48)) - local_1858;
      dVar78 = dVar78 - local_6a8;
      local_1c18 = dVar42 * -301.929999482832 + local_1c08;
      uStack_1c10 = 0;
      local_1e88._0_8_ = (((dVar80 - local_1d28) - local_1e48) + local_1bd8) - local_1868;
      local_1c38._8_8_ = auVar4._8_8_;
      local_1c38._0_8_ = dVar22 - local_1868;
      local_1be8 = dVar42 * 286.8334995086904 + local_1c08;
      uStack_1be0 = 0;
      dVar79 = dVar79 - local_6a8;
      local_1e48 = (local_1868 + dVar109) - local_1868;
      local_1bd8 = dVar74 - local_1928;
      local_1838 = dVar42 * -14492.639975175936 + local_1c08;
      uStack_1830 = 0;
      local_1d38 = local_1d38 - local_308;
      local_6d8 = dVar42 * -4498.756992294197 + local_1c08;
      uStack_6d0 = 0;
      local_1d28 = dVar82 - local_1928;
      dVar74 = (dVar72 + dVar45) - local_758;
      local_6c8 = (local_1848 - local_1868) + local_1858;
      local_618 = local_1df8[10];
      uStack_610 = 0;
      local_1e68 = dVar76;
      dStack_1478 = dVar43;
      local_19e8._0_8_ = dVar118;
      local_638 = exp(dVar46 + dVar42 * -4327.663325920592);
      dVar22 = local_1df8[9];
      dVar43 = local_1df8[4];
      local_628 = exp(local_3a8);
      dVar70 = local_1df8[0xd];
      dVar20 = local_1df8[2];
      local_388 = local_1c98;
      dStack_380 = dStack_1c90;
      local_608 = local_1cd8;
      dStack_600 = dStack_1cd0;
      local_5e8 = local_1cc8;
      dStack_5e0 = dStack_1cc0;
      local_5f8 = dStack_1ca0;
      dStack_5f0 = local_1c98;
      local_1808 = local_1f38[2];
      local_17f8 = local_1f38[4];
      local_17e8 = dStack_1ef0;
      local_5d8 = dStack_1518;
      local_5a8 = local_14e8;
      local_17d8 = dStack_13c8;
      local_17c8 = (double)local_13c0._8_8_;
      local_17b8 = local_1390;
      local_17a8 = local_1388;
      local_1798 = local_1058;
      local_1ac0 = local_1048;
      local_1788 = local_1020;
      local_1778 = local_1018;
      local_5c8 = dStack_fa8;
      local_5b8 = local_f98;
      local_598 = local_f70;
      local_588 = local_f68;
      local_698 = local_828[2];
      local_688 = local_828[4];
      local_1818 = local_828[9];
      local_3a8 = exp(dVar44);
      dVar27 = local_1df8[0xb];
      dVar118 = local_1df8[4];
      dVar29 = exp(local_16a0[0]);
      dVar73 = local_1df8[0xd];
      auVar84._8_8_ = dVar29;
      auVar84._0_8_ = local_628;
      dVar72 = local_638 * 1020.0;
      dVar101 = local_3a8 * 30000000.0;
      auVar49._8_8_ = dVar101;
      auVar49._0_8_ = dVar72;
      auVar116 = divpd(auVar49,auVar84);
      dVar29 = dVar43 * dVar22;
      dVar41 = dVar27 * dVar118;
      dVar46 = dVar72 * local_618;
      dVar45 = dVar70 * dVar20;
      dVar25 = local_608 + local_388;
      dVar26 = local_5e8 + local_5f8;
      dVar21 = auVar116._0_8_;
      dVar24 = auVar116._8_8_;
      dVar27 = dVar27 * -dVar24;
      dVar118 = dVar118 * -dVar24;
      dStack_1528 = local_19a8 - dVar46;
      local_608 = dStack_ef8;
      local_5f8 = local_ea0;
      local_19a8 = local_d98;
      local_5e8 = local_d88;
      local_16a0[0] = local_d50;
      local_14f0 = dVar23 + dVar46;
      local_14e8 = local_5a8 - dVar46;
      dVar20 = dVar20 * dVar72;
      dStack_fa8 = local_5c8 - dVar20;
      local_f98 = local_5b8 + dVar20;
      local_f70 = local_598 + dVar20;
      local_f68 = local_588 - dVar20;
      dVar23 = dVar92 * dVar72 * dVar113 * local_618 -
               (dVar92 - (dVar26 - dVar25) * dVar42) * dVar21 * dVar29;
      dVar25 = local_1e68 * dVar101 * dVar45 -
               (local_1e68 - ((dStack_1c90 + local_1cc8) - (dStack_1c80 + local_1cd8)) * dVar42) *
               dVar24 * dVar41;
      local_828[9] = local_1818 + dVar23;
      dVar20 = dVar113 * local_618 * dVar72 - dVar29 * dVar21;
      dVar113 = dVar45 * dVar101 - dVar41 * dVar24;
      dStack_1ef0 = local_17e8 + dVar20;
      dVar22 = dVar22 * -dVar21;
      local_1390 = local_17b8 + dVar22;
      local_1388 = local_17a8 - dVar22;
      dVar43 = -dVar21 * dVar43;
      local_1058 = local_1798 - dVar43;
      local_1048 = local_1ac0 + dVar43;
      local_1020 = local_1788 + dVar43;
      local_1018 = local_1778 - dVar43;
      local_1f38[2] = (local_1808 - dVar20) - dVar113;
      local_1f38[4] = local_17f8 + dVar20 + dVar113;
      local_1ee8 = (undefined1  [8])((double)local_1ee8 - dVar20);
      dStack_1ee0 = dVar113 + dStack_1ee0;
      dStack_1ed0 = dStack_1ed0 - dVar113;
      dVar70 = dVar70 * dVar101;
      dStack_1528 = dStack_1528 - dVar70;
      local_14e0 = local_14e0 + dVar70;
      local_14d0 = local_14d0 - dVar70;
      dStack_1518 = dVar70 + local_5d8 + dVar46;
      dStack_13c8 = (local_17d8 - dVar22) - dVar27;
      local_1380 = local_1380 + dVar27;
      local_1370 = local_1370 - dVar27;
      local_13c0._8_8_ = dVar27 + local_17c8 + dVar22;
      dStack_ef8 = dStack_ef8 - dVar118;
      local_ee8 = local_ee8 + dVar118;
      dStack_eb0 = dStack_eb0 + dVar118;
      local_ea0 = local_ea0 - dVar118;
      dVar101 = dVar101 * local_1df8[2];
      local_d98 = local_d98 - dVar101;
      local_d88 = local_d88 + dVar101;
      local_d50 = local_d50 + dVar101;
      local_d40 = local_d40 - dVar101;
      local_828[2] = (local_698 - dVar23) - dVar25;
      local_828[4] = local_688 + dVar23 + dVar25;
      local_7d8._0_8_ = (double)local_7d8._0_8_ - dVar23;
      local_7d8._8_8_ = dVar25 + (double)local_7d8._8_8_;
      dStack_7c0 = dStack_7c0 - dVar25;
      dVar29 = local_1df8[2] * local_1df8[0xd];
      dVar22 = exp(dVar44);
      dVar20 = local_1df8[0xc];
      dVar43 = local_1df8[1];
      dVar22 = dVar22 * 30000000.0;
      dVar27 = local_1df8[1] * local_1df8[0xc];
      dVar70 = exp(dVar28);
      dVar118 = local_1df8[0xe];
      dVar70 = dVar22 / dVar70;
      dVar113 = dVar22 * dVar29 - dVar27 * dVar70;
      dVar27 = local_1e68 * dVar22 * dVar29 -
               (local_1e68 - ((dStack_1ce0 + local_1c88) - (local_1cd8 + dStack_1c80)) * dVar42) *
               dVar70 * dVar27;
      local_1f38[1] = local_1f38[1] + dVar113;
      local_1f38[2] = local_1f38[2] - dVar113;
      dStack_1ed0 = dStack_1ed0 - dVar113;
      local_1ed8 = dVar113 + local_1ed8;
      dVar20 = dVar20 * -dVar70;
      auStack_15e0._0_8_ = (double)auStack_15e0._0_8_ + dVar20;
      auStack_15e0._8_8_ = (double)auStack_15e0._8_8_ - dVar20;
      local_1588 = local_1588 + dVar20;
      local_1580 = local_1580 - dVar20;
      dVar73 = dVar73 * dVar22;
      local_1530 = local_1530 + dVar73;
      dVar41 = dStack_1528 - dVar73;
      local_14d8 = local_14d8 + dVar73;
      dVar73 = local_14d0 - dVar73;
      dVar43 = -dVar70 * dVar43;
      local_e50 = local_e50 + dVar43;
      dStack_e48 = dStack_e48 - dVar43;
      local_df8 = local_df8 + dVar43;
      local_df0 = local_df0 - dVar43;
      dVar22 = dVar22 * local_1df8[2];
      local_da0 = local_da0 + dVar22;
      dVar29 = local_d98 - dVar22;
      local_d48 = local_d48 + dVar22;
      dVar22 = local_d40 - dVar22;
      local_828[1] = local_828[1] + dVar27;
      local_828[2] = local_828[2] - dVar27;
      local_7c8 = local_7c8 + dVar27;
      dStack_7c0 = dStack_7c0 - dVar27;
      dVar21 = local_1df8[2] * local_1df8[0xe];
      dVar70 = exp(local_1768);
      dVar20 = local_1df8[0xd];
      dVar43 = local_1df8[4];
      dVar70 = dVar70 * 39000000.0;
      dVar113 = local_1df8[4] * local_1df8[0xd];
      dVar28 = exp(local_1918);
      dVar27 = local_1df8[2];
      dVar28 = dVar70 / dVar28;
      dVar23 = dVar70 * dVar21 - dVar113 * dVar28;
      dVar113 = local_398 * dVar70 * dVar21 -
                (local_398 - ((local_1cc8 + dStack_1c80) - (local_1cd8 + local_1c78)) * dVar42) *
                dVar28 * dVar113;
      local_1f38[2] = local_1f38[2] - dVar23;
      local_1f38[4] = local_1f38[4] + dVar23;
      local_1ec8 = local_1ec8 - dVar23;
      dStack_1ed0 = dVar23 + dStack_1ed0;
      dVar118 = dVar118 * dVar70;
      dStack_1528 = dVar41 - dVar118;
      dStack_1518 = dStack_1518 + dVar118;
      local_14d0 = dVar73 + dVar118;
      local_14c8 = local_14c8 - dVar118;
      dVar20 = dVar20 * -dVar28;
      dStack_13c8 = dStack_13c8 - dVar20;
      local_13c0._8_8_ = (double)local_13c0._8_8_ + dVar20;
      local_1370 = local_1370 + dVar20;
      local_1368 = local_1368 - dVar20;
      dVar43 = -dVar28 * dVar43;
      local_d98 = dVar29 - dVar43;
      local_d88 = local_d88 + dVar43;
      local_d40 = dVar22 + dVar43;
      local_d38 = local_d38 - dVar43;
      dVar70 = dVar70 * local_1df8[2];
      local_ce8 = local_ce8 - dVar70;
      local_cd8 = local_cd8 + dVar70;
      local_c90 = local_c90 + dVar70;
      local_c88 = local_c88 - dVar70;
      local_828[2] = local_828[2] - dVar113;
      local_828[4] = local_828[4] + dVar113;
      dStack_7c0 = dStack_7c0 + dVar113;
      dStack_7b8 = dStack_7b8 - dVar113;
      local_588 = local_1df8[0x10];
      dStack_580 = 0.0;
      dVar23 = exp(local_18b8);
      dVar73 = local_1df8[0xd];
      dVar43 = local_1df8[9];
      local_5c8 = exp(local_1908);
      dVar21 = dStack_1528;
      dVar118 = local_1df8[0x11];
      dVar70 = local_1df8[2];
      dVar22 = dStack_1ef0;
      local_5a8 = local_1cd8;
      dStack_5a0 = dStack_1cd0;
      local_5b8 = local_1c68;
      dStack_5b0 = dStack_1c60;
      local_698 = dStack_1ca0;
      dStack_690 = local_1c98;
      local_598 = dStack_1c80;
      dStack_590 = local_1c78;
      local_18b8 = local_1f38[2];
      local_17e8 = local_14f0;
      local_17d8 = local_14d0;
      local_17c8 = local_14b8;
      local_1798 = local_1058;
      local_1ac0 = local_1020;
      local_1788 = local_1000;
      local_1778 = local_fe8;
      local_19a8 = local_d98;
      local_1768 = local_d60;
      local_1918 = local_d40;
      local_1908 = local_d28;
      local_688 = local_b88;
      local_1818 = dStack_b50;
      local_1808 = local_b30;
      local_17f8 = local_b18;
      local_17b8 = local_828[2];
      local_17a8 = local_828[9];
      local_5d8 = exp(dVar44);
      dVar28 = local_1df8[0xe];
      dVar113 = local_1df8[9];
      dVar20 = exp(dVar47);
      dVar41 = local_1a78;
      dVar29 = local_1df8[0x12];
      auVar85._8_8_ = dVar20;
      auVar85._0_8_ = local_5c8;
      dVar23 = dVar23 * (double)0x4033333333333333;
      dVar24 = local_5d8 * 132000000.0;
      auVar63._8_8_ = dVar24;
      auVar63._0_8_ = dVar23;
      auVar116 = divpd(auVar63,auVar85);
      dVar46 = dVar43 * dVar73;
      dVar72 = dVar28 * dVar113;
      dVar25 = dVar23 * local_588;
      dVar92 = dVar118 * dVar70;
      dVar20 = local_1a78 - ((local_698 + local_598) - (local_5a8 + local_5b8)) * dVar42;
      dVar26 = auVar116._0_8_;
      dVar45 = auVar116._8_8_;
      dVar28 = dVar28 * -dVar45;
      dVar113 = dVar113 * -dVar45;
      local_1a78 = local_c70;
      local_14d0 = local_17d8 + dVar25;
      local_14b8 = local_17c8 - dVar25;
      dVar70 = dVar70 * dVar23;
      local_b88 = local_688 - dVar70;
      dStack_b50 = local_1818 + dVar70;
      local_b30 = local_1808 + dVar70;
      local_b18 = local_17f8 - dVar70;
      dVar20 = dVar41 * dVar23 * dVar27 * local_588 - dVar20 * dVar26 * dVar46;
      dVar70 = local_1e68 * dVar24 * dVar92 -
               (local_1e68 - ((local_1c78 + dStack_1ca0) - (dStack_1c60 + local_1cd8)) * dVar42) *
               dVar45 * dVar72;
      dVar27 = dVar27 * local_588 * dVar23 - dVar46 * dVar26;
      dVar41 = dVar92 * dVar24 - dVar72 * dVar45;
      dVar73 = dVar73 * -dVar26;
      local_1000 = local_1788 + dVar73;
      local_fe8 = local_1778 - dVar73;
      dVar43 = -dVar26 * dVar43;
      local_d98 = local_19a8 - dVar43;
      local_d60 = local_1768 + dVar43;
      local_d40 = local_1918 + dVar43;
      local_d28 = local_1908 - dVar43;
      local_1f38[2] = (local_18b8 - dVar27) - dVar41;
      dStack_1ef0 = dVar41 + dVar22 + dVar27;
      dStack_1ed0 = dStack_1ed0 + dVar27;
      local_1ec8 = local_1ec8 + dVar41;
      local_1eb8 = local_1eb8 - dVar27;
      dStack_1eb0 = dStack_1eb0 - dVar41;
      dVar118 = dVar118 * dVar24;
      dStack_1528 = (dVar21 - dVar25) - dVar118;
      local_14c8 = local_14c8 + dVar118;
      local_14b0 = local_14b0 - dVar118;
      local_14f0 = dVar118 + local_17e8 + dVar25;
      local_1058 = (local_1798 - dVar73) - dVar28;
      dStack_ff8 = dStack_ff8 + dVar28;
      local_fe0 = local_fe0 - dVar28;
      local_1020 = dVar28 + local_1ac0 + dVar73;
      local_ce8 = local_ce8 - dVar113;
      local_cb0 = local_cb0 + dVar113;
      local_c88 = local_c88 + dVar113;
      local_c70 = local_c70 - dVar113;
      dVar24 = dVar24 * local_1df8[2];
      local_aa0 = local_aa0 + dVar24;
      local_a78 = local_a78 + dVar24;
      dVar73 = local_ad8 - dVar24;
      dVar24 = local_a60 - dVar24;
      local_828[2] = (local_17b8 - dVar20) - dVar70;
      local_828[9] = local_17a8 + dVar20 + dVar70;
      dStack_7c0 = dStack_7c0 + dVar20;
      dStack_7b8 = dStack_7b8 + dVar70;
      dStack_7a8 = dStack_7a8 - dVar20;
      dStack_7a0 = dStack_7a0 - dVar70;
      dVar41 = local_1df8[2] * local_1df8[0x12];
      dVar118 = exp(local_1998);
      dVar20 = local_1df8[0x11];
      dVar43 = local_1df8[4];
      dVar118 = dVar118 * 89.8;
      dVar70 = local_1df8[4] * local_1df8[0x11];
      dVar113 = exp(dVar61);
      dVar27 = local_1df8[3];
      dVar22 = local_1df8[2];
      dVar113 = dVar118 / dVar113;
      dVar28 = dVar118 * dVar41 - dVar70 * dVar113;
      local_1f38[2] = local_1f38[2] - dVar28;
      local_1f38[4] = local_1f38[4] + dVar28;
      local_1ea8 = local_1ea8 - dVar28;
      dStack_1eb0 = dVar28 + dStack_1eb0;
      dVar70 = local_1988 * dVar118 * dVar41 -
               (local_1988 - ((local_1cc8 + dStack_1c60) - (local_1cd8 + local_1c58)) * dVar42) *
               dVar113 * dVar70;
      dVar29 = dVar29 * dVar118;
      dStack_1528 = dStack_1528 - dVar29;
      dStack_1518 = dStack_1518 + dVar29;
      local_14b0 = local_14b0 + dVar29;
      local_14a8 = local_14a8 - dVar29;
      dVar20 = dVar20 * -dVar113;
      dStack_13c8 = dStack_13c8 - dVar20;
      local_13c0._8_8_ = (double)local_13c0._8_8_ + dVar20;
      local_1350 = local_1350 + dVar20;
      local_1348 = local_1348 - dVar20;
      dVar43 = -dVar113 * dVar43;
      local_ad8 = dVar73 - dVar43;
      local_ac8 = local_ac8 + dVar43;
      local_a60 = dVar24 + dVar43;
      local_a58 = local_a58 - dVar43;
      dVar118 = dVar118 * local_1df8[2];
      dStack_a28 = dStack_a28 - dVar118;
      local_a18 = local_a18 + dVar118;
      local_9b0 = local_9b0 + dVar118;
      local_9a8 = local_9a8 - dVar118;
      local_828[2] = local_828[2] - dVar70;
      local_828[4] = local_828[4] + dVar70;
      dStack_7a0 = dStack_7a0 + dVar70;
      local_798 = local_798 - dVar70;
      local_17c8 = local_1df8[0xb];
      uStack_17c0 = 0;
      local_17e8 = exp((double)local_18f8._0_8_);
      local_17f8 = exp(local_1738);
      dVar25 = local_df8;
      dVar24 = local_e00;
      dVar21 = local_e40;
      dVar41 = dStack_e48;
      dVar29 = local_1470;
      dVar28 = local_14d8;
      dVar73 = local_14e0;
      dVar113 = local_1520;
      dVar70 = dStack_1528;
      dVar118 = local_1df8[0xe];
      local_17b8 = dStack_1cd0;
      dStack_17b0 = local_1cc8;
      local_17d8 = dStack_1c90;
      dStack_17d0 = local_1c88;
      local_17a8 = local_1cd8;
      dStack_17a0 = dStack_1cd0;
      local_1738 = local_1f38[2];
      local_1998 = local_1f38[3];
      local_1988 = dStack_1ee0;
      local_1798 = dStack_1478;
      local_1ac0 = local_1430;
      local_1788 = local_1428;
      local_1778 = dStack_ef8;
      local_19a8 = local_ef0;
      local_1768 = dStack_eb0;
      local_1918 = dStack_ea8;
      local_1908 = local_828[2];
      local_18f8._0_8_ = local_828[3];
      local_18b8 = (double)local_7d8._8_8_;
      local_1a78 = local_1df8[2];
      local_1808 = local_1df8[3];
      uStack_1800 = 0;
      local_1818 = exp(local_18e8);
      local_18e8 = local_1df8[6];
      dStack_18e0 = 0.0;
      dVar43 = exp(local_18d8);
      dVar23 = local_1df8[3];
      auVar50._8_8_ = dVar43;
      auVar50._0_8_ = local_17f8;
      dVar109 = local_17e8 * 2500000.0;
      dVar47 = local_1818 * 100000000.0;
      auVar86._8_8_ = dVar47;
      auVar86._0_8_ = dVar109;
      auVar116 = divpd(auVar86,auVar50);
      dVar48 = dVar109 * local_17c8;
      dVar93 = dVar27 * local_17c8;
      dVar80 = dVar118 * local_1808;
      dVar43 = local_17b8 + local_17d8;
      dVar45 = local_18e8 * local_1df8[0xd];
      dVar92 = auVar116._0_8_;
      dVar101 = auVar116._8_8_;
      dVar61 = dVar109 * dVar93 - dVar22 * local_1df8[0xc] * dVar92;
      dVar72 = dVar47 * dVar80 - dVar45 * dVar101;
      dVar26 = local_17a8 + local_1c88;
      dVar59 = dVar59 + dVar71;
      dVar60 = dVar60 + dVar71;
      dVar20 = -dVar101 * local_18e8;
      dVar118 = dVar118 * dVar47;
      dVar46 = dVar47 * local_1808;
      dStack_1478 = local_1798 + dVar48;
      local_1818 = local_1260;
      local_17e8 = local_1208;
      local_17d8 = local_d90;
      local_17a8 = local_d38;
      local_1798 = local_ce0;
      local_18e8 = local_c88;
      local_1808 = local_d78;
      local_17f8 = local_d40;
      local_17c8 = local_cc8;
      local_17b8 = local_c90;
      local_1430 = local_1ac0 - dVar48;
      local_1428 = dVar48 + local_1788;
      dVar27 = dVar27 * dVar109;
      dStack_ef8 = local_1778 + dVar27;
      local_ef0 = local_19a8 - dVar27;
      dStack_eb0 = local_1768 - dVar27;
      dStack_ea8 = dVar27 + local_1918;
      dVar43 = dVar109 * dVar59 * dVar93 -
               (dVar59 - (dVar26 - dVar43) * dVar42) * dVar92 * dVar22 * local_1df8[0xc];
      dVar22 = dVar47 * dVar60 * dVar80 -
               (dVar60 - ((local_1cb8 + dStack_1c80) - (local_1c78 + dStack_1cd0)) * dVar42) *
               dVar101 * dVar45;
      local_828[2] = local_1908 + dVar43;
      local_7d8._8_8_ = local_18b8 - dVar43;
      local_1f38[2] = local_1738 + dVar61;
      dStack_1ee0 = local_1988 - dVar61;
      local_14d8 = local_1df8[0xc] * -dVar92;
      dVar27 = local_1df8[0xd] * -dVar101;
      dStack_1528 = dVar70 + local_14d8;
      local_1520 = dVar113 - local_14d8;
      local_14e0 = dVar73 - local_14d8;
      local_14d8 = local_14d8 + dVar28;
      local_df8 = -dVar92 * local_1a78;
      dStack_e48 = dVar41 + local_df8;
      local_e40 = dVar21 - local_df8;
      local_e00 = dVar24 - local_df8;
      local_df8 = local_df8 + dVar25;
      local_1f38[3] = (local_1998 - dVar61) - dVar72;
      local_1f38[6] = local_1f38[6] + dVar72;
      local_1ed8 = dVar61 + local_1ed8;
      dStack_1ed0 = dVar72 + dStack_1ed0;
      local_1ec8 = local_1ec8 - dVar72;
      local_1470 = (dVar29 - dVar48) - dVar118;
      dStack_1458 = dStack_1458 + dVar118;
      local_1420 = local_1420 + dVar118;
      local_1418 = local_1418 - dVar118;
      local_1260 = local_1260 - dVar27;
      dStack_1248 = dStack_1248 + dVar27;
      local_1210 = local_1210 + dVar27;
      local_1208 = local_1208 - dVar27;
      local_d90 = local_d90 - dVar20;
      local_d78 = local_d78 + dVar20;
      local_d40 = local_d40 + dVar20;
      local_d38 = local_d38 - dVar20;
      local_ce0 = local_ce0 - dVar46;
      local_cc8 = local_cc8 + dVar46;
      local_c90 = local_c90 + dVar46;
      local_c88 = local_c88 - dVar46;
      local_828[3] = ((double)local_18f8._0_8_ - dVar43) - dVar22;
      local_828[6] = local_828[6] + dVar22;
      local_7c8 = dVar43 + local_7c8;
      dStack_7c0 = dVar22 + dStack_7c0;
      dStack_7b8 = dStack_7b8 - dVar22;
      local_18d8 = local_1df8[1];
      dStack_18d0 = 0.0;
      dVar70 = exp(local_1758);
      dVar24 = local_1df8[4];
      local_1a58 = exp(local_1a58);
      dVar60 = local_828[3];
      dVar59 = local_828[2];
      dVar46 = local_828[1];
      dVar45 = local_1cc8;
      dVar25 = local_1df8[6];
      dVar41 = local_1df8[1];
      dVar28 = local_1f38[3];
      dVar73 = local_1f38[2];
      dVar113 = local_1f38[1];
      local_1998 = dStack_1ce0;
      uStack_1990 = 0;
      local_1a78 = dStack_1cd0;
      uStack_1a70 = 0;
      local_1988 = exp(local_1748);
      dVar29 = local_1df8[0];
      auVar32._0_8_ = exp(local_1a48);
      dVar26 = local_1df8[6];
      dVar21 = local_1df8[1];
      dVar72 = local_1998 + local_1a78;
      auVar32._8_8_ = local_1a58;
      dVar20 = local_1988 * 28000000.0;
      dVar70 = dVar70 * 83000000.0;
      auVar119._8_8_ = dVar70;
      auVar119._0_8_ = dVar20;
      auVar116 = divpd(auVar119,auVar32);
      dVar27 = local_1df8[3] * dVar29;
      dVar92 = local_1df8[2] * dVar24;
      dVar47 = dVar41 * dVar25;
      dVar48 = dVar23 * local_18d8;
      dVar23 = dVar23 * dVar70;
      dStack_15c8 = dStack_15c8 + dVar23;
      dVar43 = dVar23 + (double)auStack_15e0._8_8_;
      dVar61 = (double)auStack_15e0._0_8_ - dVar23;
      dVar101 = (double)local_18c8._0_8_ + dVar71;
      dVar93 = auVar116._0_8_;
      dVar80 = auVar116._8_8_;
      dVar118 = dVar20 * dVar47 - dVar27 * dVar93;
      dVar22 = dVar70 * dVar48 - dVar92 * dVar80;
      local_18b8 = local_1690;
      local_1738 = local_1668;
      local_1a58 = dStack_1458;
      local_1a48 = local_828[0];
      local_1758 = local_16a0[1];
      local_1748 = local_1680;
      local_18c8._0_8_ = local_15f0[1];
      local_1a78 = local_1488;
      local_1988 = local_1278;
      local_1998 = local_1260;
      auStack_15e0._8_4_ = SUB84(dVar43,0);
      auStack_15e0._0_8_ = dVar61;
      auStack_15e0._12_4_ = (int)((ulong)dVar43 >> 0x20);
      dVar109 = dVar70 * local_18d8;
      dStack_1468 = dVar109 + dStack_1468;
      auVar5._8_4_ = SUB84(dStack_1478 + dVar109,0);
      auVar5._0_8_ = local_1480 - dVar109;
      auVar5._12_4_ = (int)((ulong)(dStack_1478 + dVar109) >> 0x20);
      dVar25 = dVar25 * dVar20;
      dVar41 = dVar41 * dVar20;
      dVar27 = dVar20 * dVar101 * dVar47 -
               (dVar101 - ((dStack_1cd0 + local_1ce8) - (local_1cb8 + dStack_1ce0)) * dVar42) *
               dVar93 * dVar27;
      dVar70 = dVar70 * ((double)local_18c8._8_8_ + dVar71) * dVar48 -
               (((double)local_18c8._8_8_ + dVar71) - ((local_1cd8 + dVar45) - dVar72) * dVar42) *
               dVar80 * dVar92;
      local_828[1] = dVar46 - dVar70;
      local_828[2] = dVar59 + dVar70;
      local_1f38[2] = dVar73 + dVar22;
      dVar73 = local_1df8[3] * -dVar93;
      dVar29 = dVar29 * -dVar93;
      dVar24 = dVar24 * -dVar80;
      local_1530 = local_1530 - dVar24;
      dStack_1528 = dStack_1528 + dVar24;
      dStack_1518 = dVar24 + dStack_1518;
      local_1520 = local_1520 - dVar24;
      dVar43 = local_1df8[2] * -dVar80;
      local_13d0 = local_13d0 - dVar43;
      dStack_13c8 = dStack_13c8 + dVar43;
      dVar20 = dVar43 + (double)local_13c0._8_8_;
      local_13c0._8_4_ = SUB84(dVar20,0);
      local_13c0._0_8_ = (double)local_13c0._0_8_ - dVar43;
      local_13c0._12_4_ = (int)((ulong)dVar20 >> 0x20);
      local_1f38[0] = local_1f38[0] + dVar118;
      local_1f38[1] = (dVar113 - dVar22) - dVar118;
      local_1f38[3] = (dVar28 - dVar22) + dVar118;
      local_1f38[4] = local_1f38[4] + dVar22;
      local_1f38[6] = local_1f38[6] - dVar118;
      local_16a0[1] = local_16a0[1] + dVar73;
      local_1690 = local_1690 - dVar73;
      local_1680 = local_1680 + dVar73;
      local_1668 = local_1668 - dVar73;
      local_15f0[1] = local_15f0[1] + dVar25;
      dVar28 = local_15b8 - dVar25;
      local_15d0 = dVar25 + (local_15d0 - dVar23);
      local_1488 = local_1488 + dVar29;
      local_1480 = (local_1480 - dVar109) - dVar29;
      dStack_1478 = auVar5._8_8_;
      dStack_1458 = dStack_1458 - dVar29;
      local_1470 = dVar29 + (local_1470 - dVar109);
      local_1278 = local_1278 + dVar41;
      local_1260 = local_1260 + dVar41;
      dVar29 = local_1270 - dVar41;
      dVar41 = dStack_1248 - dVar41;
      local_828[0] = local_828[0] + dVar27;
      dVar20 = local_828[1] - dVar27;
      local_828[3] = (dVar60 - dVar70) + dVar27;
      local_828[4] = local_828[4] + dVar70;
      dVar27 = local_828[6] - dVar27;
      dVar22 = local_1df8[1] * local_1df8[6];
      dVar70 = exp(local_748);
      dVar43 = local_1df8[4];
      dVar70 = dVar70 * 134000000.0;
      dVar113 = local_1df8[4] * local_1df8[4];
      dVar73 = exp(local_1968);
      dVar118 = dStack_1ce0;
      dVar73 = dVar70 / dVar73;
      dVar23 = dVar70 * dVar22 - dVar113 * dVar73;
      dVar22 = (double)local_1a68._0_8_ * dVar70 * dVar22 -
               ((double)local_1a68._0_8_ -
               ((local_1cc8 + local_1cc8) - (local_1cb8 + dStack_1ce0)) * dVar42) * dVar73 * dVar113
      ;
      dVar72 = local_1f38[1] - dVar23;
      local_1f38[6] = local_1f38[6] - dVar23;
      local_1f38[4] = dVar23 + dVar23 + local_1f38[4];
      dVar26 = dVar26 * dVar70;
      local_15b8 = dVar28 - dVar26;
      dStack_15c8 = dVar26 + dVar26 + dStack_15c8;
      dVar43 = dVar73 * -2.0 * dVar43;
      local_13d0 = local_13d0 - dVar43;
      local_13a8 = local_13a8 - dVar43;
      dVar70 = dVar70 * dVar21;
      local_1270 = dVar29 - dVar70;
      dStack_1248 = dVar41 - dVar70;
      dStack_1258 = dVar70 + dVar70 + dStack_1258;
      local_828[1] = dVar20 - dVar22;
      local_828[6] = dVar27 - dVar22;
      local_828[4] = dVar22 + dVar22 + local_828[4];
      local_1918 = local_1df8[10];
      uStack_1910 = 0;
      local_13c0._8_8_ = dVar43 + dVar43 + (double)local_13c0._8_8_;
      local_19a8 = exp((double)local_1a38._0_8_);
      dVar113 = local_1df8[9];
      dVar27 = local_1df8[0];
      local_1778 = exp(local_1978);
      dVar23 = local_1018;
      dVar41 = local_1020;
      dVar29 = local_15f0[1];
      dVar28 = local_1df8[0xd];
      dVar20 = local_1df8[1];
      local_1768 = local_1c98;
      dStack_1760 = dStack_1c90;
      local_18f8._0_8_ = local_1ce8;
      local_18f8._8_8_ = dStack_1ce0;
      local_1908 = dStack_1ca0;
      dStack_1900 = local_1c98;
      local_1998 = local_1f38[0];
      local_1988 = dStack_1ef0;
      local_1a68._0_8_ = local_16a0[1];
      local_1a58 = local_1690;
      local_1a48 = local_1650;
      local_1978 = local_1648;
      local_1758 = dStack_15a0;
      local_18c8._0_8_ = local_1598;
      local_1968 = local_1068;
      local_1a38._0_8_ = local_1060;
      local_18e8 = local_fb8;
      local_18d8 = local_fb0;
      local_1748 = local_f70;
      local_748 = local_f68;
      local_18b8 = local_828[0];
      local_1738 = local_828[1];
      local_1a78 = local_828[9];
      local_1788 = exp(dVar44);
      dVar73 = local_1df8[0xb];
      dVar70 = local_1df8[0];
      dVar43 = exp(local_738);
      dVar22 = local_1a28;
      auVar87._8_8_ = dVar43;
      auVar87._0_8_ = local_1778;
      dVar92 = local_19a8 * 660.0;
      dVar59 = local_1788 * 73400000.0;
      auVar51._8_8_ = dVar59;
      auVar51._0_8_ = dVar92;
      auVar116 = divpd(auVar51,auVar87);
      dVar24 = dVar27 * dVar113;
      dVar45 = dVar73 * dVar70;
      dVar101 = dVar92 * local_1918;
      dVar21 = dVar21 * local_1918;
      dVar109 = dVar28 * dVar20;
      dVar43 = local_1a28 -
               (((double)local_18f8._0_8_ + local_1908) - (dVar118 + local_1768)) * dVar42;
      dVar46 = auVar116._0_8_;
      dVar60 = auVar116._8_8_;
      dVar73 = dVar73 * -dVar60;
      dVar70 = dVar70 * -dVar60;
      local_1908 = local_1580;
      local_18f8._0_8_ = local_f00;
      local_1a28 = local_ea0;
      local_1918 = dStack_eb0;
      local_738 = local_d50;
      dStack_15a0 = local_1758 + dVar101;
      local_1598 = (double)local_18c8._0_8_ - dVar101;
      dVar20 = dVar20 * dVar92;
      local_fb8 = local_18e8 + dVar20;
      local_fb0 = local_18d8 - dVar20;
      local_f70 = local_1748 + dVar20;
      local_f68 = local_748 - dVar20;
      dVar43 = dVar22 * dVar92 * dVar21 - dVar43 * dVar46 * dVar24;
      dVar20 = local_1e68 * dVar59 * dVar109 -
               (local_1e68 - ((dStack_1c90 + local_1ce8) - (dStack_1c80 + dStack_1ce0)) * dVar42) *
               dVar60 * dVar45;
      local_828[9] = local_1a78 + dVar43;
      dVar118 = dVar21 * dVar92 - dVar24 * dVar46;
      dVar22 = dVar109 * dVar59 - dVar45 * dVar60;
      dStack_1ef0 = local_1988 + dVar118;
      dVar113 = dVar113 * -dVar46;
      local_1650 = local_1a48 + dVar113;
      local_1648 = local_1978 - dVar113;
      dVar27 = -dVar46 * dVar27;
      local_1068 = local_1968 + dVar27;
      local_1060 = (double)local_1a38._0_8_ - dVar27;
      local_1020 = dVar41 + dVar27;
      local_1018 = dVar23 - dVar27;
      local_1f38[0] = local_1998 + dVar118 + dVar22;
      local_1f38[1] = (dVar72 - dVar118) - dVar22;
      dVar27 = dVar22 + dStack_1ee0;
      unique0x10006c6a = SUB84(dVar27,0);
      local_1ee8 = (undefined1  [8])((double)local_1ee8 - dVar118);
      unique0x10006c6e = (int)((ulong)dVar27 >> 0x20);
      dStack_1ed0 = dStack_1ed0 - dVar22;
      local_16a0[1] = (double)local_1a68._0_8_ + dVar113 + dVar73;
      local_1690 = (local_1a58 - dVar113) - dVar73;
      local_1640 = local_1640 + dVar73;
      local_1630 = local_1630 - dVar73;
      dVar28 = dVar28 * dVar59;
      local_15f0[1] = dVar29 + dVar101 + dVar28;
      auStack_15e0._0_8_ = (((dVar61 - dVar25) - dVar26) - dVar101) - dVar28;
      local_1590 = local_1590 + dVar28;
      local_1580 = local_1580 - dVar28;
      local_f08 = local_f08 + dVar70;
      local_f00 = local_f00 - dVar70;
      dStack_eb0 = dStack_eb0 + dVar70;
      local_ea0 = local_ea0 - dVar70;
      local_1a48 = local_1df8[1];
      dVar59 = dVar59 * local_1df8[1];
      dVar23 = local_da8 + dVar59;
      local_d50 = local_d50 + dVar59;
      dVar21 = local_da0 - dVar59;
      dVar59 = local_d40 - dVar59;
      local_828[0] = local_18b8 + dVar43 + dVar20;
      local_828[1] = (local_1738 - dVar43) - dVar20;
      dVar118 = dVar20 + (double)local_7d8._8_8_;
      local_7d8._8_4_ = SUB84(dVar118,0);
      local_7d8._0_8_ = (double)local_7d8._0_8_ - dVar43;
      local_7d8._12_4_ = (int)((ulong)dVar118 >> 0x20);
      dStack_7c0 = dStack_7c0 - dVar20;
      local_1758 = exp(local_1898);
      dVar43 = local_1df8[0];
      local_1a58 = local_1df8[0xd];
      local_1748 = local_1df8[0] * local_1df8[0xd];
      local_18e8 = exp(local_1728);
      dVar28 = dStack_7b8;
      dVar73 = dStack_7c0;
      dVar113 = local_828[1];
      dVar70 = local_828[0];
      dVar27 = local_c88;
      uVar8 = auStack_15e0._0_8_;
      local_18d8 = (double)local_1e28._0_8_ -
                   ((local_1ce8 + dStack_1c80) - (dStack_1ce0 + local_1c78)) * dVar42;
      dStack_18d0 = (double)local_1e28._8_8_;
      local_18c8._0_8_ = local_1f38[0];
      local_1738 = local_1f38[1];
      local_748 = dStack_1ed0;
      local_18b8 = local_1ec8;
      local_738 = local_16a0[1];
      local_1a78 = local_1690;
      local_1998 = local_1630;
      local_1988 = local_1628;
      local_1728 = local_15f0[1];
      local_1a68._0_8_ = local_1580;
      local_1978 = local_d38;
      local_1968 = local_1df8[1];
      local_1a38._0_8_ = local_cf8;
      local_1a28 = local_cf0;
      local_1898 = local_c90;
      local_18f8._0_8_ = exp(dVar44);
      dVar118 = local_1df8[9];
      dVar20 = local_1df8[4];
      dVar29 = local_1df8[4] * local_1df8[9];
      local_18f8._8_8_ = extraout_XMM0_Qb_01;
      dVar41 = exp(dVar95);
      dVar22 = local_1df8[0x12];
      local_c88 = local_1758 * 23000.0;
      dVar60 = (double)local_18f8._0_8_ * 32000000.0;
      dVar24 = local_c88 / local_18e8;
      dVar45 = local_c88 * local_1a48 * local_1df8[0xe] - local_1748 * dVar24;
      dVar46 = (double)local_1e28._0_8_ * local_c88 * local_1a48 * local_1df8[0xe] -
               dVar24 * local_18d8 * local_1748;
      local_1f38[0] = (double)local_18c8._0_8_ + dVar45;
      dStack_1ed0 = local_748 + dVar45;
      local_1ec8 = local_18b8 - dVar45;
      local_1628 = local_1a58 * -dVar24;
      local_16a0[1] = local_738 + local_1628;
      local_1690 = local_1a78 - local_1628;
      local_1630 = local_1998 + local_1628;
      local_1628 = local_1988 - local_1628;
      dVar25 = local_c88 * local_1df8[0xe];
      dVar26 = dVar60 * local_1df8[0xf];
      local_15f0[1] = local_1728 + dVar25;
      local_1580 = (double)local_1a68._0_8_ + dVar25;
      dVar43 = -dVar24 * dVar43;
      local_da8 = dVar23 + dVar43;
      local_da0 = dVar21 - dVar43;
      local_d40 = dVar59 + dVar43;
      local_d38 = local_1978 - dVar43;
      local_c88 = local_c88 * local_1968;
      local_cf8 = (double)local_1a38._0_8_ + local_c88;
      local_cf0 = local_1a28 - local_c88;
      local_c90 = local_1898 + local_c88;
      local_c88 = dVar27 - local_c88;
      local_828[0] = dVar70 + dVar46;
      dStack_7c0 = dVar73 + dVar46;
      dStack_7b8 = dVar28 - dVar46;
      dVar41 = dVar60 / dVar41;
      dVar27 = dVar60 * local_1df8[0xf] * local_1968 - dVar29 * dVar41;
      dVar43 = local_1e68 * dVar60 * local_1df8[0xf] * local_1968 -
               dVar41 * (local_1e68 -
                        ((local_1cc8 + dStack_1ca0) - (dStack_1ce0 + dStack_1c70)) * dVar42) *
               dVar29;
      local_1f38[1] = (local_1738 - dVar45) - dVar27;
      local_1f38[4] = local_1f38[4] + dVar27;
      dStack_1ec0 = dStack_1ec0 - dVar27;
      dStack_1ef0 = dVar27 + dStack_1ef0;
      dStack_15c8 = dStack_15c8 + dVar26;
      dStack_15a0 = dStack_15a0 + dVar26;
      auStack_15e0._0_8_ = ((double)uVar8 - dVar25) - dVar26;
      local_1578 = local_1578 - dVar25;
      dStack_1570 = dStack_1570 - dVar26;
      dVar118 = dVar118 * -dVar41;
      local_13d0 = local_13d0 - dVar118;
      local_13c0._8_8_ = (double)local_13c0._8_8_ + dVar118;
      local_1390 = local_1390 + dVar118;
      local_1360 = local_1360 - dVar118;
      dVar20 = -dVar41 * dVar20;
      local_1060 = local_1060 - dVar20;
      local_1048 = local_1048 + dVar20;
      local_1020 = local_1020 + dVar20;
      local_ff0 = local_ff0 - dVar20;
      dVar60 = dVar60 * local_1df8[1];
      local_c40 = local_c40 - dVar60;
      local_c28 = local_c28 + dVar60;
      local_c00 = local_c00 + dVar60;
      local_bd0 = local_bd0 - dVar60;
      local_828[1] = (dVar113 - dVar46) - dVar43;
      local_828[4] = local_828[4] + dVar43;
      local_828[9] = local_828[9] + dVar43;
      dStack_7b0 = dStack_7b0 - dVar43;
      dVar28 = local_1df8[1] * local_1df8[0x12];
      dVar27 = exp(local_1708);
      dVar20 = local_1df8[0x11];
      dVar43 = local_1df8[0];
      dVar27 = dVar27 * 115.0;
      dVar70 = local_1df8[0] * local_1df8[0x11];
      dVar113 = exp(dVar96);
      dVar21 = local_1df8[4];
      dVar41 = local_1df8[1];
      dVar118 = local_1df8[0];
      dVar113 = dVar27 / dVar113;
      dVar73 = dVar27 * dVar28 - dVar70 * dVar113;
      dVar70 = (double)local_16f8._0_8_ * dVar27 * dVar28 -
               ((double)local_16f8._0_8_ -
               ((local_1ce8 + dStack_1c60) - (dStack_1ce0 + local_1c58)) * dVar42) * dVar113 *
               dVar70;
      local_1f38[0] = local_1f38[0] + dVar73;
      local_1f38[1] = local_1f38[1] - dVar73;
      local_1ea8 = local_1ea8 - dVar73;
      dStack_1eb0 = dVar73 + dStack_1eb0;
      dVar20 = dVar20 * -dVar113;
      local_16a0[1] = local_16a0[1] + dVar20;
      local_1690 = local_1690 - dVar20;
      local_1610 = local_1610 + dVar20;
      local_1608[0] = local_1608[0] - dVar20;
      dVar22 = dVar22 * dVar27;
      local_15f0[1] = local_15f0[1] + dVar22;
      auStack_15e0._0_8_ = (double)auStack_15e0._0_8_ - dVar22;
      local_1560 = local_1560 + dVar22;
      local_1558 = local_1558 - dVar22;
      dVar43 = -dVar113 * dVar43;
      local_ae8 = local_ae8 + dVar43;
      local_ae0 = local_ae0 - dVar43;
      local_a60 = local_a60 + dVar43;
      local_a58 = local_a58 - dVar43;
      dVar27 = dVar27 * local_1df8[1];
      local_a38 = local_a38 + dVar27;
      local_a30 = local_a30 - dVar27;
      local_9b0 = local_9b0 + dVar27;
      local_9a8 = local_9a8 - dVar27;
      local_828[0] = local_828[0] + dVar70;
      local_828[1] = local_828[1] - dVar70;
      dStack_7a0 = dStack_7a0 + dVar70;
      local_798 = local_798 - dVar70;
      dVar59 = exp((double)local_16e8._0_8_);
      local_1898 = local_1df8[5];
      uStack_1890 = 0;
      local_1a58 = exp(local_728);
      dVar46 = local_828[4];
      dVar45 = local_1308;
      dVar26 = local_13b0;
      uVar8 = local_13c0._8_8_;
      dVar29 = local_1f38[5];
      dVar28 = local_1f38[4];
      dVar73 = local_1f38[1];
      dVar113 = local_1f38[0];
      dStack_720 = dStack_1ce0 + dStack_1cc0;
      local_728 = (dStack_720 - (local_1ce8 + local_1cc8)) * dVar42;
      local_1a78 = local_16a0[1];
      local_1998 = local_1690;
      local_1988 = local_1678;
      local_1728 = local_1670;
      local_1a48 = local_15f0[1];
      local_1978 = (double)auStack_15e0._0_8_;
      local_1968 = dStack_15c8;
      local_1a38._0_8_ = local_15c0;
      local_1a68._0_8_ = local_13d8;
      local_1a28 = local_1328;
      local_16e8._0_8_ = local_1300;
      local_1708 = local_828[0];
      local_16f8._0_8_ = local_828[5];
      local_1e28._8_8_ = 0;
      local_1e28._0_8_ = local_1df8[4];
      dVar60 = exp(local_1958);
      dVar23 = local_1df8[5];
      dVar60 = dVar60 * 0.0357;
      dVar43 = exp(local_1930);
      dVar25 = dStack_1cc0;
      dVar24 = local_1df8[6];
      local_1958 = local_1cc8;
      uStack_1950 = 0;
      dVar59 = dVar59 * 216.0;
      local_1670 = dVar59 * dVar21;
      local_16a0[1] = local_1a78 - local_1670;
      local_1690 = local_1998 + local_1670;
      local_1678 = local_1988 - local_1670;
      local_1670 = local_1670 + local_1728;
      dVar101 = dVar59 * dVar118;
      dVar109 = dVar60 * 2.0 * (double)local_1e28._0_8_;
      local_13d8 = (double)local_1a68._0_8_ - dVar101;
      local_13d0 = local_13d0 + dVar101;
      dStack_13c8 = dStack_13c8 + dVar109;
      auVar99._8_8_ = dVar43;
      auVar99._0_8_ = local_1a58;
      dVar43 = dVar42 * 1.51 + local_1718;
      dVar20 = dVar42 * 2.4 + dStack_1710;
      auVar88._8_8_ = dVar60;
      auVar88._0_8_ = dVar59;
      auVar116 = divpd(auVar88,auVar99);
      local_1718 = -auVar116._0_8_;
      dStack_1710 = -auVar116._8_8_;
      dVar22 = dStack_1710 * dVar23;
      dStack_1528 = dStack_1528 + dVar22;
      dStack_1518 = dStack_1518 - (dVar22 + dVar22);
      local_1510 = dVar22 + local_1510;
      local_15c0 = local_1898 * local_1718;
      local_15f0[1] = local_1a48 - local_15c0;
      auStack_15e0._0_8_ = local_1978 + local_15c0;
      dStack_15c8 = local_1968 - local_15c0;
      local_15c0 = local_15c0 + (double)local_1a38._0_8_;
      dVar22 = local_1df8[1] * local_1718;
      dVar27 = local_1df8[2] * dStack_1710;
      local_1328 = local_1a28 - dVar22;
      local_1320 = local_1320 + dVar22;
      dStack_1318 = dStack_1318 + dVar27;
      local_16e8._8_4_ = SUB84(dVar27,0);
      local_16e8._0_8_ = dVar27 + (double)local_16e8._0_8_ + dVar22;
      local_16e8._12_4_ = (int)((ulong)dVar27 >> 0x20);
      dVar21 = dVar21 * dVar118;
      dVar72 = (double)local_1e28._0_8_ * (double)local_1e28._0_8_;
      dVar118 = -(dVar43 - local_728) * auVar116._0_8_;
      dVar70 = dVar23 * local_1df8[2];
      local_1a38._8_4_ = SUB84(dVar70,0);
      local_1a38._0_8_ = dVar118;
      local_1a38._12_4_ = (int)((ulong)dVar70 >> 0x20);
      dVar93 = dVar59 * dVar21 + local_1898 * dVar41 * local_1718;
      dVar43 = dVar43 * dVar59 * dVar21 + dVar118 * local_1898 * dVar41;
      dVar118 = dVar20 * dVar60 * dVar72 +
                dVar70 * -(dVar20 - ((local_1cd8 + dStack_1cc0) - (local_1cc8 + local_1cc8)) *
                                    dVar42) * auVar116._8_8_;
      local_1f38[0] = dVar113 - dVar93;
      local_1f38[1] = dVar73 + dVar93;
      local_828[0] = local_1708 - dVar43;
      local_828[1] = local_828[1] + dVar43;
      local_828[2] = local_828[2] + dVar118;
      local_16f8._8_4_ = SUB84(dVar118,0);
      local_16f8._0_8_ = dVar118 + (double)local_16f8._0_8_ + dVar43;
      local_16f8._12_4_ = (int)((ulong)dVar118 >> 0x20);
      local_1f38[4] = dVar28 - dVar93;
      local_1f38[5] = dVar93 + dVar29;
      local_1a48 = exp(local_18a8);
      dVar70 = local_1df8[3];
      local_1a58 = exp(local_718);
      dVar41 = local_1df8[7];
      dVar73 = local_1df8[4];
      local_1978 = local_1cb8;
      dStack_1970 = dStack_1cb0;
      local_1968 = dStack_1cd0;
      dStack_1960 = local_1cc8;
      local_18a8 = local_1f38[3];
      local_1a28 = local_1df8[5];
      uStack_1a20 = 0;
      local_1898 = (double)local_13c0._0_8_;
      local_728 = local_13a8;
      local_1930 = local_1310;
      local_1708 = local_12f8;
      local_718 = local_828[3];
      local_1728 = exp(dVar44);
      dVar21 = local_1df8[0xe];
      local_1a68._8_8_ = 0;
      local_1a68._0_8_ = local_1df8[1];
      dVar20 = exp(dVar97);
      auVar52._8_8_ = dVar20;
      auVar52._0_8_ = local_1a58;
      dVar48 = local_1a48 * 29000000.0;
      dVar113 = local_1728 * 20000000.0;
      auVar89._8_8_ = dVar113;
      auVar89._0_8_ = dVar48;
      auVar116 = divpd(auVar89,auVar52);
      dVar23 = dVar23 * dVar70;
      dVar92 = dVar21 * (double)local_1a68._0_8_;
      dVar61 = (double)local_1e28._0_8_ * dVar24;
      dVar47 = dVar41 * dVar73;
      dVar59 = auVar116._0_8_;
      dVar20 = dVar48 * dVar61 - dVar23 * dVar59;
      dVar23 = dVar62 * dVar48 * dVar61 -
               (dVar62 - ((dVar25 + local_1968) - (local_1958 + local_1978)) * dVar42) * dVar59 *
               dVar23;
      dVar25 = local_1e68 * dVar113 * dVar47 -
               (local_1e68 - ((local_1c78 + dStack_1ce0) - (dStack_1cb0 + local_1cc8)) * dVar42) *
               auVar116._8_8_ * dVar92;
      dVar61 = -auVar116._8_8_;
      dVar92 = dVar47 * dVar113 + dVar61 * dVar92;
      dVar60 = dVar72 * dVar60 + dStack_1710 * (double)local_1a38._8_8_;
      dVar21 = dVar21 * dVar61;
      dVar61 = dVar61 * (double)local_1a68._0_8_;
      local_1f38[3] = local_18a8 + dVar20;
      local_1a28 = local_1a28 * -dVar59;
      local_1470 = local_1470 + local_1a28;
      dStack_1468 = dStack_1468 - local_1a28;
      local_1460 = local_1a28 + local_1460;
      dStack_1458 = dStack_1458 - local_1a28;
      local_1a38._0_8_ = dStack_13a0;
      local_1958 = local_11a8;
      local_1e28._0_8_ = dStack_1190;
      local_18a8 = local_1158;
      dVar24 = dVar24 * dVar48;
      local_13c0._0_8_ = local_1898 + dVar24;
      local_13b0 = dVar109 + dVar26 + dVar101 + dVar24;
      local_13a8 = local_728 - dVar24;
      dVar70 = -dVar59 * dVar70;
      local_1310 = local_1930 + dVar70;
      local_1308 = ((dVar45 - dVar22) - (dVar27 + dVar27)) - dVar70;
      local_1300 = (double)local_16e8._0_8_ + dVar70;
      local_12f8 = local_1708 - dVar70;
      dVar41 = dVar41 * dVar113;
      dVar113 = dVar113 * dVar73;
      dVar48 = dVar48 * dVar73;
      local_1260 = local_1260 + dVar48;
      dStack_1258 = dStack_1258 - dVar48;
      local_1250 = dVar48 + local_1250;
      dStack_1248 = dStack_1248 - dVar48;
      local_828[3] = local_718 + dVar23;
      local_828[5] = (double)local_16f8._0_8_ + dVar23;
      local_1f38[5] = dVar60 + dVar93 + dVar29 + dVar20;
      local_1f38[1] = local_1f38[1] + dVar92;
      local_1f38[2] = local_1f38[2] + dVar60;
      local_1f38[4] = (((dVar28 - dVar93) - (dVar60 + dVar60)) - dVar20) - dVar92;
      local_1ec8 = local_1ec8 + dVar92;
      local_1f38[6] = local_1f38[6] - dVar20;
      auStack_1f00 = (undefined1  [8])((double)auStack_1f00 - dVar92);
      auStack_15e0._0_8_ = (double)auStack_15e0._0_8_ + dVar21;
      dStack_15c8 = dStack_15c8 - dVar21;
      local_1578 = local_1578 + dVar21;
      local_15b0 = local_15b0 - dVar21;
      local_13d0 = local_13d0 + dVar41;
      local_13c0._8_8_ = ((((double)uVar8 - dVar101) - (dVar109 + dVar109)) - dVar24) - dVar41;
      local_1368 = local_1368 + dVar41;
      dStack_13a0 = dStack_13a0 - dVar41;
      local_11c0 = local_11c0 + dVar113;
      local_11a8 = local_11a8 - dVar113;
      local_1158 = local_1158 + dVar113;
      dStack_1190 = dStack_1190 - dVar113;
      local_cf0 = local_cf0 + dVar61;
      local_cd8 = local_cd8 - dVar61;
      local_c88 = local_c88 + dVar61;
      dStack_cc0 = dStack_cc0 - dVar61;
      local_828[1] = local_828[1] + dVar25;
      local_828[4] = (((dVar46 - dVar43) - (dVar118 + dVar118)) - dVar23) - dVar25;
      local_828[6] = local_828[6] - dVar23;
      local_828[7] = local_828[7] - dVar25;
      dStack_7b8 = dStack_7b8 + dVar25;
      local_1a58 = local_1df8[4];
      uStack_1a50 = 0;
      local_1a28 = local_1df8[8];
      uStack_1a20 = 0;
      local_1a38._0_8_ = exp(dVar44);
      dVar21 = local_1df8[0xe];
      dVar70 = local_1df8[1];
      local_1a38._8_8_ = extraout_XMM0_Qb_02;
      local_18a8 = exp(dVar102);
      dVar61 = dStack_7b8;
      dVar60 = local_828[4];
      dVar59 = local_c88;
      dVar46 = local_cb8;
      dVar45 = local_cd8;
      dVar26 = local_cf0;
      uVar10 = local_13c0._8_8_;
      dVar25 = local_1578;
      dVar24 = local_15a8;
      dVar23 = dStack_15c8;
      uVar8 = auStack_15e0._0_8_;
      dVar29 = local_1df8[9];
      dVar27 = local_1ec8;
      dVar22 = local_1f38[4];
      local_1e28._0_8_ = local_1f38[1];
      local_1898 = local_13d0;
      local_728 = local_1398;
      local_1930 = local_1368;
      local_1708 = local_1110;
      local_16f8._0_8_ = local_10f8;
      local_16e8._0_8_ = local_10d8;
      local_1958 = local_10a8;
      local_718 = local_828[1];
      local_1718 = local_1df8[4];
      dStack_1710 = 0.0;
      local_1968 = dStack_1ce0;
      dStack_1960 = 0.0;
      local_1a48 = local_1cc8;
      uStack_1a40 = 0;
      local_1a68._8_8_ = 0;
      local_1a68._0_8_ = local_1ca8;
      local_1978 = local_1c78;
      dStack_1970 = 0.0;
      local_1a18 = exp(local_1a18);
      dVar28 = local_1df8[7];
      dVar73 = local_1df8[5];
      auVar33._0_8_ = exp(local_1888);
      dVar41 = local_1df8[9];
      dVar113 = local_1df8[4];
      auVar33._8_8_ = local_18a8;
      local_1a18 = local_1a18 * 56.0;
      local_10a8 = (double)local_1a38._0_8_ * 30000000.0;
      auVar103._8_8_ = local_10a8;
      auVar103._0_8_ = local_1a18;
      auVar116 = divpd(auVar103,auVar33);
      dVar43 = dVar28 * dVar73;
      dVar72 = dVar21 * dVar70;
      dVar92 = local_1718 * dVar29;
      dVar109 = auVar116._0_8_;
      dVar47 = auVar116._8_8_;
      dVar20 = local_1a08 * local_1a18 * dVar92 -
               (local_1a08 - ((dStack_1cb0 + dStack_1cc0) - (dStack_1ca0 + local_1cc8)) * dVar42) *
               dVar109 * dVar43;
      dVar118 = local_1e68 * local_10a8 * local_1a28 * local_1a58 -
                (local_1e68 -
                ((local_1978 + local_1968) - (local_1a48 + (double)local_1a68._0_8_)) * dVar42) *
                dVar47 * dVar72;
      dVar92 = dVar92 * local_1a18 - dVar43 * dVar109;
      dVar101 = local_1a28 * local_1a58 * local_10a8 - dVar72 * dVar47;
      dVar29 = dVar29 * local_1a18;
      dVar43 = local_1a18 * local_1718;
      dVar72 = local_1a28 * local_10a8;
      local_13d0 = local_1898 + dVar72;
      local_1a48 = local_1308;
      local_1718 = local_12e0;
      local_18a8 = local_11a8;
      local_1888 = local_1180;
      local_1a18 = local_1048;
      local_1a08 = local_1020;
      local_1978 = local_11a0;
      local_1968 = dStack_1190;
      local_1898 = local_1040;
      local_1a38._0_8_ = local_1030;
      local_1a28 = local_828[5];
      local_1398 = local_728 - dVar72;
      local_1368 = dVar72 + local_1930;
      local_10a8 = local_10a8 * local_1a58;
      local_1110 = local_1708 + local_10a8;
      local_10f8 = (double)local_16f8._0_8_ - local_10a8;
      local_10d8 = (double)local_16e8._0_8_ - local_10a8;
      local_10a8 = local_10a8 + local_1958;
      local_828[1] = local_718 + dVar118;
      dStack_7b8 = dVar118 + dVar61;
      local_1f38[1] = (double)local_1e28._0_8_ + dVar101;
      local_1ec8 = dVar101 + dVar27;
      dVar28 = dVar28 * -dVar109;
      dVar73 = dVar73 * -dVar109;
      dVar21 = dVar21 * -dVar47;
      auStack_15e0._0_8_ = (double)uVar8 + dVar21;
      dStack_15c8 = dVar23 - dVar21;
      local_15a8 = dVar24 - dVar21;
      local_1578 = dVar21 + dVar25;
      dVar70 = dVar70 * -dVar47;
      local_cf0 = dVar26 + dVar70;
      local_cd8 = dVar45 - dVar70;
      local_cb8 = dVar46 - dVar70;
      local_c88 = dVar70 + dVar59;
      local_1f38[4] = (dVar22 - dVar101) - dVar92;
      local_1f38[5] = local_1f38[5] + dVar92;
      auStack_1f00 = (undefined1  [8])((double)auStack_1f00 + dVar92);
      local_1ef8 = local_1ef8 - dVar101;
      dStack_1ef0 = dStack_1ef0 - dVar92;
      local_13c0._8_8_ = ((double)uVar10 - dVar72) - dVar29;
      local_13b0 = local_13b0 + dVar29;
      dStack_13a0 = dStack_13a0 + dVar29;
      local_1390 = local_1390 - dVar29;
      local_1308 = local_1308 - dVar28;
      local_1300 = local_1300 + dVar28;
      local_12f0 = local_12f0 + dVar28;
      local_12e0 = local_12e0 - dVar28;
      local_11a8 = local_11a8 - dVar73;
      local_11a0 = local_11a0 + dVar73;
      dStack_1190 = dStack_1190 + dVar73;
      local_1180 = local_1180 - dVar73;
      local_1048 = local_1048 - dVar43;
      local_1040 = local_1040 + dVar43;
      local_1030 = local_1030 + dVar43;
      local_1020 = local_1020 - dVar43;
      local_828[5] = local_828[5] + dVar20;
      local_828[4] = (dVar60 - dVar118) - dVar20;
      local_828[7] = local_828[7] + dVar20;
      local_828[8] = local_828[8] - dVar118;
      local_828[9] = local_828[9] - dVar20;
      dVar118 = local_1df8[4] * local_1df8[9];
      dVar22 = exp(dVar44);
      dVar20 = local_1df8[8];
      dVar43 = local_1df8[5];
      dVar22 = dVar22 * 25010000.0;
      dVar27 = local_1df8[5] * local_1df8[8];
      dVar70 = exp(local_16c8);
      dVar70 = dVar22 / dVar70;
      dVar73 = dVar22 * dVar118 - dVar27 * dVar70;
      dVar118 = local_1e68 * dVar22 * dVar118 -
                (local_1e68 - ((dStack_1cc0 + local_1ca8) - (local_1cc8 + dStack_1ca0)) * dVar42) *
                dVar70 * dVar27;
      local_1f38[4] = local_1f38[4] - dVar73;
      local_1f38[5] = local_1f38[5] + dVar73;
      dStack_1ef0 = dStack_1ef0 - dVar73;
      local_1ef8 = dVar73 + local_1ef8;
      dVar41 = dVar41 * dVar22;
      local_13c0._8_8_ = (double)local_13c0._8_8_ - dVar41;
      local_13b0 = local_13b0 + dVar41;
      local_1398 = local_1398 + dVar41;
      local_1390 = local_1390 - dVar41;
      dVar20 = dVar20 * -dVar70;
      local_1308 = local_1308 - dVar20;
      local_1300 = local_1300 + dVar20;
      local_12e8 = local_12e8 + dVar20;
      local_12e0 = local_12e0 - dVar20;
      dVar43 = -dVar70 * dVar43;
      local_10f8 = local_10f8 - dVar43;
      local_10f0 = local_10f0 + dVar43;
      local_10d8 = local_10d8 + dVar43;
      local_10d0 = local_10d0 - dVar43;
      dVar22 = dVar22 * dVar113;
      local_718 = local_1048 - dVar22;
      local_16e8._0_8_ = local_1040 + dVar22;
      local_1028 = local_1028 + dVar22;
      local_1708 = local_1020 - dVar22;
      local_828[4] = local_828[4] - dVar118;
      local_828[5] = local_828[5] + dVar118;
      local_828[8] = local_828[8] + dVar118;
      local_828[9] = local_828[9] - dVar118;
      local_17c8 = local_1df8[4];
      uStack_17c0 = 0;
      dVar118 = exp(local_19d8);
      local_17f8 = local_1df8[5];
      uStack_17f0 = 0;
      local_17e8 = local_1df8[9];
      uStack_17e0 = 0;
      dVar27 = exp(local_19f8);
      local_1808 = local_1d18 - ((dStack_1cc0 + dStack_1ca0) - (local_1cc8 + local_1c98)) * dVar42;
      uStack_1800 = uStack_1d10;
      local_17d8 = local_1f38[4];
      local_17b8 = dStack_1ef0;
      local_17a8 = (double)local_13c0._8_8_;
      local_1788 = local_13b0;
      local_1778 = local_1390;
      local_1768 = local_1388;
      local_1918 = local_1308;
      local_1908 = local_1300;
      local_18e8 = local_12e0;
      local_1748 = local_12d8;
      local_738 = local_1018;
      local_1728 = local_f98;
      local_1a58 = local_f90;
      local_1978 = local_f70;
      local_1968 = local_f68;
      local_18a8 = local_828[4];
      local_1a38._0_8_ = local_828[5];
      local_1a28 = local_828[9];
      local_728 = (double)local_7d8._0_8_;
      dVar70 = exp(local_1bf8);
      dVar20 = local_1df8[0xc];
      dVar22 = local_1df8[1];
      auVar34._0_8_ = exp((double)local_19e8._0_8_);
      dVar45 = dStack_eb0;
      dVar25 = local_ee8;
      dVar24 = local_f00;
      dVar41 = local_1df8[0xd];
      dVar43 = local_1df8[4];
      local_1738 = local_1d08 - ((dStack_1ce0 + local_1c88) - (local_1cc8 + dStack_1c90)) * dVar42;
      uStack_1730 = uStack_1d00;
      local_16f8._0_8_ = local_1f38[1];
      local_1a78 = dStack_15c8;
      local_1988 = local_1590;
      local_1718 = local_13d0;
      local_1898 = local_1380;
      local_1930 = local_1378;
      auVar53._0_8_ = dVar70 * 47.6;
      auVar53._8_8_ = dVar118 * 100.0;
      auVar34._8_8_ = dVar27;
      auVar116 = divpd(auVar53,auVar34);
      dVar72 = auVar116._0_8_;
      dVar113 = auVar116._8_8_;
      local_1818 = -dVar72;
      dStack_1810 = -dVar113;
      local_1798 = dVar20 * local_1818;
      uStack_1790 = 0;
      local_1ac0 = (double)auStack_15e0._0_8_ + local_1798;
      local_19a8 = local_1588 + local_1798;
      local_1758 = dVar22 * local_1818;
      dStack_1750 = 0.0;
      local_748 = local_e50 + local_1758;
      local_18b8 = local_df8 + local_1758;
      local_18f8._0_8_ = local_e38;
      local_18d8 = local_e00;
      local_1a08 = local_828[1];
      local_19f8 = (double)local_7d8._8_8_;
      local_19e8._0_8_ = local_7c8;
      dVar59 = exp(dVar44);
      local_1a48 = local_1df8[0xb];
      uStack_1a40 = 0;
      dVar27 = exp(local_16d8);
      dVar46 = local_ea0;
      dVar26 = local_ee0;
      dVar23 = local_1370;
      dVar21 = local_1df8[0xe];
      dVar73 = local_1df8[4];
      local_1e28._0_8_ = dStack_1ed0;
      local_19d8 = local_12d0;
      local_1bf8 = local_12c0;
      local_1888 = local_d88;
      local_16c8 = local_d80;
      local_1958 = local_d50;
      local_16d8 = local_d40;
      local_1a18 = dStack_7c0;
      local_688 = local_1cc8;
      uStack_680 = 0;
      local_1a68._8_8_ = 0;
      local_1a68._0_8_ = dStack_1cc0;
      local_18c8._8_8_ = 0;
      local_18c8._0_8_ = dStack_1c90;
      local_698 = dStack_1c80;
      dStack_690 = 0.0;
      dVar60 = exp(local_1af8);
      dVar29 = local_1df8[5];
      local_1998 = local_1df8[0xd];
      uStack_1990 = 0;
      auVar35._0_8_ = exp(local_1c28);
      dVar28 = local_1df8[4];
      dVar118 = (double)local_1a68._0_8_ + (double)local_18c8._0_8_;
      auVar35._8_8_ = dVar27;
      dVar60 = dVar60 * 3430.0;
      dVar59 = dVar59 * 50000000.0;
      auVar64._8_8_ = dVar59;
      auVar64._0_8_ = dVar60;
      local_18c8 = divpd(auVar64,auVar35);
      dVar109 = dVar73 * dVar21;
      dVar47 = dVar41 * dVar43;
      local_1a68._8_4_ = SUB84(dVar59,0);
      local_1a68._0_8_ = dVar59;
      local_1a68._12_4_ = (int)((ulong)dVar59 >> 0x20);
      dVar41 = dVar41 * dVar59;
      local_1c28 = local_1368;
      dVar20 = dVar20 * dVar22;
      dVar92 = local_1d18 * auVar53._8_8_ * local_17c8 * local_1df8[10] -
               local_17e8 * local_17f8 * dVar113 * local_1808;
      dVar70 = local_1df8[4] * local_1df8[0xb] * auVar53._0_8_ - dVar20 * dVar72;
      dVar113 = local_17c8 * local_1df8[10] * auVar53._8_8_ - local_17e8 * local_17f8 * dVar113;
      local_1af8 = local_1ec8;
      dStack_1ef0 = dVar113 + local_17b8;
      dVar93 = auVar53._8_8_ * local_1df8[10];
      local_1d18 = local_c90;
      local_1390 = local_1778 + dVar93;
      local_1388 = local_1768 - dVar93;
      dVar101 = local_17e8 * (double)CONCAT44(local_1818._4_4_,dStack_1810._0_4_);
      local_12e0 = local_18e8 + dVar101;
      local_12d8 = local_1748 - dVar101;
      local_1018 = local_17f8 * (double)CONCAT44(local_1818._4_4_,dStack_1810._0_4_);
      local_1048 = local_718 - local_1018;
      local_1040 = (double)local_16e8._0_8_ + local_1018;
      local_1020 = local_1708 + local_1018;
      local_1018 = local_738 - local_1018;
      local_f68 = auVar53._8_8_ * local_17c8;
      local_f98 = local_1728 - local_f68;
      local_f90 = local_1a58 + local_f68;
      local_f70 = local_1978 + local_f68;
      local_f68 = local_1968 - local_f68;
      local_828[9] = local_1a28 + dVar92;
      local_7d8._0_8_ = local_728 - dVar92;
      auStack_15e0._0_8_ = local_1ac0;
      dStack_15c8 = local_1a78 - local_1798;
      local_1590 = local_1988 - local_1798;
      local_1588 = local_19a8;
      dVar61 = local_1df8[0xb] * auVar53._0_8_;
      local_13d0 = local_1718 + dVar61;
      local_1378 = dVar61 + local_1930;
      local_e50 = local_748;
      local_e38 = (double)local_18f8._0_8_ - local_1758;
      local_e00 = local_18d8 - local_1758;
      local_df8 = local_18b8;
      local_1380 = (local_1898 - dVar61) + dVar41;
      dVar22 = local_1df8[4] * local_1df8[0xb] * local_1d08 * auVar53._0_8_ -
               dVar72 * local_1738 * dVar20;
      local_1f38[1] = (double)local_16f8._0_8_ + dVar70;
      dVar20 = local_1998 * dVar29;
      dVar27 = -(double)local_18c8._8_8_ * local_1a48;
      dVar72 = dVar109 * dVar60 - dVar20 * (double)local_18c8._0_8_;
      dVar48 = dVar47 * dVar59 - local_1df8[5] * local_1a48 * (double)local_18c8._8_8_;
      local_1ee8 = (undefined1  [8])((double)local_1ee8 - dVar113);
      local_828[1] = local_1a08 + dVar22;
      local_7c8 = dVar22 + (double)local_19e8._0_8_;
      dVar43 = dVar59 * dVar43;
      local_d50 = local_1958 + dVar43;
      dVar20 = local_1ad8 * dVar60 * dVar109 -
               (local_1ad8 - ((dStack_1c80 + dStack_1cc0) - (local_1c78 + local_1cc8)) * dVar42) *
               (double)local_18c8._0_8_ * dVar20;
      dVar118 = local_1e68 * dVar59 * dVar47 -
                (local_1e68 - (dVar118 - (local_688 + local_698)) * dVar42) *
                (double)local_18c8._8_8_ * local_1df8[5] * local_1a48;
      local_7d8._8_8_ = (local_19f8 - dVar22) + dVar118;
      local_12d0 = local_19d8 + dVar27;
      dVar59 = auVar53._0_8_ * local_1df8[4];
      local_ea0 = -(double)local_18c8._8_8_ * local_1df8[5];
      local_f00 = dVar24 + dVar59;
      dStack_eb0 = (dVar45 - dVar59) + local_ea0;
      dStack_ea8 = dStack_ea8 + dVar59;
      dStack_1ee0 = dVar48 + (dStack_1ee0 - dVar70);
      local_1ed8 = dVar70 + local_1ed8;
      local_ee8 = (dVar25 - dVar59) - local_ea0;
      local_ee0 = dVar26 + local_ea0;
      local_ea0 = dVar46 - local_ea0;
      local_1f38[4] = (((local_17d8 - dVar113) - dVar70) - dVar48) - dVar72;
      local_1f38[5] = local_1f38[5] + dVar113 + dVar48 + dVar72;
      dStack_1ed0 = ((double)local_1e28._0_8_ - dVar48) + dVar72;
      local_1ec8 = local_1ec8 - dVar72;
      dVar73 = dVar73 * dVar60;
      dVar60 = dVar60 * dVar21;
      local_13c0._8_8_ = (((local_17a8 - dVar93) - dVar61) - dVar41) - dVar60;
      local_13b0 = local_1788 + dVar93 + dVar41 + dVar60;
      local_1368 = local_1368 - dVar60;
      local_1370 = dVar60 + (dVar23 - dVar41);
      local_12c0 = local_1998 * -(double)local_18c8._0_8_;
      local_1308 = ((local_1918 - dVar101) - dVar27) - local_12c0;
      local_1300 = local_1908 + dVar101 + dVar27 + local_12c0;
      local_12b8 = local_12b8 - local_12c0;
      local_12c0 = local_12c0 + (local_1bf8 - dVar27);
      dVar29 = -(double)local_18c8._0_8_ * dVar29;
      local_d88 = (local_1888 - dVar43) - dVar29;
      local_d80 = local_16c8 + dVar43 + dVar29;
      local_d40 = (local_16d8 - dVar43) + dVar29;
      local_d38 = local_d38 - dVar29;
      local_cd8 = local_cd8 - dVar73;
      local_cd0 = local_cd0 + dVar73;
      local_c90 = local_c90 + dVar73;
      local_c88 = local_c88 - dVar73;
      local_828[4] = (((local_18a8 - dVar92) - dVar22) - dVar118) - dVar20;
      local_828[5] = (double)local_1a38._0_8_ + dVar92 + dVar118 + dVar20;
      dStack_7c0 = (local_1a18 - dVar118) + dVar20;
      dStack_7b8 = dStack_7b8 - dVar20;
      local_19e8._8_8_ = 0;
      local_19e8._0_8_ = local_1df8[0x12];
      dVar72 = exp(local_1ae8);
      dVar73 = local_1df8[0x11];
      local_19f8 = exp(dVar81);
      dVar61 = local_a58;
      dVar60 = local_a60;
      dVar59 = local_ac0;
      dVar46 = local_ac8;
      dVar45 = local_1298;
      dVar26 = local_12a0;
      dVar25 = local_1300;
      dVar24 = local_1308;
      dVar23 = local_1348;
      dVar21 = local_1350;
      dVar41 = local_13b0;
      dVar70 = local_1df8[7];
      dVar27 = local_1df8[6];
      dVar22 = local_1ea8;
      dVar118 = dStack_1eb0;
      dVar20 = local_1f38[4];
      local_1bf8 = (double)local_13c0._8_8_;
      local_1af8 = local_a18;
      local_1ad8 = local_a10;
      local_1ae8 = local_9b0;
      local_1c28 = local_9a8;
      local_1e28._0_8_ = local_828[4];
      local_1d18 = dStack_7a0;
      local_1d08 = local_798;
      local_1888 = local_1cc8;
      dStack_1880 = 0.0;
      local_1a18 = dStack_1c60;
      uStack_1a10 = 0;
      local_16c8 = local_1c58;
      uStack_16c0 = 0;
      local_1a08 = exp(dVar44);
      local_19d8 = local_1df8[0xe];
      dStack_19d0 = 0.0;
      auVar36._0_8_ = exp(local_1e18);
      dVar29 = local_19c8;
      dVar113 = local_1df8[6];
      auVar36._8_8_ = local_19f8;
      dVar92 = local_1a08 * 20000000.0;
      dVar72 = dVar72 * 3.54;
      auVar107._8_8_ = dVar72;
      auVar107._0_8_ = dVar92;
      auVar116 = divpd(auVar107,auVar36);
      dVar101 = dVar70 * dVar27;
      dVar109 = (double)local_19e8._0_8_ * dVar28;
      dVar43 = local_19c8 - ((local_1a18 + dStack_1cc0) - (local_16c8 + local_1888)) * dVar42;
      dVar47 = dVar73 * local_1df8[5];
      dVar62 = auVar116._0_8_;
      dVar80 = auVar116._8_8_;
      dVar48 = dVar92 * dVar101 - local_19d8 * local_1df8[4] * dVar62;
      dVar93 = dVar72 * dVar109 - dVar47 * dVar80;
      local_1348 = (double)local_19e8._0_8_ * dVar72;
      local_13c0._8_8_ = local_1bf8 - local_1348;
      local_19f8 = dStack_1248;
      dStack_19f0 = dStack_1240;
      local_19c8 = local_1198;
      dStack_19c0 = dStack_1190;
      local_1e18 = local_cc8;
      dStack_1e10 = dStack_cc0;
      local_1a18 = local_11a8;
      local_1a08 = local_1158;
      local_19e8._0_8_ = local_cd8;
      local_1bf8 = local_c88;
      local_13b0 = dVar41 + local_1348;
      local_1350 = dVar21 + local_1348;
      local_1348 = dVar23 - local_1348;
      dVar28 = dVar72 * dVar28;
      local_a18 = local_1af8 - dVar28;
      local_a10 = local_1ad8 + dVar28;
      local_9b0 = local_1ae8 + dVar28;
      local_9a8 = local_1c28 - dVar28;
      dVar70 = dVar70 * dVar92;
      dVar27 = dVar27 * dVar92;
      dVar92 = local_1e68 * dVar92 * dVar101 -
               (local_1e68 - ((local_1c78 + local_1cc8) - (dStack_1cb0 + local_1cb8)) * dVar42) *
               dVar62 * local_19d8 * local_1df8[4];
      dVar28 = dVar29 * dVar72 * dVar109 - dVar43 * dVar80 * dVar47;
      dStack_7a0 = local_1d18 + dVar28;
      local_798 = local_1d08 - dVar28;
      dStack_1eb0 = dVar118 + dVar93;
      local_1ea8 = dVar22 - dVar93;
      dVar118 = local_1df8[4] * -dVar62;
      local_a58 = local_1df8[5] * -dVar80;
      dVar43 = local_19d8 * -dVar62;
      dVar73 = -dVar80 * dVar73;
      local_1308 = dVar24 - dVar73;
      local_1300 = dVar25 + dVar73;
      local_12a0 = dVar26 + dVar73;
      local_1298 = dVar45 - dVar73;
      local_ac8 = dVar46 - local_a58;
      local_ac0 = dVar59 + local_a58;
      local_a60 = dVar60 + local_a58;
      local_a58 = dVar61 - local_a58;
      local_1f38[4] = (dVar20 - dVar93) + dVar48;
      local_1f38[5] = local_1f38[5] + dVar93;
      local_1f38[6] = local_1f38[6] - dVar48;
      local_1ec8 = local_1ec8 + dVar48;
      local_13c0._8_8_ = (double)local_13c0._8_8_ + dVar43;
      local_1368 = local_1368 + dVar43;
      local_13a8 = local_13a8 - dVar43;
      dStack_13a0 = dStack_13a0 - dVar43;
      dStack_1258 = dStack_1258 + dVar70;
      local_1208 = local_1208 + dVar70;
      dStack_1248 = dStack_1248 - dVar70;
      dStack_1240 = dStack_1240 - dVar70;
      local_11a8 = local_11a8 + dVar27;
      local_1158 = local_1158 + dVar27;
      local_1198 = local_1198 - dVar27;
      dStack_1190 = dStack_1190 - dVar27;
      local_cd8 = local_cd8 + dVar118;
      local_c88 = local_c88 + dVar118;
      local_cc8 = local_cc8 - dVar118;
      dStack_cc0 = dStack_cc0 - dVar118;
      local_828[4] = ((double)local_1e28._0_8_ - dVar28) + dVar92;
      local_828[5] = local_828[5] + dVar28;
      local_828[6] = local_828[6] - dVar92;
      dStack_7b8 = dStack_7b8 + dVar92;
      local_1ad8 = local_1df8[9];
      dStack_1ad0 = 0.0;
      local_1bf8 = exp(dVar44);
      dVar20 = local_1df8[10];
      local_19d8 = exp((double)local_1cf8._0_8_);
      dVar59 = local_828[9];
      dVar46 = local_828[3];
      dVar45 = local_f70;
      dVar26 = local_f88;
      dVar25 = local_fa0;
      dVar24 = local_1050;
      dVar23 = local_1228;
      dVar21 = local_1440;
      dVar41 = dStack_1458;
      dVar29 = local_1470;
      dVar28 = local_1df8[9];
      dVar73 = local_1df8[6];
      dVar70 = dStack_1ef0;
      dVar27 = local_1f38[3];
      local_1af8 = local_1c98;
      dStack_1af0 = dStack_1c90;
      local_1e18 = local_1438;
      local_1ae8 = local_1260;
      local_19c8 = dStack_1248;
      local_1c28 = local_1230;
      local_1e28._0_8_ = local_1038;
      local_1d18 = local_1020;
      local_1d08 = local_1018;
      local_1cf8._0_8_ = local_f68;
      local_19f8 = local_1cb8;
      dStack_19f0 = 0.0;
      local_1a08 = dStack_1ca0;
      dStack_1a00 = 0.0;
      local_19e8._0_8_ = exp(dVar44);
      dVar22 = local_1df8[0xf];
      local_19e8._8_8_ = extraout_XMM0_Qb_03;
      auVar37._0_8_ = exp(local_1e58);
      dVar109 = local_19f8 + local_1a08;
      auVar37._8_8_ = local_19d8;
      dVar43 = (double)local_19e8._0_8_ * 20000000.0;
      dVar118 = local_1bf8 * 1000000.0;
      auVar117._8_8_ = dVar118;
      auVar117._0_8_ = dVar43;
      auVar116 = divpd(auVar117,auVar37);
      dVar60 = local_1df8[4] * dVar22;
      dVar61 = local_1df8[3] * dVar20;
      dVar47 = dVar73 * dVar28;
      dVar93 = local_1ad8 * dVar113;
      dVar62 = dStack_1cd0 + local_1af8;
      dVar80 = auVar116._0_8_;
      dVar81 = auVar116._8_8_;
      dStack_1ef0 = dVar43 * dVar47 - dVar60 * dVar80;
      dVar72 = dVar118 * dVar93 - dVar61 * dVar81;
      dVar101 = local_1ad8 * dVar118;
      local_1260 = local_1ae8 + dVar101;
      local_1ad8 = local_c18;
      local_1ae8 = local_c00;
      local_1e58 = local_828[4];
      local_19f8 = local_1200;
      local_19d8 = local_1048;
      local_19e8._0_8_ = local_ff0;
      local_1bf8 = local_c28;
      local_1af8 = local_bd0;
      local_1228 = dVar101 + dVar23;
      dVar113 = dVar118 * dVar113;
      local_1050 = dVar24 + dVar113;
      local_1018 = dVar113 + local_1d08;
      dVar28 = dVar28 * dVar43;
      dVar73 = dVar73 * dVar43;
      dVar43 = dVar43 * dVar76 * dVar47 -
               (dVar76 - ((local_1cc8 + dStack_1c70) - (dStack_1ca0 + local_1cb8)) * dVar42) *
               dVar80 * dVar60;
      dVar118 = dVar118 * dVar76 * dVar93 - (dVar76 - (dVar62 - dVar109) * dVar42) * dVar81 * dVar61
      ;
      local_828[3] = dVar46 + dVar118;
      local_828[7] = local_828[7] - dVar92;
      local_1f38[3] = dVar27 + dVar72;
      auStack_1f00 = (undefined1  [8])((double)auStack_1f00 - dVar48);
      dVar22 = dVar22 * -dVar80;
      dVar27 = local_1df8[4] * -dVar80;
      dVar20 = dVar20 * -dVar81;
      local_1470 = dVar29 + dVar20;
      dStack_1458 = dVar41 - dVar20;
      local_1440 = dVar21 - dVar20;
      local_1438 = dVar20 + local_1e18;
      local_f68 = local_1df8[3] * -dVar81;
      local_fa0 = dVar25 + local_f68;
      local_f88 = dVar26 - local_f68;
      local_f70 = dVar45 - local_f68;
      local_f68 = local_f68 + (double)local_1cf8._0_8_;
      local_1f38[4] = local_1f38[4] + dStack_1ef0;
      local_1f38[6] = (local_1f38[6] - dVar72) - dStack_1ef0;
      dStack_1ec0 = dStack_1ec0 + dStack_1ef0;
      dStack_1ef0 = (dVar70 - dVar72) - dStack_1ef0;
      local_1ee8 = (undefined1  [8])(dVar72 + (double)local_1ee8);
      local_13c0._8_8_ = (double)local_13c0._8_8_ + dVar22;
      local_13a8 = local_13a8 - dVar22;
      local_1360 = local_1360 + dVar22;
      local_1390 = local_1390 - dVar22;
      dStack_1258 = dStack_1258 + dVar28;
      dStack_1248 = (local_19c8 - dVar101) - dVar28;
      local_1200 = local_1200 + dVar28;
      local_1230 = (local_1c28 - dVar101) - dVar28;
      local_1048 = local_1048 + dVar73;
      local_ff0 = local_ff0 + dVar73;
      local_1038 = ((double)local_1e28._0_8_ - dVar113) - dVar73;
      local_1020 = (local_1d18 - dVar113) - dVar73;
      local_c28 = local_c28 + dVar27;
      local_c18 = local_c18 - dVar27;
      local_bd0 = local_bd0 + dVar27;
      local_c00 = local_c00 - dVar27;
      local_828[4] = local_828[4] + dVar43;
      local_828[6] = (local_828[6] - dVar118) - dVar43;
      local_7d8._0_8_ = dVar118 + (double)local_7d8._0_8_;
      local_828[9] = (dVar59 - dVar118) - dVar43;
      dStack_7b0 = dStack_7b0 + dVar43;
      local_1cf8._8_8_ = 0;
      local_1cf8._0_8_ = local_1df8[6];
      local_19c8 = local_1df8[0xb];
      dStack_19c0 = 0.0;
      local_1af8 = exp((double)local_1ab8._0_8_);
      dVar73 = local_1df8[0xc];
      dVar27 = local_1df8[4];
      local_1bf8 = exp(local_1948);
      uVar10 = local_7d8._8_8_;
      dVar46 = local_828[4];
      dVar45 = local_e28;
      dVar26 = local_e38;
      dVar25 = dStack_ea8;
      dVar24 = dStack_eb0;
      dVar23 = local_1220;
      dVar21 = dStack_1248;
      dVar41 = local_1378;
      dVar29 = local_1380;
      dVar28 = local_13a8;
      uVar8 = local_13c0._8_8_;
      dVar70 = local_1df8[7];
      dVar22 = dStack_1ee0;
      dVar118 = local_1f38[4];
      local_1c28 = local_1cc8;
      dStack_1c20 = dStack_1cc0;
      local_1ad8 = local_1cb8;
      dStack_1ad0 = dStack_1cb0;
      local_1ae8 = dStack_1c90;
      dStack_1ae0 = local_1c88;
      local_1948 = local_1c88;
      dStack_1940 = dStack_1c80;
      local_1ab8._0_8_ = dStack_1258;
      local_1e28._0_8_ = local_1218;
      local_1d18 = local_ee8;
      local_1d08 = local_ed8;
      local_1e18 = local_e00;
      local_1e58 = local_df8;
      local_19d8 = local_1df8[3];
      dStack_19d0 = 0.0;
      local_1aa8 = exp(local_1aa8);
      dVar20 = local_1df8[0xd];
      dVar43 = local_1df8[4];
      dVar59 = exp(local_1d48);
      dVar113 = local_1df8[7];
      dVar101 = dVar71 + local_1a98;
      auVar54._8_8_ = dVar59;
      auVar54._0_8_ = local_1bf8;
      dVar62 = local_1af8 * 150000000.0;
      dVar80 = local_1aa8 * 13200000.0;
      auVar90._8_8_ = dVar80;
      auVar90._0_8_ = dVar62;
      auVar116 = divpd(auVar90,auVar54);
      dVar60 = dVar27 * dVar73;
      dVar61 = dVar20 * dVar43;
      local_1218 = dVar62 * local_19c8;
      dVar109 = local_19c8 * (double)local_1cf8._0_8_;
      dVar47 = dVar70 * local_19d8;
      dVar59 = local_1ae8 + local_1ad8;
      dVar93 = local_1c28 + local_1948;
      dVar70 = dVar70 * dVar80;
      dVar48 = dVar80 * local_19d8;
      dVar72 = auVar116._0_8_;
      dVar92 = auVar116._8_8_;
      dVar20 = dVar20 * -dVar92;
      dVar43 = dVar43 * -dVar92;
      dStack_1258 = (double)local_1ab8._0_8_ + local_1218;
      local_19c8 = dStack_13a0;
      local_1948 = local_11b0;
      local_1aa8 = dStack_1190;
      local_1a98 = local_d90;
      local_1d48 = local_d70;
      local_1ad8 = local_11a8;
      local_1ae8 = local_1160;
      local_1c28 = local_d88;
      local_1ab8._0_8_ = local_d40;
      dStack_1248 = dVar21 - local_1218;
      local_1220 = dVar23 - local_1218;
      local_1218 = local_1218 + (double)local_1e28._0_8_;
      dStack_ea8 = (double)local_1cf8._0_8_ * dVar62;
      local_ee8 = local_1d18 + dStack_ea8;
      local_ed8 = local_1d08 - dStack_ea8;
      dStack_eb0 = dVar24 - dStack_ea8;
      dStack_ea8 = dStack_ea8 + dVar25;
      dVar21 = dVar101 * dVar62 * dVar109 - (dVar101 - (dVar93 - dVar59) * dVar42) * dVar72 * dVar60
      ;
      dVar23 = (dVar71 + dStack_1a90) * dVar80 * dVar47 -
               ((dVar71 + dStack_1a90) -
               ((dStack_1c80 + local_1cc8) - (dStack_1cb0 + dStack_1cd0)) * dVar42) * dVar92 *
               dVar61;
      local_7d8._8_8_ = (double)uVar10 - dVar21;
      dVar24 = dVar109 * dVar62 - dVar60 * dVar72;
      dVar25 = dVar47 * dVar80 - dVar61 * dVar92;
      dStack_1ee0 = dVar22 - dVar24;
      dVar73 = dVar73 * -dVar72;
      local_13a8 = dVar28 - dVar73;
      local_1380 = dVar29 - dVar73;
      local_1378 = dVar73 + dVar41;
      dVar27 = -dVar72 * dVar27;
      local_e38 = dVar26 + dVar27;
      local_e28 = dVar45 - dVar27;
      local_e00 = local_1e18 - dVar27;
      local_df8 = dVar27 + local_1e58;
      local_1f38[3] = local_1f38[3] - dVar25;
      local_1f38[4] = dVar25 + dVar118 + dVar24;
      local_1f38[6] = local_1f38[6] - dVar24;
      auStack_1f00 = (undefined1  [8])((double)auStack_1f00 - dVar25);
      local_1ed8 = dVar24 + local_1ed8;
      dStack_1ed0 = dVar25 + dStack_1ed0;
      local_1470 = local_1470 - dVar70;
      dStack_1468 = dStack_1468 + dVar70;
      local_1420 = local_1420 + dVar70;
      local_1450 = local_1450 - dVar70;
      local_13c0._0_8_ = (double)local_13c0._0_8_ - dVar20;
      local_13c0._8_8_ = (double)uVar8 + dVar73 + dVar20;
      local_1370 = local_1370 + dVar20;
      dStack_13a0 = dStack_13a0 - dVar20;
      local_11b0 = local_11b0 - dVar48;
      local_11a8 = local_11a8 + dVar48;
      local_1160 = local_1160 + dVar48;
      dStack_1190 = dStack_1190 - dVar48;
      local_d90 = local_d90 - dVar43;
      local_d88 = local_d88 + dVar43;
      local_d40 = local_d40 + dVar43;
      local_d70 = local_d70 - dVar43;
      local_828[3] = local_828[3] - dVar23;
      local_828[4] = dVar46 + dVar21 + dVar23;
      local_828[6] = local_828[6] - dVar21;
      local_828[7] = local_828[7] - dVar23;
      local_7c8 = dVar21 + local_7c8;
      dStack_7c0 = dVar23 + dStack_7c0;
      local_1cf8._0_8_ = local_1df8[0];
      dVar23 = local_1df8[0] * local_1df8[7];
      dVar26 = exp(local_708);
      dVar20 = local_1df8[9];
      dVar118 = local_1df8[1];
      local_1948 = local_1df8[1] * local_1df8[9];
      local_1af8 = exp(local_16b8);
      dVar60 = local_828[9];
      dVar59 = local_828[7];
      dVar46 = local_828[1];
      dVar25 = local_1030;
      dVar24 = local_1060;
      dVar21 = local_1180;
      dVar41 = local_11c0;
      dVar28 = dStack_15a0;
      dVar73 = local_15b0;
      uVar8 = auStack_15e0._0_8_;
      dVar70 = local_15f0[1];
      dVar29 = local_1df8[9];
      auVar7 = auStack_1f00;
      local_1ad8 = dVar75 - ((dStack_1ce0 + dStack_1ca0) - (local_1ce8 + dStack_1cb0)) * dVar42;
      dStack_1ad0 = (double)uVar9;
      local_19c8 = local_1f38[0];
      local_1e58 = local_1f38[1];
      local_16b8 = dStack_1ef0;
      local_708 = local_16a0[1];
      local_1c28 = local_1690;
      local_1ab8._0_8_ = local_1660;
      local_1aa8 = local_1650;
      local_1a98 = local_11c8;
      local_1d48 = dStack_1190;
      local_1e28._0_8_ = local_1068;
      local_1d18 = local_1020;
      local_1d08 = local_828[0];
      local_1bf8 = exp(dVar44);
      local_1e18 = local_1df8[1];
      local_1ae8 = local_1df8[0x10];
      dStack_1ae0 = 0.0;
      dVar45 = local_1df8[1] * local_1df8[0x10];
      dVar61 = exp(dVar78);
      dVar27 = dStack_1ca0;
      dVar22 = dStack_1cb0;
      dVar43 = local_1eb8;
      auVar104._8_8_ = dVar61;
      auVar104._0_8_ = local_1af8;
      dVar26 = dVar26 * 0.5;
      dVar92 = local_1bf8 * 40000000.0;
      auVar65._8_8_ = dVar92;
      auVar65._0_8_ = dVar26;
      auVar116 = divpd(auVar65,auVar104);
      local_16e8._8_8_ = auVar116._8_8_;
      dVar61 = -auVar116._0_8_;
      dVar71 = -(double)local_16e8._8_8_;
      dVar93 = dVar26 * dVar23 + local_1948 * dVar61;
      dVar101 = dVar75 * dVar26 * dVar23 - local_1ad8 * auVar116._0_8_ * local_1948;
      local_1f38[0] = local_19c8 - dVar93;
      local_1f38[1] = local_1e58 + dVar93;
      dStack_1ef0 = dVar93 + local_16b8;
      dVar113 = dVar113 * dVar26;
      local_16a0[1] = local_708 - dVar113;
      local_1690 = local_1c28 + dVar113;
      local_1660 = (double)local_1ab8._0_8_ - dVar113;
      local_1650 = dVar113 + local_1aa8;
      local_1cf8._0_8_ = (double)local_1cf8._0_8_ * dVar26;
      local_11c8 = local_1a98 - (double)local_1cf8._0_8_;
      dVar118 = dVar118 * dVar61;
      local_1068 = (double)local_1e28._0_8_ - dVar118;
      dVar109 = dVar118 + local_1d18;
      local_828[0] = local_1d08 - dVar101;
      dVar20 = dVar20 * dVar61;
      dVar113 = local_1ae8 * dVar71;
      local_15f0[1] = dVar70 - dVar20;
      auStack_15e0._0_8_ = (double)uVar8 + dVar20 + dVar113;
      local_15b0 = (dVar73 - dVar20) - dVar113;
      dStack_15a0 = (dVar28 + dVar20) - dVar113;
      local_1568 = local_1568 + dVar113;
      dVar20 = dVar92 * dVar29;
      local_11c0 = dVar41 + (double)local_1cf8._0_8_ + dVar20;
      local_16d8 = dVar45 * dVar71;
      local_1d48 = (local_1d48 - (double)local_1cf8._0_8_) - dVar20;
      local_1cf8._0_8_ = ((double)local_1cf8._0_8_ + dVar21) - dVar20;
      local_1148 = dVar20 + local_1148;
      local_1a08 = local_fe8;
      dVar71 = local_1e18 * dVar71;
      local_b90 = local_b90 + dVar71;
      local_b60 = local_b60 - dVar71;
      dStack_b50 = dStack_b50 - dVar71;
      local_718 = local_1e68 * dVar92;
      dStack_710 = dStack_1e60;
      local_b18 = dVar71 + local_b18;
      local_16e8._0_8_ =
           (double)local_16e8._8_8_ *
           (local_1e68 - ((dStack_1ce0 + local_1c68) - (dStack_1cb0 + dStack_1ca0)) * dVar42) *
           dVar45;
      local_1a18 = dStack_7a8;
      local_19d8 = local_1df8[10];
      dStack_19d0 = 0.0;
      local_1e58 = local_1f38[1];
      local_19f8 = dStack_1ef0;
      dStack_19f0 = dVar92;
      auStack_1f00 = (undefined1  [8])((double)auVar7 - dVar93);
      local_1e18 = exp(local_678);
      dVar41 = local_1df8[9];
      local_1888 = exp(local_6f8);
      dVar20 = local_1df8[0x13];
      local_16c8 = local_1828 - ((dVar27 + dVar27) - (dVar22 + local_1c98)) * dVar42;
      uStack_16c0 = uStack_1820;
      local_19e8._0_8_ = local_1ee8;
      local_1bf8 = local_1178;
      local_19c8 = local_1018;
      local_16b8 = local_f80;
      local_678 = local_f70;
      local_708 = local_f68;
      local_1c28 = (double)local_7d8._0_8_;
      local_1958 = local_1df8[7];
      uStack_1950 = 0;
      dVar70 = exp(local_1c18);
      local_16f8._0_8_ = exp(local_6e8);
      dVar26 = local_950;
      dVar23 = local_10d8;
      dVar27 = local_1ca8;
      dVar22 = dStack_1cb0;
      local_16f8._8_8_ = extraout_XMM0_Qb_04;
      local_1948 = local_1e78 - ((dStack_1c50 + dStack_1cb0) - (local_1ca8 + dStack_1c50)) * dVar42;
      dStack_1940 = dStack_1e70;
      local_1aa8 = local_1188;
      local_1d18 = local_948;
      local_1d08 = local_828[8];
      local_1a98 = local_1df8[0x14];
      dStack_1a90 = 0.0;
      local_1e18 = local_1e18 * 2.46;
      dStack_1e10 = dVar70 * 15000000.0;
      local_1708 = local_1ef8;
      uStack_1700 = 0;
      local_6f8 = dStack_1e10 * dVar20;
      dVar61 = local_10e0 + local_6f8;
      local_1ad8 = dStack_1e10;
      dStack_1ad0 = dStack_1e10;
      dStack_6f0 = dStack_1e10;
      local_1ab8._0_8_ = exp(local_1c18);
      local_668 = exp(local_668);
      dVar45 = local_8a0;
      dVar73 = local_1df8[8];
      dVar113 = local_1df8[7];
      dVar72 = local_1e78 - ((local_1c48 + dVar22) - (dVar27 + local_1c48)) * dVar42;
      local_1c18 = local_898;
      local_6e8 = local_1df8[3];
      dStack_6e0 = 0.0;
      local_1af8 = exp(dVar44);
      dVar21 = local_1df8[0xb];
      dVar27 = local_1df8[4];
      dVar22 = local_1df8[1];
      local_1ae8 = local_1df8[1] * local_1df8[4];
      dStack_1ae0 = 0.0;
      dVar71 = exp((double)local_1e88._0_8_);
      dVar28 = local_1df8[8];
      dVar70 = local_1df8[3];
      local_19b8 = local_19b8 * dVar71;
      local_1e28._0_8_ =
           local_1e68 -
           (((dStack_1ce0 + local_1cc8 + dStack_1c90) - (dStack_1cd0 + local_1ca8)) + -1.0) * dVar42
      ;
      local_1e28._8_8_ = dStack_1e60;
      dVar29 = dVar29 * local_1df8[7];
      dVar71 = dVar92 * dVar29 + local_16d8;
      dVar47 = dVar29 * local_718 - (double)local_16e8._0_8_;
      local_1e88._0_8_ = local_1f38[3];
      local_1eb8 = dVar71 + dVar43;
      dVar92 = dVar92 * local_1df8[7];
      local_1060 = dVar24 + dVar118 + dVar92;
      local_fe8 = dVar92 + local_1a08;
      dStack_7a8 = dVar47 + local_1a18;
      auVar55._8_8_ = local_16f8._0_8_;
      auVar55._0_8_ = local_1888;
      auVar6._8_8_ = dStack_1e10;
      auVar6._0_8_ = local_1e18;
      auVar116 = divpd(auVar6,auVar55);
      dVar75 = auVar116._0_8_;
      dVar43 = local_1828 * local_1e18 * local_19d8 * local_1df8[7] -
               local_16c8 * dVar75 * dVar41 * dVar41;
      dVar62 = auVar116._8_8_;
      dVar29 = local_1e18 * local_19d8 * local_1df8[7] - dVar41 * dVar41 * dVar75;
      dVar24 = dStack_1e10 * dVar20 * local_1df8[8] - dVar20 * local_1958 * dVar62;
      dStack_1ef0 = dVar29 + dVar29 + (local_19f8 - dVar71);
      local_1ee8 = (undefined1  [8])((double)local_19e8._0_8_ - dVar29);
      dVar48 = local_19d8 * local_1e18;
      local_1178 = local_1bf8 - dVar48;
      local_1180 = dVar48 + dVar48 + (double)local_1cf8._0_8_;
      dVar41 = dVar75 * -2.0 * dVar41;
      local_1030 = ((dVar25 - dVar118) - dVar92) - dVar41;
      local_1018 = local_19c8 - dVar41;
      local_1020 = dVar41 + dVar41 + (dVar109 - dVar92);
      dVar118 = local_1e18 * local_1958;
      local_f80 = local_16b8 - dVar118;
      local_f68 = local_708 - dVar118;
      local_f70 = dVar118 + dVar118 + local_678;
      local_7d8._0_8_ = local_1c28 - dVar43;
      local_828[9] = dVar43 + dVar43 + ((dVar101 + dVar60) - dVar47);
      dVar75 = dVar20 * local_1df8[8] * local_1e78 * local_1ad8 -
               dVar20 * local_1958 * dVar62 * local_1948;
      dVar20 = dVar20 * -dVar62;
      local_948 = local_1ad8 * local_1df8[8] + -dVar62 * local_1958;
      auVar66._8_8_ = local_19b8;
      auVar66._0_8_ = local_668;
      dVar92 = (double)local_1ab8._0_8_ * 9000000.0;
      dVar109 = local_1af8 * 28000000.0;
      auVar111._8_8_ = dVar109;
      auVar111._0_8_ = dVar92;
      auVar116 = divpd(auVar111,auVar66);
      dVar41 = dVar73 * local_6e8;
      dVar62 = auVar116._0_8_;
      dVar78 = auVar116._8_8_;
      dVar25 = dVar92 * local_1a98 * local_1df8[8] - local_1a98 * local_1958 * dVar62;
      dVar60 = dVar109 * dVar41 - dVar21 * local_1ae8 * dVar78;
      local_950 = dVar26 + local_948;
      local_948 = local_1d18 - local_948;
      dVar118 = local_1e78 * dVar92 * local_1a98 * local_1df8[8] -
                dVar72 * dVar62 * local_1a98 * local_1958;
      dVar26 = -dVar78;
      local_1188 = local_1a98 * -dVar62;
      dStack_1190 = (local_1d48 - dVar48) + dVar20 + local_1188;
      local_1188 = (local_1aa8 - dVar20) - local_1188;
      local_10e0 = dVar61 + dVar92 * local_1a98;
      local_898 = local_1df8[8] * dVar92 + dVar113 * -dVar62;
      local_8a0 = dVar45 + local_898;
      local_898 = local_1c18 - local_898;
      local_828[7] = (((dVar59 - dVar101) - dVar47) - dVar43) + dVar75 + dVar118;
      dVar43 = ((local_1708 - dVar24) - dVar25) - dVar60;
      dVar20 = dVar41 * local_1e68 * dVar109 -
               dVar21 * local_1ae8 * dVar78 * (double)local_1e28._0_8_;
      local_1f38[1] = local_1e58 + dVar71 + dVar60;
      local_1f38[3] = local_1f38[3] - dVar60;
      local_1f38[4] = local_1f38[4] + dVar60;
      unique0x10005d6a = SUB84(dVar43,0);
      auStack_1f00 = (undefined1  [8])
                     (((((double)auVar7 - dVar93) - dVar71) - dVar29) + dVar24 + dVar25);
      unique0x10005d6e = (int)((ulong)dVar43 >> 0x20);
      dStack_1ee0 = dStack_1ee0 + dVar60;
      dVar43 = dVar27 * dVar26 * dVar21;
      auStack_15e0._0_8_ = (double)auStack_15e0._0_8_ + dVar43;
      local_15d0 = local_15d0 - dVar43;
      dStack_15c8 = dStack_15c8 + dVar43;
      local_15a8 = local_15a8 - dVar43;
      local_1590 = dVar43 + local_1590;
      dVar73 = dVar73 * dVar109;
      local_1480 = local_1480 + dVar73;
      local_1470 = local_1470 - dVar73;
      dStack_1468 = dStack_1468 + dVar73;
      local_1448 = local_1448 - dVar73;
      local_1430 = dVar73 + local_1430;
      dVar21 = dVar22 * dVar26 * dVar21;
      local_13d0 = local_13d0 + dVar21;
      local_13c0._0_8_ = (double)local_13c0._0_8_ - dVar21;
      local_13c0._8_8_ = (double)local_13c0._8_8_ + dVar21;
      local_1398 = local_1398 - dVar21;
      local_1380 = dVar21 + local_1380;
      dVar109 = dVar109 * local_1df8[3];
      local_1110 = local_1110 + dVar109;
      local_1100 = local_1100 - dVar109;
      local_10f8 = local_10f8 + dVar109;
      local_10d8 = ((dVar23 - local_6f8) - dVar92 * local_1a98) - dVar109;
      local_10c0 = dVar109 + local_10c0;
      dVar43 = local_1df8[1] * dVar26 * local_1df8[4];
      local_f00 = local_f00 + dVar43;
      local_ef0 = local_ef0 - dVar43;
      local_ee8 = local_ee8 + dVar43;
      local_ec8 = local_ec8 - dVar43;
      dStack_eb0 = dVar43 + dStack_eb0;
      local_828[1] = dVar46 + dVar101 + dVar47 + dVar20;
      local_828[3] = local_828[3] - dVar20;
      local_828[4] = local_828[4] + dVar20;
      local_828[8] = ((local_1d08 - dVar75) - dVar118) - dVar20;
      local_7d8._8_8_ = dVar20 + (double)local_7d8._8_8_;
      local_16c8 = exp(dVar44);
      local_1a08 = local_1df8[5];
      dStack_1a00 = 0.0;
      local_19f8 = local_1df8[0xb];
      dStack_19f0 = 0.0;
      local_1a18 = exp((double)local_1c38._0_8_);
      uVar10 = local_7d8._8_8_;
      dVar72 = local_828[8];
      dVar71 = local_828[5];
      dVar61 = dStack_eb0;
      dVar45 = local_ec8;
      dVar25 = local_ee0;
      dVar23 = local_ef0;
      dVar73 = local_1df8[8];
      dVar22 = dStack_1ee0;
      dVar20 = local_1f38[3];
      local_1888 = local_1e68 - ((dStack_1cc0 + dStack_1c90) - (dStack_1cd0 + local_1ca8)) * dVar42;
      dStack_1880 = dStack_1e60;
      local_1e18 = local_1f38[5];
      local_19e8._0_8_ = local_1470;
      local_19d8 = local_1460;
      local_1bf8 = local_1448;
      local_1af8 = local_1430;
      local_1ad8 = local_1310;
      local_1ae8 = local_1300;
      local_19c8 = local_12e8;
      local_1948 = local_12d0;
      local_1cf8._8_8_ = 0;
      local_1cf8._0_8_ = local_1df8[0];
      local_1d18 = local_1df8[3];
      local_16b8 = local_1100;
      local_1d08 = local_10f0;
      local_1c38._0_8_ = local_10d8;
      local_1828 = local_10c0;
      local_1c18 = local_828[3];
      local_1e88._0_8_ = exp(dVar44);
      local_1d48 = local_1df8[1];
      dStack_1d40 = 0.0;
      local_708 = local_1df8[9];
      uStack_700 = 0;
      dVar92 = exp(local_1e38);
      dVar60 = local_1020;
      dVar59 = local_1028;
      dVar46 = local_1068;
      dVar26 = local_1118;
      dVar24 = dStack_15a0;
      uVar8 = auStack_15e0._0_8_;
      dVar113 = local_1df8[5];
      dVar27 = dStack_1ef0;
      dVar75 = local_1ce8 + local_1ca8;
      dVar62 = dStack_1ce0 + dStack_1ca0;
      local_6f8 = local_1f38[0];
      local_678 = local_1f38[1];
      local_6e8 = local_16a0[1];
      local_668 = local_1690;
      local_1c28 = local_1658;
      local_1ab8._0_8_ = local_1650;
      local_1aa8 = local_15f0[1];
      local_1a98 = local_15a8;
      local_1e78 = local_1110;
      local_1e28._0_8_ = local_10d0;
      local_1e38 = local_1060;
      local_1e58 = local_828[0];
      local_19b8 = local_828[1];
      local_1958 = exp(dVar44);
      local_16d8 = local_1df8[7];
      uStack_16d0 = 0;
      auVar38._0_8_ = exp(dVar105);
      dVar21 = local_1ca8;
      dVar41 = local_1df8[9];
      dVar29 = local_1df8[8];
      auVar38._8_8_ = local_1a18;
      dVar118 = local_1958 * 30000000.0;
      dVar43 = local_16c8 * 12000000.0;
      auVar56._8_8_ = dVar43;
      auVar56._0_8_ = dVar118;
      auVar116 = divpd(auVar56,auVar38);
      dVar101 = auVar116._0_8_;
      dVar109 = auVar116._8_8_;
      local_1430 = dVar43 * dVar28;
      local_1470 = (double)local_19e8._0_8_ - local_1430;
      local_1460 = local_19d8 + local_1430;
      local_1448 = local_1bf8 - local_1430;
      local_1430 = local_1430 + local_1af8;
      dVar47 = local_19f8 * -dVar109;
      local_1310 = local_1ad8 - dVar47;
      local_1300 = local_1ae8 + dVar47;
      local_12d0 = dVar47 + local_1948;
      local_10c0 = dVar43 * local_1d18;
      local_1100 = local_16b8 - local_10c0;
      local_10f0 = local_1d08 + local_10c0;
      local_10d8 = (double)local_1c38._0_8_ - local_10c0;
      local_10c0 = local_10c0 + local_1828;
      dStack_eb0 = local_1a08 * -dVar109;
      local_ef0 = dVar23 - dStack_eb0;
      local_ee0 = dVar25 + dStack_eb0;
      local_ec8 = dVar45 - dStack_eb0;
      dStack_eb0 = dStack_eb0 + dVar61;
      dVar23 = -dVar101 * dVar113;
      dStack_1190 = dStack_1190 + dVar23;
      local_1188 = local_1188 - dVar23;
      local_10e0 = local_10e0 + dVar113 * dVar118;
      dStack_1940 = dVar28 * dVar70;
      dVar78 = dStack_1940 * local_1e68 * dVar43 - local_19f8 * local_1a08 * dVar109 * local_1888;
      local_16b8 = dVar118 * local_1df8[8] * dVar113 - dVar113 * local_16d8 * dVar101;
      dStack_16b0 = dVar43 * dStack_1940 - local_19f8 * local_1a08 * dVar109;
      local_1f38[3] = dVar20 - dStack_16b0;
      local_1f38[5] = local_1e18 + dStack_16b0;
      dStack_1ee0 = dStack_16b0 + dVar22;
      local_828[3] = local_1c18 - dVar78;
      local_828[5] = dVar71 + dVar78;
      local_7d8._8_8_ = dVar78 + (double)uVar10;
      auStack_1f00 = (undefined1  [8])((double)auStack_1f00 + local_16b8);
      dVar80 = local_1ef8 - dStack_16b0;
      local_1948 = local_1df8[8] * dVar113 * local_1e68 * dVar118 -
                   dVar101 * (local_1e68 -
                             ((dStack_1cc0 + dStack_1cb0) - (dStack_1cc0 + local_1ca8)) * dVar42) *
                   dVar113 * local_16d8;
      dVar43 = dVar118 * local_1df8[8] + local_16d8 * -dVar101;
      local_12e8 = (local_19c8 - dVar47) - dVar43;
      local_12f0 = dVar43 + local_12f0;
      local_828[7] = local_828[7] + local_1948;
      local_828[8] = dVar72 - dVar78;
      local_1c38._0_8_ = local_10d8;
      local_1ef8 = dVar80;
      local_2138._0_8_ = exp(local_1be8);
      dVar25 = local_1df8[0x10];
      local_1e18 = local_1df8[1];
      dStack_1e10 = 0.0;
      dVar93 = exp(dVar79);
      dVar48 = dStack_7a8;
      dVar47 = dStack_b50;
      dVar109 = local_b58;
      dVar101 = local_b90;
      dVar45 = local_1568;
      dVar70 = local_1df8[10];
      dVar28 = local_1df8[8];
      local_1828 = dVar94 - ((dStack_1ce0 + local_1c68) - (dVar21 + dStack_1ca0)) * dVar42;
      uStack_1820 = uVar9;
      local_1d18 = local_1098;
      local_1d08 = local_fe8;
      local_1c18 = local_b18;
      local_1be8 = exp(local_1be8);
      dVar21 = local_1df8[9];
      dVar43 = exp(local_578);
      dVar23 = local_1df8[0xb];
      dVar22 = local_1df8[8];
      local_578 = local_1ca8;
      auVar67._8_8_ = dVar43;
      auVar67._0_8_ = dVar92;
      local_1e88._0_8_ = (double)local_1e88._0_8_ * 70000000.0;
      dStack_1c20 = local_1be8 * 16000000.0;
      auVar39._8_8_ = dStack_1c20;
      auVar39._0_8_ = local_1e88._0_8_;
      auVar116 = divpd(auVar39,auVar67);
      dVar20 = auVar116._0_8_;
      dVar61 = auVar116._8_8_;
      local_1650 = (double)local_1e88._0_8_ * dVar73;
      dVar73 = dVar73 * (double)local_1cf8._0_8_;
      dVar71 = dVar70 * dVar28;
      dVar81 = (double)local_1e88._0_8_ * dVar73 - local_708 * local_1d48 * dVar20;
      local_1f38[0] = local_6f8 - dVar81;
      local_1f38[1] = local_678 + dVar81;
      local_16a0[1] = local_6e8 - local_1650;
      local_1690 = local_668 + local_1650;
      local_1658 = local_1c28 - local_1650;
      local_1650 = local_1650 + (double)local_1ab8._0_8_;
      dStack_1aa0 = -dVar61;
      dVar43 = local_708 * -dVar20;
      local_15f0[1] = local_1aa8 - dVar43;
      local_1a98 = local_1a98 - dVar43;
      dStack_1a90 = dVar43 + dVar24;
      local_1cf8._0_8_ = (double)local_1cf8._0_8_ * (double)local_1e88._0_8_;
      dVar24 = dStack_1c20 * dVar28;
      local_f78 = local_f78 - dVar24;
      local_f68 = local_f68 - dVar24;
      local_f70 = dVar24 + dVar24 + local_f70;
      local_1118 = dVar26 - (double)local_1cf8._0_8_;
      local_1e78 = local_1e78 + (double)local_1cf8._0_8_;
      local_10d0 = (double)local_1cf8._0_8_ + (double)local_1e28._0_8_;
      dVar92 = -dVar20 * local_1d48;
      local_1068 = dVar46 - dVar92;
      local_1e38 = local_1e38 + dVar92;
      local_1aa8 = dVar92 + dVar60;
      local_1be8 = local_1e68 * (double)local_1e88._0_8_ * dVar73 -
                   (local_1e68 - (dVar62 - dVar75) * dVar42) * dVar20 * local_708 * local_1d48;
      dVar20 = dVar94 * dStack_1c20 * dVar71 -
               (dVar94 - ((dStack_1ca0 + dStack_1ca0) - (local_1c98 + local_1ca8)) * dVar42) *
               dVar61 * dVar21 * dVar21;
      local_828[0] = local_1e58 - local_1be8;
      dVar95 = (dVar80 - dVar81) - local_16b8;
      local_19b8 = local_19b8 + local_1be8;
      local_1c38._0_8_ = ((double)local_1c38._0_8_ - (double)local_1cf8._0_8_) - dVar113 * dVar118;
      dVar97 = ((dVar72 - dVar78) - local_1be8) - local_1948;
      local_1be8 = local_828[9] + local_1be8;
      local_7d8._0_8_ = (double)local_7d8._0_8_ - dVar20;
      local_1c28 = dStack_1c20 * dVar70;
      local_10c8 = local_10c8 - local_1c28;
      local_1ab8._0_8_ = dVar61 * -2.0 * dVar21;
      local_1ab8._8_8_ = dVar61;
      local_1018 = local_1018 - (double)local_1ab8._0_8_;
      local_1e28._8_4_ = SUB84(dVar20,0);
      local_1e28._0_8_ = dVar20;
      local_1e28._12_4_ = (int)((ulong)dVar20 >> 0x20);
      dVar20 = local_1df8[8] * local_1df8[0xb];
      dStack_1ef0 = dVar81 + dVar27;
      local_15a8 = local_1a98;
      dStack_15a0 = dStack_1a90;
      local_1110 = local_1e78;
      local_1060 = local_1e38;
      local_1028 = dVar59 - dVar92;
      local_1020 = local_1aa8;
      local_828[1] = local_19b8;
      local_828[9] = local_1be8;
      local_1e88._8_8_ = dStack_1c20;
      auStack_15e0._0_8_ = (double)uVar8 + dVar43;
      local_1cf8._0_8_ = local_10d0;
      dVar73 = exp(dVar44);
      dVar73 = dVar73 * 9000000.0;
      local_1d48 = local_1df8[7];
      dStack_1d40 = 0.0;
      local_1e58 = local_1df8[7] * dVar23;
      dStack_1e50 = 0.0;
      dVar118 = exp(local_1e48);
      dVar118 = dVar73 / dVar118;
      local_1e48 = dStack_1cb0;
      dStack_1e40 = 0.0;
      dVar102 = dVar73 * dVar20 - local_1e58 * dVar118;
      local_668 = local_1e68 * dVar73 * dVar20 -
                  (local_1e68 - ((dStack_1c90 + dStack_1cb0) - (local_578 + dStack_1c90)) * dVar42)
                  * dVar118 * local_1e58;
      dStack_660 = dStack_1e60;
      dVar82 = (double)auStack_1f00 + dVar102;
      local_6e8 = dStack_1190 + -dVar118 * dVar23;
      local_678 = local_1188 - -dVar118 * dVar23;
      local_1e58 = local_10e0 + dVar23 * dVar73;
      dVar20 = dVar73 * dVar22 - dVar118 * local_1d48;
      local_ed0 = local_ed0 + dVar20;
      local_ec8 = local_ec8 - dVar20;
      local_578 = local_828[7] + local_668;
      uStack_570 = 0;
      dVar26 = exp(dVar44);
      local_6f8 = exp(dVar19);
      dVar113 = local_e18;
      dVar70 = local_1df8[8];
      local_1ae8 = local_1ca8;
      local_16b8 = local_e20;
      local_1af8 = exp(dVar44);
      dVar118 = local_1df8[0xe];
      dVar19 = exp(local_1bd8);
      local_1ad8 = local_ec8;
      local_19c8 = dStack_ea8;
      local_1948 = local_cb8;
      local_708 = local_c98;
      dVar24 = local_1e48 + local_1c88;
      dVar26 = dVar26 * 7000000.0;
      dStack_1ae0 = local_1af8 * 14000000.0;
      auVar112._8_8_ = dVar19;
      auVar112._0_8_ = local_6f8;
      auVar100._8_8_ = dStack_1ae0;
      auVar100._0_8_ = dVar26;
      auVar116 = divpd(auVar100,auVar112);
      dVar72 = local_1df8[0xb] * dVar118;
      dVar20 = local_1df8[0xc] * dVar70;
      dVar70 = dStack_1ae0 * dVar70;
      dVar19 = auVar116._0_8_;
      dVar60 = auVar116._8_8_;
      local_19d8 = -dVar19;
      dStack_19d0 = -dVar60;
      local_1e48 = dVar26 * dVar22 * local_1df8[0xc] - local_1df8[0xc] * local_1d48 * dVar19;
      dStack_1e40 = dStack_1ae0 * dVar20 - dVar72 * dVar60;
      dVar118 = dVar118 * dStack_19d0;
      dVar46 = local_1df8[0xb] * dStack_19d0;
      local_1a08 = local_1df8[0xc];
      dStack_1a00 = local_1df8[0xc];
      local_6f8 = dVar26 * local_1df8[0xc];
      local_10e0 = local_1e58 + local_6f8;
      dVar19 = dVar76 * dVar26 * dVar22 * local_1df8[0xc] -
               (dVar76 - (dVar24 - (local_1c88 + local_1ae8)) * dVar42) * dVar19 *
               local_1df8[0xc] * local_1d48;
      dVar20 = dVar76 * dStack_1ae0 * dVar20 -
               (dVar76 - ((local_1c78 + dStack_1c90) - (local_1c88 + local_1ae8)) * dVar42) * dVar60
               * dVar72;
      auVar3._8_4_ = SUB84(dVar20,0);
      auVar3._0_8_ = dVar19;
      auVar3._12_4_ = (int)((ulong)dVar20 >> 0x20);
      local_1ae8 = dStack_1ae0 * local_1df8[0xc];
      local_10c0 = local_10c0 + local_1ae8;
      local_10b8 = local_10b8 - local_1ae8;
      local_10a8 = local_10a8 + local_1ae8;
      local_19e8._8_4_ = SUB84(dStack_1ae0,0);
      local_19e8._0_8_ = dVar70;
      local_19e8._12_4_ = (int)((ulong)dStack_1ae0 >> 0x20);
      local_e00 = local_e00 + dVar70;
      local_df8 = local_df8 - dVar70;
      local_de8 = local_de8 + dVar70;
      local_7d8._8_8_ = (double)local_7d8._8_8_ + dVar20;
      local_7c8 = local_7c8 - dVar20;
      local_16d8 = dStack_1ee0 + dStack_1e40;
      local_16c8 = dStack_eb0 + dVar118;
      local_1a18 = local_e98 + dVar118;
      local_19f8 = local_ca0 + dVar46;
      local_1bf8 = local_c88 + dVar46;
      local_1af8 = local_1df8[3];
      local_1bd8 = local_1df8[9];
      local_1e58 = local_1df8[3] * local_1df8[9];
      dStack_1e50 = 0.0;
      local_1958 = local_1ed8;
      local_1888 = dStack_1e40;
      dStack_1880 = dStack_1e40;
      dStack_6f0 = dStack_1ae0;
      dVar75 = exp(local_1838);
      dVar24 = local_1df8[0xf];
      dStack_1190 = local_6e8 + local_1a08 * local_19d8;
      local_1188 = local_678 - local_1a08 * local_19d8;
      dVar20 = dVar26 * dVar22 + local_19d8 * local_1d48;
      local_e20 = local_16b8 + dVar20;
      dStack_1ee0 = local_16d8;
      local_1ed8 = local_1958 - local_1888;
      local_ec8 = local_1ad8 - dVar118;
      dStack_eb0 = local_16c8;
      dStack_ea8 = local_19c8 - dVar118;
      local_e98 = local_1a18;
      local_e18 = (dVar113 - dVar20) - (double)local_19e8._0_8_;
      local_cb8 = local_1948 - dVar46;
      dVar75 = dVar75 * 26750000.0;
      local_ca0 = local_19f8;
      local_1d48 = local_1df8[2];
      local_c98 = local_708 - dVar46;
      dVar26 = local_1df8[2] * local_1df8[0xf];
      local_c88 = local_1bf8;
      dVar20 = local_658 * dVar75;
      dVar113 = exp(local_1d38);
      dVar70 = dStack_1e40;
      dVar22 = local_1f38[2];
      dVar118 = local_1f38[1];
      dVar113 = dVar75 / dVar113;
      dVar78 = dVar20 * local_1e58 -
               (local_658 - ((dStack_1c70 + local_1cd8) - (dStack_1ca0 + dStack_1cd0)) * dVar42) *
               dVar113 * dVar26;
      dStack_1d40 = (double)(extraout_XMM0_Qb_05 ^ 0x8000000000000000);
      dVar79 = local_1e58 * dVar75 - dVar26 * dVar113;
      dVar80 = dVar71 * (double)local_1e88._8_8_ - dVar21 * dVar21 * dVar61;
      dVar96 = local_1f38[3] - dVar79;
      dVar24 = dVar24 * -dVar113;
      local_1bd8 = local_1bd8 * dVar75;
      dVar75 = dVar75 * local_1af8;
      local_1d48 = -dVar113 * local_1d48;
      dStack_2080 = auVar3._8_8_;
      local_1e88._0_8_ = dStack_2080;
      local_6e8 = dVar41;
      dStack_6e0 = dVar41;
      local_1838 = local_1e18 * dVar25;
      uStack_1830 = dStack_1e10;
      local_1e58 = dVar79;
      dStack_1e50 = dVar80;
      local_1e88._8_8_ = dVar78;
      local_1d38 = exp(local_6d8);
      dVar62 = exp(local_1d28);
      local_1d28 = local_1df8[9];
      dStack_1d20 = 0.0;
      local_658 = local_1df8[9] * local_1df8[9];
      dStack_650 = 0.0;
      local_2138._8_8_ = exp(local_248);
      dVar26 = local_1df8[0x11];
      local_2138._0_8_ = (double)local_2138._0_8_ * 12000000.0;
      local_2138._8_8_ = (double)local_2138._8_8_ * 4990000.0;
      dVar20 = local_6e8 * (double)local_2138._0_8_;
      local_1098 = local_1d18 + dVar20;
      dVar28 = dVar28 * (double)local_2138._0_8_;
      local_fe8 = local_1d08 + dVar28;
      local_1110 = local_1e78 + dVar20;
      local_1060 = local_1e38 + dVar28;
      local_10d0 = local_1c28 + local_1c28 + ((double)local_1cf8._0_8_ - dVar20);
      local_1028 = ((dVar59 - dVar92) - dVar28) - (double)local_1ab8._0_8_;
      local_1020 = (double)local_1ab8._0_8_ + (double)local_1ab8._0_8_ + (local_1aa8 - dVar28);
      local_10d8 = (((((double)local_1c38._0_8_ - dVar20) - local_1c28) - dVar23 * dVar73) -
                   local_6f8) - local_1ae8;
      local_1c38._0_8_ = local_1df8[1];
      dVar76 = local_1df8[1] * local_1df8[0x11];
      dVar74 = exp(dVar74);
      dVar92 = local_c88;
      dVar72 = local_cb0;
      dVar71 = local_cd8;
      dVar61 = local_ce0;
      dVar60 = local_1048;
      dVar59 = local_1390;
      dVar46 = local_1418;
      dVar23 = local_1c78;
      dVar21 = local_1df8[0xe];
      dVar28 = local_1df8[0xd];
      dVar73 = local_1df8[9];
      dVar20 = local_1df8[4];
      dVar113 = local_1df8[3];
      auVar68._8_8_ = dVar74;
      auVar68._0_8_ = dVar93;
      auVar116 = divpd(local_2138,auVar68);
      dVar74 = auVar116._0_8_;
      dVar94 = dVar94 * (double)local_2138._0_8_ * dVar29 * dVar41 -
               local_1828 * dVar74 * local_1838;
      dVar93 = auVar116._8_8_;
      dVar25 = dVar25 * -dVar74;
      local_15a8 = local_1a98 - dVar25;
      local_1568 = dVar45 + dVar25;
      local_1e18 = local_1e18 * -dVar74;
      local_b90 = dVar101 + local_1e18;
      local_b58 = dVar109 - local_1e18;
      dStack_b50 = dVar47 - local_1e18;
      local_b18 = local_1e18 + local_1c18;
      dStack_7a8 = dVar48 + dVar94;
      local_828[1] = local_19b8 + dVar94;
      local_828[7] = local_578 + dVar19;
      local_828[8] = ((((dVar97 - dVar94) - (double)local_1e28._0_8_) - local_668) - dVar19) -
                     dStack_2080;
      dVar19 = dVar29 * dVar41 * (double)local_2138._0_8_ - local_1838 * dVar74;
      dVar45 = local_658 * (double)local_2138._8_8_ - dVar76 * dVar93;
      local_1ef8 = ((((dVar95 - dVar19) - dVar80) - dVar102) - local_1e48) - dStack_1e40;
      auStack_1f00 = (undefined1  [8])(dVar82 + local_1e48);
      local_1f38[2] = local_1e58 + dVar22;
      dStack_1ef0 = (dVar80 + dVar80 + ((dVar81 + dVar27) - dVar19)) - local_1e58;
      local_1ee8 = (undefined1  [8])((double)local_1ee8 - dStack_1e50);
      local_1ec8 = dVar70 + local_1ec8;
      dStack_1ec0 = dVar79 + dStack_1ec0;
      dStack_1528 = dStack_1528 + dVar24;
      local_1520 = local_1520 - dVar24;
      local_14f0 = local_14f0 - dVar24;
      local_14c0 = dVar24 + local_14c0;
      dStack_1478 = dStack_1478 + local_1bd8;
      dVar24 = local_1470 - local_1bd8;
      dVar22 = local_1440 - local_1bd8;
      local_1410 = local_1bd8 + local_1410;
      local_1058 = local_1058 + dVar75;
      dVar70 = local_1050 - dVar75;
      dVar29 = local_1020 - dVar75;
      local_ff0 = dVar75 + local_ff0;
      local_c38 = local_c38 + local_1d48;
      local_c30 = local_c30 - local_1d48;
      local_c00 = local_c00 - local_1d48;
      local_bd0 = local_1d48 + local_bd0;
      local_828[2] = local_828[2] + dVar78;
      local_19b8 = local_828[3] - dVar78;
      dVar78 = ((double)local_1e28._0_8_ + (double)local_1e28._0_8_ + (local_1be8 - dVar94)) -
               dVar78;
      dStack_7b8 = (double)local_1e88._0_8_ + dStack_7b8;
      dStack_7b0 = (double)local_1e88._8_8_ + dStack_7b0;
      local_1e18 = dStack_1ca0;
      dStack_1e10 = 0.0;
      local_1cf8._0_8_ = local_1f38[4];
      local_1d48 = dStack_1468;
      local_1878 = local_1878 * (double)local_2138._8_8_ * local_658 -
                   dVar93 * (local_1878 -
                            ((dStack_1ce0 + dStack_1c60) - (dStack_1ca0 + dStack_1ca0)) * dVar42) *
                   dVar76;
      local_1f38[1] = dVar19 + dVar118 + dVar45;
      local_1eb8 = dVar19 + local_1eb8;
      dStack_1eb0 = dVar45 + dStack_1eb0;
      dVar26 = dVar26 * -dVar93;
      local_1e88._0_8_ = local_13c0._0_8_;
      local_1e38 = (double)local_13c0._8_8_;
      local_1e48 = local_1368;
      local_1e58 = local_828[4];
      auStack_15e0._0_8_ = dVar25 + (double)uVar8 + dVar43 + dVar26;
      dStack_15a0 = (dStack_1a90 - dVar25) - (dVar26 + dVar26);
      local_1560 = dVar26 + local_1560;
      dVar41 = ((double)local_2138._8_8_ + (double)local_2138._8_8_) * local_1d28;
      local_1060 = local_1060 + dVar41;
      local_fe0 = local_fe0 + dVar41;
      local_1c38._0_8_ = (double)local_1c38._0_8_ * -dVar93;
      local_ae0 = local_ae0 + (double)local_1c38._0_8_;
      local_aa0 = local_aa0 - ((double)local_1c38._0_8_ + (double)local_1c38._0_8_);
      local_a60 = (double)local_1c38._0_8_ + local_a60;
      local_828[1] = local_828[1] + local_1878;
      dStack_7a0 = dStack_7a0 + local_1878;
      local_1d28 = local_1d28 * local_1df8[0xd];
      dStack_1d20 = local_1df8[9] * local_1df8[3];
      local_1c18 = dStack_1cd0;
      uStack_1c10 = 0;
      local_1be8 = local_1cc8;
      uStack_1be0 = 0;
      local_1f38[3] = dVar96;
      local_1e78 = dStack_1ef0;
      local_1bd8 = dVar96;
      local_1050 = dVar70;
      local_1020 = dVar29;
      local_828[3] = local_19b8;
      local_828[9] = dVar78;
      dVar19 = exp(dVar44);
      dVar43 = local_1df8[10];
      local_1c38._8_8_ = 0;
      local_1c38._0_8_ = local_1df8[0xb];
      dVar118 = local_1df8[0xb] * local_1df8[10];
      dVar27 = dVar21 * dVar20;
      auVar40._0_8_ = exp(local_6c8);
      auVar40._8_8_ = dVar62;
      dVar19 = dVar19 * 26480000.0;
      local_1d38 = local_1d38 * 36000.0;
      auVar57._8_8_ = local_1d38;
      auVar57._0_8_ = dVar19;
      auVar116 = divpd(auVar57,auVar40);
      dVar73 = local_1d38 * dVar73;
      local_1470 = dVar24 - dVar73;
      dStack_1468 = local_1d48 + dVar73;
      local_1440 = dVar22 - dVar73;
      local_1418 = dVar73 + dVar46;
      dVar28 = dVar28 * dVar19;
      dVar113 = dVar113 * local_1d38;
      local_1050 = dVar70 - dVar113;
      local_1048 = dVar60 + dVar113;
      dVar22 = auVar116._0_8_;
      dVar70 = auVar116._8_8_;
      dVar73 = local_1e68 * dVar19 * local_1d28 -
               (local_1e68 - ((dStack_1c90 + local_1c98) - (local_1e18 + dStack_1c80)) * dVar42) *
               dVar22 * dVar118;
      dVar23 = dStack_1e60 * local_1d38 * dStack_1d20 -
               (dStack_1e60 - ((dVar23 + local_1be8) - (local_1e18 + local_1c18)) * dVar42) * dVar70
               * dVar27;
      local_828[3] = local_19b8 - dVar23;
      local_828[4] = local_1e58 + dVar23;
      dVar118 = local_1d28 * dVar19 - dVar118 * dVar22;
      dVar27 = dStack_1d20 * local_1d38 - dVar27 * dVar70;
      local_1f38[3] = local_1bd8 - dVar27;
      local_1f38[4] = (double)local_1cf8._0_8_ + dVar27;
      dVar21 = dVar21 * -dVar70;
      local_13c0._8_8_ = local_1e38 + dVar21;
      local_13c0._0_8_ = (double)local_1e88._0_8_ - dVar21;
      local_1390 = dVar59 - dVar21;
      local_1368 = dVar21 + local_1e48;
      dVar20 = dVar20 * -dVar70;
      local_ce0 = dVar61 - dVar20;
      local_cd8 = dVar71 + dVar20;
      local_cb0 = dVar72 - dVar20;
      local_c88 = dVar20 + dVar92;
      local_1ee8 = (undefined1  [8])(dVar118 + (double)local_1ee8);
      dStack_1ee0 = dVar118 + dStack_1ee0;
      dStack_1ef0 = ((local_1e78 - dVar27) - (dVar45 + dVar45)) - dVar118;
      dStack_1ed0 = dStack_1ed0 - dVar118;
      local_1ec8 = dVar27 + local_1ec8;
      local_1018 = dVar28 + local_1018;
      dStack_1010 = dVar28 + dStack_1010;
      local_1020 = ((dVar29 - dVar113) - (dVar41 + dVar41)) - dVar28;
      local_1000 = local_1000 - dVar28;
      dStack_ff8 = dVar113 + dStack_ff8;
      dVar20 = (double)local_1c38._0_8_ * -dVar22;
      local_f70 = local_f70 - dVar20;
      local_f68 = dVar20 + local_f68;
      dStack_f60 = dVar20 + dStack_f60;
      local_f50 = local_f50 - dVar20;
      dVar43 = -dVar22 * dVar43;
      local_ec0 = local_ec0 - dVar43;
      local_eb8 = dVar43 + local_eb8;
      dStack_eb0 = dVar43 + dStack_eb0;
      local_ea0 = local_ea0 - dVar43;
      dVar19 = dVar19 * local_1df8[9];
      local_1e68 = local_d60 - dVar19;
      dVar20 = local_d58 + dVar19;
      local_d50 = local_d50 + dVar19;
      dVar19 = local_d40 - dVar19;
      local_828[9] = ((dVar78 - dVar23) - (local_1878 + local_1878)) - dVar73;
      local_7d8._0_8_ = dVar73 + (double)local_7d8._0_8_;
      local_7d8._8_8_ = dVar73 + (double)local_7d8._8_8_;
      dStack_7c0 = dStack_7c0 - dVar73;
      dStack_7b8 = dVar23 + dStack_7b8;
      local_1d38 = local_1df8[0xe];
      local_1c38._0_8_ = local_1df8[9] * local_1df8[0xe];
      dVar118 = exp((double)local_1e08._0_8_ * 2.81 + dVar42 * -2948.8496616156594);
      dVar43 = local_1df8[10];
      dVar118 = dVar118 * 0.00332;
      dVar27 = dVar42 * 2.81 + local_1bc8 * 2948.8496616156594;
      local_1bc8 = local_1df8[0xd];
      local_1bd8 = local_1df8[10] * local_1df8[0xd];
      dVar22 = exp((local_1848 - local_1858) + local_1928);
      dVar113 = local_1df8[0x12];
      dVar22 = dVar118 / dVar22;
      local_1d28 = dVar118 * (double)local_1c38._0_8_ - local_1bd8 * dVar22;
      dVar59 = dVar27 * dVar118 * (double)local_1c38._0_8_ -
               (dVar27 - ((local_1c98 + dStack_1c80) - (dStack_1ca0 + local_1c78)) * dVar42) *
               dVar22 * local_1bd8;
      dStack_1d20 = 0.0;
      dStack_1ef0 = dStack_1ef0 - local_1d28;
      local_1ee8 = (undefined1  [8])((double)local_1ee8 + local_1d28);
      dStack_1ed0 = dStack_1ed0 + local_1d28;
      dVar27 = local_1d38 * dVar118;
      local_1020 = local_1020 - dVar27;
      local_1018 = local_1018 + dVar27;
      dStack_ff8 = dStack_ff8 - dVar27;
      local_1000 = dVar27 + local_1000;
      dVar27 = local_1bc8 * -dVar22;
      local_f70 = local_f70 - dVar27;
      local_f68 = local_f68 + dVar27;
      local_f50 = local_f50 + dVar27;
      local_f48 = local_f48 - dVar27;
      dVar43 = -dVar22 * dVar43;
      local_d60 = local_1e68 - dVar43;
      local_d58 = dVar20 + dVar43;
      local_d40 = dVar19 + dVar43;
      local_d38 = local_d38 - dVar43;
      local_1d48 = local_1df8[9];
      dStack_1d40 = 0.0;
      dVar118 = dVar118 * local_1df8[9];
      local_cb0 = local_cb0 - dVar118;
      local_ca8 = local_ca8 + dVar118;
      local_c90 = local_c90 + dVar118;
      local_c88 = local_c88 - dVar118;
      local_828[9] = local_828[9] - dVar59;
      local_7d8._0_8_ = (double)local_7d8._0_8_ + dVar59;
      dStack_7c0 = dStack_7c0 + dVar59;
      dVar60 = exp((double)local_1e08._0_8_ * 1.74 + dVar42 * -5258.6141576593245);
      dVar70 = local_1df8[10];
      local_1e58 = local_1a88 * 5258.6141576593245;
      dStack_1e50 = dStack_1a80 * 201.28666632188802;
      local_1bc8 = local_1df8[0x11];
      uStack_1bc0 = 0;
      dVar61 = exp((local_1848 - local_758) + local_778);
      dVar46 = local_798;
      dVar45 = local_828[9];
      dVar44 = local_9a8;
      dVar26 = local_9f0;
      dVar25 = local_a58;
      dVar24 = local_a60;
      dVar23 = local_a98;
      dVar21 = local_aa0;
      dVar41 = local_f28;
      dVar29 = local_1c58;
      dVar28 = local_1c98;
      dVar73 = dStack_1ca0;
      dVar43 = local_1df8[0xd];
      dVar22 = local_1df8[3];
      dVar118 = dStack_1eb0;
      dVar20 = dStack_1ef0;
      local_1e18 = dStack_1c60;
      dStack_1e10 = local_1c58;
      local_1c38._0_8_ = local_1ea8;
      local_1e88._0_8_ = local_1020;
      local_1e78 = local_1018;
      local_1cf8._0_8_ = local_fe0;
      local_19b8 = local_fd8;
      local_1bd8 = local_f70;
      local_1848 = local_f68;
      local_1d38 = local_f30;
      local_1e38 = local_1df8[9];
      local_1e48 = local_9e8;
      local_1878 = local_9b0;
      local_778 = dStack_7a0;
      dVar71 = exp(dVar42 * -201.28666632188802 + local_1c08);
      dVar19 = local_1df8[0xb];
      local_1e68 = local_1df8[6];
      dStack_1e60 = 0.0;
      dVar72 = exp((dVar77 - local_1868) + local_1858);
      dVar27 = local_1df8[3];
      auVar69._8_8_ = dVar72;
      auVar69._0_8_ = dVar61;
      dVar60 = dVar60 * 6.14;
      dVar71 = dVar71 * 7600000.0;
      auVar108._8_8_ = dVar71;
      auVar108._0_8_ = dVar60;
      auVar116 = divpd(auVar108,auVar69);
      dVar61 = local_1bc8 * dVar70;
      dVar72 = dVar19 * local_1e68;
      local_fd8 = dVar60 * dVar113;
      dVar113 = dVar113 * local_1d48;
      dVar47 = dVar43 * dVar22;
      local_1e58 = dVar42 * 1.74 + local_1e58;
      dVar92 = dVar42 * 0.0 + dStack_1e50;
      dVar101 = auVar116._0_8_;
      dVar109 = auVar116._8_8_;
      dVar73 = local_1e58 * dVar60 * dVar113 -
               (local_1e58 - ((local_1e18 + dVar28) - (dVar29 + dVar73)) * dVar42) * dVar101 *
               dVar61;
      dVar28 = dVar92 * dVar71 * dVar47 -
               (dVar92 - ((dStack_1c90 + local_1cb8) - (dStack_1c80 + dStack_1cd0)) * dVar42) *
               dVar109 * dVar72;
      dVar113 = dVar113 * dVar60 - dVar61 * dVar101;
      dVar29 = dVar47 * dVar71 - dVar72 * dVar109;
      dVar19 = dVar19 * -dVar109;
      local_1e68 = local_1e68 * -dVar109;
      dVar43 = dVar43 * dVar71;
      dVar71 = dVar71 * dVar22;
      local_1020 = (double)local_1e88._0_8_ - local_fd8;
      local_1e18 = local_ef0;
      local_1d48 = local_ea0;
      local_1e88._0_8_ = local_d90;
      local_1868 = local_d40;
      local_1858 = local_828[3];
      local_1e58 = local_828[6];
      local_1018 = local_1e78 + local_fd8;
      local_fe0 = (double)local_1cf8._0_8_ + local_fd8;
      local_fd8 = local_19b8 - local_fd8;
      dVar60 = dVar60 * local_1e38;
      local_9f0 = dVar26 - dVar60;
      local_9e8 = local_1e48 + dVar60;
      local_9b0 = local_1878 + dVar60;
      local_9a8 = dVar44 - dVar60;
      local_828[9] = dVar45 - dVar73;
      dStack_7a0 = local_778 + dVar73;
      local_798 = dVar46 - dVar73;
      dStack_1ef0 = dVar20 - dVar113;
      dStack_1eb0 = dVar118 + dVar113;
      local_1ea8 = (double)local_1c38._0_8_ - dVar113;
      local_f28 = local_1bc8 * -dVar101;
      local_f70 = local_1bd8 - local_f28;
      local_f68 = local_1848 + local_f28;
      local_f30 = local_1d38 + local_f28;
      local_f28 = dVar41 - local_f28;
      dVar70 = -dVar101 * dVar70;
      local_aa0 = dVar21 - dVar70;
      local_a98 = dVar23 + dVar70;
      local_a60 = dVar24 + dVar70;
      local_a58 = dVar25 - dVar70;
      local_1f38[6] = local_1f38[6] + dVar29;
      local_1f38[3] = local_1f38[3] - dVar29;
      dStack_1ee0 = dStack_1ee0 + dVar29;
      local_1ee8 = (undefined1  [8])((double)local_1ee8 + dVar113);
      dStack_1ed0 = dStack_1ed0 - dVar29;
      local_1ec8 = local_1ec8 - local_1d28;
      local_1470 = local_1470 - dVar43;
      dStack_1458 = dStack_1458 + dVar43;
      local_1430 = local_1430 + dVar43;
      local_1420 = local_1420 - dVar43;
      local_1260 = local_1260 - dVar19;
      dStack_1248 = dStack_1248 + dVar19;
      local_1220 = local_1220 + dVar19;
      local_1210 = local_1210 - dVar19;
      local_ef0 = local_ef0 - local_1e68;
      local_ed8 = local_ed8 + local_1e68;
      dStack_eb0 = dStack_eb0 + local_1e68;
      local_ea0 = local_ea0 - local_1e68;
      local_d90 = local_d90 - dVar71;
      local_d78 = local_d78 + dVar71;
      local_d50 = local_d50 + dVar71;
      local_d40 = local_d40 - dVar71;
      local_828[6] = local_828[6] + dVar28;
      local_828[3] = local_828[3] - dVar28;
      local_7d8._8_8_ = (double)local_7d8._8_8_ + dVar28;
      local_7d8._0_8_ = (double)local_7d8._0_8_ + dVar73;
      dStack_7c0 = dStack_7c0 - dVar28;
      dStack_7b8 = dStack_7b8 - dVar59;
      local_1878 = local_1df8[0xf];
      uStack_1870 = 0;
      local_1e88._0_8_ = exp((double)local_1e08._0_8_ * 7.6 + dVar42 * 1776.3548302906618);
      dVar22 = local_1df8[0xe];
      dVar20 = local_1df8[6];
      local_1e88._8_8_ = extraout_XMM0_Qb_06;
      local_1d48 = exp((dVar77 - local_1928) + local_308);
      dVar26 = local_bd8;
      dVar25 = local_c30;
      dVar24 = local_ce0;
      dVar23 = local_1200;
      dVar21 = local_1208;
      dVar41 = local_1410;
      dVar29 = local_1418;
      dVar28 = dStack_1458;
      dVar73 = local_1470;
      dVar113 = local_1cb8;
      dVar70 = dStack_1cd0;
      local_1e38 = dStack_1c70;
      dStack_1e30 = local_1c68;
      local_1e48 = local_1c78;
      dStack_1e40 = dStack_1c70;
      local_1c38._0_8_ = local_1f38[3];
      local_1848 = local_1f38[6];
      local_1d28 = local_1ec8;
      local_1d38 = local_1260;
      local_1bc8 = dStack_1248;
      dVar19 = dVar42 * -1949.96457999329 + local_1c08;
      local_1bd8 = local_cc8;
      local_1868 = local_c88;
      local_1858 = local_c80;
      local_778 = local_c18;
      local_1e78 = local_bd0;
      local_1cf8._0_8_ = local_828[3];
      local_19b8 = local_828[6];
      local_1928 = dStack_7b8;
      local_1c08 = local_1df8[3];
      uStack_1c00 = 0;
      local_1e68 = local_1df8[0x11];
      dStack_1e60 = 0.0;
      local_1e58 = exp(dVar19);
      dVar118 = local_1df8[6];
      local_1e08._8_8_ = 0;
      local_1e08._0_8_ = local_1df8[0x10];
      dVar19 = exp((dVar77 - local_6a8) + local_758);
      auVar58._8_8_ = dVar19;
      auVar58._0_8_ = local_1d48;
      dVar101 = (double)local_1e88._0_8_ * 4.28e-19;
      dVar109 = local_1e58 * 840000.0;
      auVar91._8_8_ = dVar109;
      auVar91._0_8_ = dVar101;
      auVar116 = divpd(auVar91,auVar58);
      uVar114 = local_1e08._12_4_;
      dVar72 = dVar20 * dVar22;
      dVar92 = local_1e08._0_8_ * dVar118;
      dVar19 = dVar101 * local_1878;
      dVar46 = dVar27 * local_1878;
      dVar59 = local_1e68 * local_1c08;
      dVar44 = dVar42 * 7.6 + local_1a88 * -1776.3548302906618;
      dVar45 = dVar42 * 0.0 + dStack_1a80 * 1949.96457999329;
      dVar60 = auVar116._0_8_;
      dVar61 = auVar116._8_8_;
      dVar43 = local_1e08._0_8_ * -dVar61;
      local_1e08._8_4_ = local_1e08._8_4_;
      local_1e08._0_8_ = dVar43;
      local_1e08._12_4_ = uVar114;
      dVar118 = dVar118 * -dVar61;
      local_1e68 = local_1e68 * dVar109;
      dVar71 = dVar109 * local_1c08;
      local_1c08 = local_b80;
      local_758 = local_a60;
      local_6a8 = local_a68;
      local_1418 = dVar29 + dVar19;
      local_1410 = dVar41 - dVar19;
      dVar27 = dVar27 * dVar101;
      local_c30 = dVar25 - dVar27;
      local_c18 = local_778 + dVar27;
      local_bd8 = dVar26 + dVar27;
      local_bd0 = local_1e78 - dVar27;
      dVar27 = dVar44 * dVar101 * dVar46 -
               (dVar44 - ((dVar113 + local_1e48) - (dVar70 + local_1e38)) * dVar42) * dVar60 *
               dVar72;
      dVar70 = dVar45 * dVar109 * dVar59 -
               (dVar45 - ((local_1c68 + local_1cb8) - (dStack_1c60 + dStack_1cd0)) * dVar42) *
               dVar61 * dVar92;
      dStack_7b8 = local_1928 + dVar27;
      dVar113 = dVar46 * dVar101 - dVar72 * dVar60;
      dVar29 = dVar59 * dVar109 - dVar92 * dVar61;
      local_1ec8 = local_1d28 + dVar113;
      dVar22 = dVar22 * -dVar60;
      local_1208 = dVar21 + dVar22;
      local_1200 = dVar23 - dVar22;
      dVar20 = -dVar60 * dVar20;
      local_ce0 = dVar24 - dVar20;
      local_cc8 = local_1bd8 + dVar20;
      local_c88 = local_1868 + dVar20;
      local_c80 = local_1858 - dVar20;
      local_1f38[3] = ((double)local_1c38._0_8_ - dVar113) - dVar29;
      local_1f38[6] = local_1848 + dVar113 + dVar29;
      dStack_1ec0 = dStack_1ec0 - dVar113;
      local_1eb8 = dVar29 + local_1eb8;
      local_1470 = (dVar73 - dVar19) - local_1e68;
      dStack_1eb0 = dStack_1eb0 - dVar29;
      dStack_1458 = local_1e68 + dVar28 + dVar19;
      local_1408 = local_1408 + local_1e68;
      local_1400 = local_1400 - local_1e68;
      local_1260 = (local_1d38 - dVar22) - dVar43;
      dStack_1248 = dVar43 + local_1bc8 + dVar22;
      local_11f8 = local_11f8 + dVar43;
      local_11f0 = local_11f0 - dVar43;
      local_b80 = local_b80 - dVar118;
      local_b68 = local_b68 + dVar118;
      local_b18 = local_b18 + dVar118;
      local_b10 = local_b10 - dVar118;
      local_ad0 = local_ad0 - dVar71;
      local_ab8 = local_ab8 + dVar71;
      local_a68 = local_a68 + dVar71;
      local_a60 = local_a60 - dVar71;
      local_828[3] = ((double)local_1cf8._0_8_ - dVar27) - dVar70;
      local_828[6] = local_19b8 + dVar27 + dVar70;
      dStack_7b0 = dStack_7b0 - dVar27;
      dStack_7a8 = dVar70 + dStack_7a8;
      dStack_7a0 = dStack_7a0 - dVar70;
      if (iVar1 == 2) {
        if (1000.0 <= local_1bb8) {
          local_558[0] = local_6b8 * 2.00255376e-14 +
                         local_648 * -1.79566394e-10 +
                         local_768 * 4.99456778e-07 + local_1bb8 * -4.94024731e-05 + 3.3372792;
          local_558[1] = local_6b8 * 4.98197357e-22 +
                         local_648 * -4.73515235e-18 +
                         local_768 * 1.61561948e-14 + local_1bb8 * -2.30842973e-11 + 2.50000001;
          local_558[2] = local_6b8 * 1.22833691e-15 +
                         local_648 * -1.00177799e-11 +
                         local_768 * 4.19484589e-08 + local_1bb8 * -8.59741137e-05 + 2.56942078;
          local_558[3] = local_6b8 * -2.16717794e-14 +
                         local_648 * 2.09470555e-10 +
                         local_768 * -7.57966669e-07 + local_1bb8 * 0.00148308754 + 3.28253784;
          local_558[4] = local_6b8 * 1.17412376e-14 +
                         local_648 * -8.79461556e-11 +
                         local_768 * 1.26505228e-07 + local_1bb8 * 0.000548429716 + 3.09288767;
          local_558[5] = local_6b8 * 1.68200992e-14 +
                         local_648 * -9.7041987e-11 +
                         local_768 * -1.64072518e-07 + local_1bb8 * 0.00217691804 + 3.03399249;
          local_558[6] = local_6b8 * -1.07908535e-14 +
                         local_648 * 1.1424637e-10 +
                         local_768 * -6.3365815e-07 + local_1bb8 * 0.00223982013 + 4.0172109;
          local_558[7] = local_6b8 * -1.87727567e-14 +
                         local_648 * 2.60179549e-10 +
                         local_768 * -1.40894597e-06 + local_1bb8 * 0.00365639292 + 2.87410113;
          local_558[8] = local_6b8 * -3.39716365e-14 +
                         local_648 * 4.17906e-10 +
                         local_768 * -2.01191947e-06 + local_1bb8 * 0.00465588637 + 2.29203842;
          local_558[9] = local_6b8 * -4.67154394e-14 +
                         local_648 * 5.95684644e-10 +
                         local_768 * -2.98714348e-06 + local_1bb8 * 0.00723990037 + 2.28571772;
          local_558[10] =
               local_6b8 * -1.0181523e-13 +
               local_648 * 1.22292535e-09 +
               local_768 * -5.73285809e-06 + local_1bb8 * 0.0133909467 + 0.074851495;
          local_558[0xb] =
               local_6b8 * -2.03647716e-14 +
               local_648 * 2.30053008e-10 +
               local_768 * -9.98825771e-07 + local_1bb8 * 0.00206252743 + 2.71518561;
          local_558[0xc] =
               local_6b8 * -4.72084164e-14 +
               local_648 * 5.23490188e-10 +
               local_768 * -2.21481404e-06 + local_1bb8 * 0.00441437026 + 3.85746029;
          local_558[0xd] =
               local_6b8 * -5.33508711e-14 +
               local_648 * 5.89161778e-10 +
               local_768 * -2.48445613e-06 + local_1bb8 * 0.00495695526 + 2.77217438;
          local_558[0xe] =
               local_6b8 * -8.8385564e-14 +
               local_648 * 1.00641212e-09 +
               local_768 * -4.42258813e-06 + local_1bb8 * 0.00920000082 + 1.76069008;
          local_558[0xf] =
               local_6b8 * -2.112616e-14 +
               local_648 * 3.944431e-10 +
               local_768 * -2.656384e-06 + local_1bb8 * 0.007871497 + 3.770799;
          local_558[0x10] =
               local_6b8 * -1.25706061e-13 +
               local_648 * 1.47222923e-09 +
               local_768 * -6.71077915e-06 + local_1bb8 * 0.0146454151 + 2.03611116;
          local_558[0x11] =
               local_6b8 * -1.49641576e-13 +
               local_648 * 1.75217689e-09 +
               local_768 * -7.98206668e-06 + local_1bb8 * 0.0173972722 + 1.95465642;
          local_558[0x12] =
               local_6b8 * -1.9000289e-13 +
               local_648 * 2.21412001e-09 +
               local_768 * -1.00256067e-05 + local_1bb8 * 0.0216852677 + 1.0718815;
          dVar43 = local_648 * 1.0097038e-10 +
                   local_768 * -5.68476e-07 + local_1bb8 * 0.0014879768 + 2.92664;
          dVar19 = local_6b8 * -6.753351e-15;
        }
        else {
          local_558[0] = local_6b8 * -7.37611761e-12 +
                         local_648 * 2.01572094e-08 +
                         local_768 * -1.9478151e-05 + local_1bb8 * 0.00798052075 + 2.34433112;
          local_558[1] = local_6b8 * -9.27732332e-22 +
                         local_648 * 2.30081632e-18 +
                         local_768 * -1.99591964e-15 + local_1bb8 * 7.05332819e-13 + 2.5;
          local_558[2] = local_6b8 * 2.11265971e-12 +
                         local_648 * -6.12806624e-09 +
                         local_768 * 6.64306396e-06 + local_1bb8 * -0.00327931884 + 3.1682671;
          local_558[3] = local_6b8 * 3.24372837e-12 +
                         local_648 * -9.68129509e-09 +
                         local_768 * 9.84730201e-06 + local_1bb8 * -0.00299673416 + 3.78245636;
          local_558[4] = local_6b8 * 1.3641147e-12 +
                         local_648 * -3.88113333e-09 +
                         local_768 * 4.61793841e-06 + local_1bb8 * -0.00240131752 + 3.99201543;
          local_558[5] = local_6b8 * 1.77197817e-12 +
                         local_648 * -5.48797062e-09 +
                         local_768 * 6.52040211e-06 + local_1bb8 * -0.0020364341 + 4.19864056;
          local_558[6] = local_6b8 * 9.29225124e-12 +
                         local_648 * -2.42763894e-08 +
                         local_768 * 2.11582891e-05 + local_1bb8 * -0.00474912051 + 4.30179801;
          local_558[7] = local_6b8 * 1.68741719e-12 +
                         local_648 * -3.85091153e-09 +
                         local_768 * 2.79489841e-06 + local_1bb8 * 0.000968872143 + 3.76267867;
          local_558[8] = local_6b8 * 1.94314737e-12 +
                         local_648 * -6.68815981e-09 +
                         local_768 * 8.2329622e-06 + local_1bb8 * -0.00236661419 + 4.19860411;
          local_558[9] = local_6b8 * 2.54385734e-12 +
                         local_648 * -6.87117425e-09 +
                         local_768 * 5.73021856e-06 + local_1bb8 * 0.00201095175 + 3.6735904;
          local_558[10] =
               local_6b8 * 1.66693956e-11 +
               local_648 * -4.84743026e-08 +
               local_768 * 4.91800599e-05 + local_1bb8 * -0.0136709788 + 5.14987613;
          local_558[0xb] =
               local_6b8 * -9.04424499e-13 +
               local_648 * 9.07005884e-10 +
               local_768 * 1.01681433e-06 + local_1bb8 * -0.00061035368 + 3.57953347;
          local_558[0xc] =
               local_6b8 * -1.43699548e-13 +
               local_648 * 2.45919022e-09 +
               local_768 * -7.12356269e-06 + local_1bb8 * 0.00898459677 + 2.35677352;
          local_558[0xd] =
               local_6b8 * 4.33768865e-12 +
               local_648 * -1.33144093e-08 +
               local_768 * 1.37799446e-05 + local_1bb8 * -0.00324392532 + 4.22118584;
          local_558[0xe] =
               local_6b8 * 1.31772652e-11 +
               local_648 * -3.79285261e-08 +
               local_768 * 3.73220008e-05 + local_1bb8 * -0.00990833369 + 4.79372315;
          local_558[0xf] =
               local_6b8 * 2.07561e-12 +
               local_648 * -7.377636e-09 +
               local_768 * 5.338472e-06 + local_1bb8 * 0.007216595 + 2.106204;
          local_558[0x10] =
               local_6b8 * 2.69884373e-11 +
               local_648 * -6.91588753e-08 +
               local_768 * 5.70990292e-05 + local_1bb8 * -0.00757052247 + 3.95920148;
          local_558[0x11] =
               local_6b8 * 2.30509004e-11 +
               local_648 * -5.99126606e-08 +
               local_768 * 4.97142807e-05 + local_1bb8 * -0.00418658892 + 4.30646568;
          local_558[0x12] =
               local_6b8 * 2.68685771e-11 +
               local_648 * -7.08466285e-08 +
               local_768 * 5.99438288e-05 + local_1bb8 * -0.0055015427 + 4.29142492;
          dVar43 = local_648 * 5.641515e-09 +
                   local_768 * -3.963222e-06 + local_1bb8 * 0.0014082404 + 3.298677;
          dVar19 = local_6b8 * -2.444854e-12;
        }
        local_558[0x13] = dVar19 + dVar43;
        local_558[0x14] = local_378 + local_318 + 2.5 + local_328 + (double)local_338._0_8_;
        if (1000.0 <= local_1bb8) {
          local_4a8[0] = local_648 * 8.01021504e-14 +
                         local_768 * -5.38699182e-10 + local_1bb8 * 9.98913556e-07 + -4.94024731e-05
          ;
          local_4a8[1] = local_648 * 1.99278943e-21 +
                         local_768 * -1.42054571e-17 + local_1bb8 * 3.23123896e-14 + -2.30842973e-11
          ;
          local_4a8[2] = local_648 * 4.91334764e-15 +
                         local_768 * -3.00533397e-11 + local_1bb8 * 8.38969178e-08 + -8.59741137e-05
          ;
          local_4a8[3] = local_648 * -8.66871176e-14 +
                         local_768 * 6.28411665e-10 + local_1bb8 * -1.51593334e-06 + 0.00148308754;
          local_4a8[4] = local_648 * 4.69649504e-14 +
                         local_768 * -2.63838467e-10 + local_1bb8 * 2.53010456e-07 + 0.000548429716;
          local_4a8[5] = local_648 * 6.72803968e-14 +
                         local_768 * -2.91125961e-10 + local_1bb8 * -3.28145036e-07 + 0.00217691804;
          local_4a8[6] = local_648 * -4.3163414e-14 +
                         local_768 * 3.4273911e-10 + local_1bb8 * -1.2673163e-06 + 0.00223982013;
          local_4a8[7] = local_648 * -7.50910268e-14 +
                         local_768 * 7.80538647e-10 + local_1bb8 * -2.81789194e-06 + 0.00365639292;
          local_4a8[8] = local_648 * -1.35886546e-13 +
                         local_768 * 1.253718e-09 + local_1bb8 * -4.02383894e-06 + 0.00465588637;
          local_4a8[9] = local_648 * -1.86861758e-13 +
                         local_768 * 1.78705393e-09 + local_1bb8 * -5.97428696e-06 + 0.00723990037;
          local_4a8[10] =
               local_648 * -4.0726092e-13 +
               local_768 * 3.66877605e-09 + local_1bb8 * -1.14657162e-05 + 0.0133909467;
          local_4a8[0xb] =
               local_648 * -8.14590864e-14 +
               local_768 * 6.90159024e-10 + local_1bb8 * -1.99765154e-06 + 0.00206252743;
          local_4a8[0xc] =
               local_648 * -1.88833666e-13 +
               local_768 * 1.57047056e-09 + local_1bb8 * -4.42962808e-06 + 0.00441437026;
          local_4a8[0xd] =
               local_648 * -2.13403484e-13 +
               local_768 * 1.76748533e-09 + local_1bb8 * -4.96891226e-06 + 0.00495695526;
          local_4a8[0xe] =
               local_648 * -3.53542256e-13 +
               local_768 * 3.01923636e-09 + local_1bb8 * -8.84517626e-06 + 0.00920000082;
          local_4a8[0xf] =
               local_648 * -8.450464e-14 +
               local_768 * 1.1833293e-09 + local_1bb8 * -5.312768e-06 + 0.007871497;
          local_4a8[0x10] =
               local_648 * -5.02824244e-13 +
               local_768 * 4.41668769e-09 + local_1bb8 * -1.34215583e-05 + 0.0146454151;
          local_4a8[0x11] =
               local_648 * -5.98566304e-13 +
               local_768 * 5.25653067e-09 + local_1bb8 * -1.59641334e-05 + 0.0173972722;
          local_4a8[0x12] =
               local_648 * -7.6001156e-13 +
               local_768 * 6.64236003e-09 + local_1bb8 * -2.00512134e-05 + 0.0216852677;
          dVar19 = local_768 * 3.0291114e-10 + local_1bb8 * -1.136952e-06 + 0.0014879768;
          dVar43 = local_648 * -2.7013404e-14;
        }
        else {
          local_4a8[0] = local_648 * -2.95044704e-11 +
                         local_768 * 6.04716282e-08 + local_1bb8 * -3.8956302e-05 + 0.00798052075;
          local_4a8[1] = local_648 * -3.71092933e-21 +
                         local_768 * 6.90244896e-18 + local_1bb8 * -3.99183928e-15 + 7.05332819e-13;
          local_4a8[2] = local_648 * 8.45063884e-12 +
                         local_768 * -1.83841987e-08 + local_1bb8 * 1.32861279e-05 + -0.00327931884;
          local_4a8[3] = local_648 * 1.29749135e-11 +
                         local_768 * -2.90438853e-08 + local_1bb8 * 1.9694604e-05 + -0.00299673416;
          local_4a8[4] = local_648 * 5.4564588e-12 +
                         local_768 * -1.16434e-08 + local_1bb8 * 9.23587682e-06 + -0.00240131752;
          local_4a8[5] = local_648 * 7.08791268e-12 +
                         local_768 * -1.64639119e-08 + local_1bb8 * 1.30408042e-05 + -0.0020364341;
          local_4a8[6] = local_648 * 3.7169005e-11 +
                         local_768 * -7.28291682e-08 + local_1bb8 * 4.23165782e-05 + -0.00474912051;
          local_4a8[7] = local_648 * 6.74966876e-12 +
                         local_768 * -1.15527346e-08 + local_1bb8 * 5.58979682e-06 + 0.000968872143;
          local_4a8[8] = local_648 * 7.77258948e-12 +
                         local_768 * -2.00644794e-08 + local_1bb8 * 1.64659244e-05 + -0.00236661419;
          local_4a8[9] = local_648 * 1.01754294e-11 +
                         local_768 * -2.06135228e-08 + local_1bb8 * 1.14604371e-05 + 0.00201095175;
          local_4a8[10] =
               local_648 * 6.66775824e-11 +
               local_768 * -1.45422908e-07 + local_1bb8 * 9.83601198e-05 + -0.0136709788;
          local_4a8[0xb] =
               local_648 * -3.617698e-12 +
               local_768 * 2.72101765e-09 + local_1bb8 * 2.03362866e-06 + -0.00061035368;
          local_4a8[0xc] =
               local_648 * -5.74798192e-13 +
               local_768 * 7.37757066e-09 + local_1bb8 * -1.42471254e-05 + 0.00898459677;
          local_4a8[0xd] =
               local_648 * 1.73507546e-11 +
               local_768 * -3.99432279e-08 + local_1bb8 * 2.75598892e-05 + -0.00324392532;
          local_4a8[0xe] =
               local_648 * 5.27090608e-11 +
               local_768 * -1.13785578e-07 + local_1bb8 * 7.46440016e-05 + -0.00990833369;
          local_4a8[0xf] =
               local_648 * 8.30244e-12 +
               local_768 * -2.2132908e-08 + local_1bb8 * 1.0676944e-05 + 0.007216595;
          local_4a8[0x10] =
               local_648 * 1.07953749e-10 +
               local_768 * -2.07476626e-07 + local_1bb8 * 0.000114198058 + -0.00757052247;
          local_4a8[0x11] =
               local_648 * 9.22036016e-11 +
               local_768 * -1.79737982e-07 + local_1bb8 * 9.94285614e-05 + -0.00418658892;
          local_4a8[0x12] =
               local_648 * 1.07474308e-10 +
               local_768 * -2.12539886e-07 + local_1bb8 * 0.000119887658 + -0.0055015427;
          dVar19 = local_768 * 1.6924545e-08 + local_1bb8 * -7.926444e-06 + 0.0014082404;
          dVar43 = local_648 * -9.779416e-12;
        }
        local_4a8[0x13] = dVar43 + dVar19;
        local_4a8[0x14] = (double)local_338._0_8_ + local_328 + local_318 + 0.0;
        pdVar13 = &local_1ce8;
      }
      else {
        if (1000.0 <= local_1bb8) {
          local_558[0] = local_6b8 * 2.00255376e-14 +
                         local_648 * -1.79566394e-10 +
                         local_768 * 4.99456778e-07 + local_1bb8 * -4.94024731e-05 + 2.3372792;
          local_558[1] = local_6b8 * 4.98197357e-22 +
                         local_648 * -4.73515235e-18 +
                         local_768 * 1.61561948e-14 + local_1bb8 * -2.30842973e-11 + 1.50000001;
          local_558[2] = local_6b8 * 1.22833691e-15 +
                         local_648 * -1.00177799e-11 +
                         local_768 * 4.19484589e-08 + local_1bb8 * -8.59741137e-05 + 1.56942078;
          local_558[3] = local_6b8 * -2.16717794e-14 +
                         local_648 * 2.09470555e-10 +
                         local_768 * -7.57966669e-07 + local_1bb8 * 0.00148308754 + 2.28253784;
          local_558[4] = local_6b8 * 1.17412376e-14 +
                         local_648 * -8.79461556e-11 +
                         local_768 * 1.26505228e-07 + local_1bb8 * 0.000548429716 + 2.09288767;
          local_558[5] = local_6b8 * 1.68200992e-14 +
                         local_648 * -9.7041987e-11 +
                         local_768 * -1.64072518e-07 + local_1bb8 * 0.00217691804 + 2.03399249;
          local_558[6] = local_6b8 * -1.07908535e-14 +
                         local_648 * 1.1424637e-10 +
                         local_768 * -6.3365815e-07 + local_1bb8 * 0.00223982013 + 3.0172109;
          local_558[7] = local_6b8 * -1.87727567e-14 +
                         local_648 * 2.60179549e-10 +
                         local_768 * -1.40894597e-06 + local_1bb8 * 0.00365639292 + 1.87410113;
          local_558[8] = local_6b8 * -3.39716365e-14 +
                         local_648 * 4.17906e-10 +
                         local_768 * -2.01191947e-06 + local_1bb8 * 0.00465588637 + 1.29203842;
          local_558[9] = local_6b8 * -4.67154394e-14 +
                         local_648 * 5.95684644e-10 +
                         local_768 * -2.98714348e-06 + local_1bb8 * 0.00723990037 + 1.28571772;
          local_558[10] =
               local_6b8 * -1.0181523e-13 +
               local_648 * 1.22292535e-09 +
               local_768 * -5.73285809e-06 + local_1bb8 * 0.0133909467 + -0.925148505;
          local_558[0xb] =
               local_6b8 * -2.03647716e-14 +
               local_648 * 2.30053008e-10 +
               local_768 * -9.98825771e-07 + local_1bb8 * 0.00206252743 + 1.71518561;
          local_558[0xc] =
               local_6b8 * -4.72084164e-14 +
               local_648 * 5.23490188e-10 +
               local_768 * -2.21481404e-06 + local_1bb8 * 0.00441437026 + 2.85746029;
          local_558[0xd] =
               local_6b8 * -5.33508711e-14 +
               local_648 * 5.89161778e-10 +
               local_768 * -2.48445613e-06 + local_1bb8 * 0.00495695526 + 1.77217438;
          local_558[0xe] =
               local_6b8 * -8.8385564e-14 +
               local_648 * 1.00641212e-09 +
               local_768 * -4.42258813e-06 + local_1bb8 * 0.00920000082 + 0.76069008;
          local_558[0xf] =
               local_6b8 * -2.112616e-14 +
               local_648 * 3.944431e-10 +
               local_768 * -2.656384e-06 + local_1bb8 * 0.007871497 + 2.770799;
          local_558[0x10] =
               local_6b8 * -1.25706061e-13 +
               local_648 * 1.47222923e-09 +
               local_768 * -6.71077915e-06 + local_1bb8 * 0.0146454151 + 1.03611116;
          local_558[0x11] =
               local_6b8 * -1.49641576e-13 +
               local_648 * 1.75217689e-09 +
               local_768 * -7.98206668e-06 + local_1bb8 * 0.0173972722 + 0.95465642;
          local_558[0x12] =
               local_6b8 * -1.9000289e-13 +
               local_648 * 2.21412001e-09 +
               local_768 * -1.00256067e-05 + local_1bb8 * 0.0216852677 + 0.0718815;
          dVar43 = local_648 * 1.0097038e-10 +
                   local_768 * -5.68476e-07 + local_1bb8 * 0.0014879768 + 1.92664;
          dVar19 = local_6b8 * -6.753351e-15;
        }
        else {
          local_558[0] = local_6b8 * -7.37611761e-12 +
                         local_648 * 2.01572094e-08 +
                         local_768 * -1.9478151e-05 + local_1bb8 * 0.00798052075 + 1.34433112;
          local_558[1] = local_6b8 * -9.27732332e-22 +
                         local_648 * 2.30081632e-18 +
                         local_768 * -1.99591964e-15 + local_1bb8 * 7.05332819e-13 + 1.5;
          local_558[2] = local_6b8 * 2.11265971e-12 +
                         local_648 * -6.12806624e-09 +
                         local_768 * 6.64306396e-06 + local_1bb8 * -0.00327931884 + 2.1682671;
          local_558[3] = local_6b8 * 3.24372837e-12 +
                         local_648 * -9.68129509e-09 +
                         local_768 * 9.84730201e-06 + local_1bb8 * -0.00299673416 + 2.78245636;
          local_558[4] = local_6b8 * 1.3641147e-12 +
                         local_648 * -3.88113333e-09 +
                         local_768 * 4.61793841e-06 + local_1bb8 * -0.00240131752 + 2.99201543;
          local_558[5] = local_6b8 * 1.77197817e-12 +
                         local_648 * -5.48797062e-09 +
                         local_768 * 6.52040211e-06 + local_1bb8 * -0.0020364341 + 3.19864056;
          local_558[6] = local_6b8 * 9.29225124e-12 +
                         local_648 * -2.42763894e-08 +
                         local_768 * 2.11582891e-05 + local_1bb8 * -0.00474912051 + 3.30179801;
          local_558[7] = local_6b8 * 1.68741719e-12 +
                         local_648 * -3.85091153e-09 +
                         local_768 * 2.79489841e-06 + local_1bb8 * 0.000968872143 + 2.76267867;
          local_558[8] = local_6b8 * 1.94314737e-12 +
                         local_648 * -6.68815981e-09 +
                         local_768 * 8.2329622e-06 + local_1bb8 * -0.00236661419 + 3.19860411;
          local_558[9] = local_6b8 * 2.54385734e-12 +
                         local_648 * -6.87117425e-09 +
                         local_768 * 5.73021856e-06 + local_1bb8 * 0.00201095175 + 2.6735904;
          local_558[10] =
               local_6b8 * 1.66693956e-11 +
               local_648 * -4.84743026e-08 +
               local_768 * 4.91800599e-05 + local_1bb8 * -0.0136709788 + 4.14987613;
          local_558[0xb] =
               local_6b8 * -9.04424499e-13 +
               local_648 * 9.07005884e-10 +
               local_768 * 1.01681433e-06 + local_1bb8 * -0.00061035368 + 2.57953347;
          local_558[0xc] =
               local_6b8 * -1.43699548e-13 +
               local_648 * 2.45919022e-09 +
               local_768 * -7.12356269e-06 + local_1bb8 * 0.00898459677 + 1.35677352;
          local_558[0xd] =
               local_6b8 * 4.33768865e-12 +
               local_648 * -1.33144093e-08 +
               local_768 * 1.37799446e-05 + local_1bb8 * -0.00324392532 + 3.22118584;
          local_558[0xe] =
               local_6b8 * 1.31772652e-11 +
               local_648 * -3.79285261e-08 +
               local_768 * 3.73220008e-05 + local_1bb8 * -0.00990833369 + 3.79372315;
          local_558[0xf] =
               local_6b8 * 2.07561e-12 +
               local_648 * -7.377636e-09 +
               local_768 * 5.338472e-06 + local_1bb8 * 0.007216595 + 1.106204;
          local_558[0x10] =
               local_6b8 * 2.69884373e-11 +
               local_648 * -6.91588753e-08 +
               local_768 * 5.70990292e-05 + local_1bb8 * -0.00757052247 + 2.95920148;
          local_558[0x11] =
               local_6b8 * 2.30509004e-11 +
               local_648 * -5.99126606e-08 +
               local_768 * 4.97142807e-05 + local_1bb8 * -0.00418658892 + 3.30646568;
          local_558[0x12] =
               local_6b8 * 2.68685771e-11 +
               local_648 * -7.08466285e-08 +
               local_768 * 5.99438288e-05 + local_1bb8 * -0.0055015427 + 3.29142492;
          dVar43 = local_648 * 5.641515e-09 +
                   local_768 * -3.963222e-06 + local_1bb8 * 0.0014082404 + 2.298677;
          dVar19 = local_6b8 * -2.444854e-12;
        }
        local_558[0x13] = dVar19 + dVar43;
        local_558[0x14] = local_318 + 1.5 + local_328 + (double)local_338._0_8_ + local_378;
        if (1000.0 <= local_1bb8) {
          local_4a8[0] = local_648 * 8.01021504e-14 +
                         local_768 * -5.38699182e-10 + local_1bb8 * 9.98913556e-07 + -4.94024731e-05
          ;
          local_4a8[1] = local_648 * 1.99278943e-21 +
                         local_768 * -1.42054571e-17 + local_1bb8 * 3.23123896e-14 + -2.30842973e-11
          ;
          local_4a8[2] = local_648 * 4.91334764e-15 +
                         local_768 * -3.00533397e-11 + local_1bb8 * 8.38969178e-08 + -8.59741137e-05
          ;
          local_4a8[3] = local_648 * -8.66871176e-14 +
                         local_768 * 6.28411665e-10 + local_1bb8 * -1.51593334e-06 + 0.00148308754;
          local_4a8[4] = local_648 * 4.69649504e-14 +
                         local_768 * -2.63838467e-10 + local_1bb8 * 2.53010456e-07 + 0.000548429716;
          local_4a8[5] = local_648 * 6.72803968e-14 +
                         local_768 * -2.91125961e-10 + local_1bb8 * -3.28145036e-07 + 0.00217691804;
          local_4a8[6] = local_648 * -4.3163414e-14 +
                         local_768 * 3.4273911e-10 + local_1bb8 * -1.2673163e-06 + 0.00223982013;
          local_4a8[7] = local_648 * -7.50910268e-14 +
                         local_768 * 7.80538647e-10 + local_1bb8 * -2.81789194e-06 + 0.00365639292;
          local_4a8[8] = local_648 * -1.35886546e-13 +
                         local_768 * 1.253718e-09 + local_1bb8 * -4.02383894e-06 + 0.00465588637;
          local_4a8[9] = local_648 * -1.86861758e-13 +
                         local_768 * 1.78705393e-09 + local_1bb8 * -5.97428696e-06 + 0.00723990037;
          local_4a8[10] =
               local_648 * -4.0726092e-13 +
               local_768 * 3.66877605e-09 + local_1bb8 * -1.14657162e-05 + 0.0133909467;
          local_4a8[0xb] =
               local_648 * -8.14590864e-14 +
               local_768 * 6.90159024e-10 + local_1bb8 * -1.99765154e-06 + 0.00206252743;
          local_4a8[0xc] =
               local_648 * -1.88833666e-13 +
               local_768 * 1.57047056e-09 + local_1bb8 * -4.42962808e-06 + 0.00441437026;
          local_4a8[0xd] =
               local_648 * -2.13403484e-13 +
               local_768 * 1.76748533e-09 + local_1bb8 * -4.96891226e-06 + 0.00495695526;
          local_4a8[0xe] =
               local_648 * -3.53542256e-13 +
               local_768 * 3.01923636e-09 + local_1bb8 * -8.84517626e-06 + 0.00920000082;
          local_4a8[0xf] =
               local_648 * -8.450464e-14 +
               local_768 * 1.1833293e-09 + local_1bb8 * -5.312768e-06 + 0.007871497;
          local_4a8[0x10] =
               local_648 * -5.02824244e-13 +
               local_768 * 4.41668769e-09 + local_1bb8 * -1.34215583e-05 + 0.0146454151;
          local_4a8[0x11] =
               local_648 * -5.98566304e-13 +
               local_768 * 5.25653067e-09 + local_1bb8 * -1.59641334e-05 + 0.0173972722;
          local_4a8[0x12] =
               local_648 * -7.6001156e-13 +
               local_768 * 6.64236003e-09 + local_1bb8 * -2.00512134e-05 + 0.0216852677;
          dVar43 = local_768 * 3.0291114e-10 + local_1bb8 * -1.136952e-06 + 0.0014879768;
          dVar19 = local_648 * -2.7013404e-14;
        }
        else {
          local_4a8[0] = local_648 * -2.95044704e-11 +
                         local_768 * 6.04716282e-08 + local_1bb8 * -3.8956302e-05 + 0.00798052075;
          local_4a8[1] = local_648 * -3.71092933e-21 +
                         local_768 * 6.90244896e-18 + local_1bb8 * -3.99183928e-15 + 7.05332819e-13;
          local_4a8[2] = local_648 * 8.45063884e-12 +
                         local_768 * -1.83841987e-08 + local_1bb8 * 1.32861279e-05 + -0.00327931884;
          local_4a8[3] = local_648 * 1.29749135e-11 +
                         local_768 * -2.90438853e-08 + local_1bb8 * 1.9694604e-05 + -0.00299673416;
          local_4a8[4] = local_648 * 5.4564588e-12 +
                         local_768 * -1.16434e-08 + local_1bb8 * 9.23587682e-06 + -0.00240131752;
          local_4a8[5] = local_648 * 7.08791268e-12 +
                         local_768 * -1.64639119e-08 + local_1bb8 * 1.30408042e-05 + -0.0020364341;
          local_4a8[6] = local_648 * 3.7169005e-11 +
                         local_768 * -7.28291682e-08 + local_1bb8 * 4.23165782e-05 + -0.00474912051;
          local_4a8[7] = local_648 * 6.74966876e-12 +
                         local_768 * -1.15527346e-08 + local_1bb8 * 5.58979682e-06 + 0.000968872143;
          local_4a8[8] = local_648 * 7.77258948e-12 +
                         local_768 * -2.00644794e-08 + local_1bb8 * 1.64659244e-05 + -0.00236661419;
          local_4a8[9] = local_648 * 1.01754294e-11 +
                         local_768 * -2.06135228e-08 + local_1bb8 * 1.14604371e-05 + 0.00201095175;
          local_4a8[10] =
               local_648 * 6.66775824e-11 +
               local_768 * -1.45422908e-07 + local_1bb8 * 9.83601198e-05 + -0.0136709788;
          local_4a8[0xb] =
               local_648 * -3.617698e-12 +
               local_768 * 2.72101765e-09 + local_1bb8 * 2.03362866e-06 + -0.00061035368;
          local_4a8[0xc] =
               local_648 * -5.74798192e-13 +
               local_768 * 7.37757066e-09 + local_1bb8 * -1.42471254e-05 + 0.00898459677;
          local_4a8[0xd] =
               local_648 * 1.73507546e-11 +
               local_768 * -3.99432279e-08 + local_1bb8 * 2.75598892e-05 + -0.00324392532;
          local_4a8[0xe] =
               local_648 * 5.27090608e-11 +
               local_768 * -1.13785578e-07 + local_1bb8 * 7.46440016e-05 + -0.00990833369;
          local_4a8[0xf] =
               local_648 * 8.30244e-12 +
               local_768 * -2.2132908e-08 + local_1bb8 * 1.0676944e-05 + 0.007216595;
          local_4a8[0x10] =
               local_648 * 1.07953749e-10 +
               local_768 * -2.07476626e-07 + local_1bb8 * 0.000114198058 + -0.00757052247;
          local_4a8[0x11] =
               local_648 * 9.22036016e-11 +
               local_768 * -1.79737982e-07 + local_1bb8 * 9.94285614e-05 + -0.00418658892;
          local_4a8[0x12] =
               local_648 * 1.07474308e-10 +
               local_768 * -2.12539886e-07 + local_1bb8 * 0.000119887658 + -0.0055015427;
          dVar43 = local_768 * 1.6924545e-08 + local_1bb8 * -7.926444e-06 + 0.0014082404;
          dVar19 = local_648 * -9.779416e-12;
        }
        local_4a8[0x13] = dVar19 + dVar43;
        local_4a8[0x14] = local_318 + 0.0 + local_328 + (double)local_338._0_8_;
        if (1000.0 <= local_1bb8) {
          local_2f8 = dVar42 * -950.158922 +
                      local_6b8 * 4.00510752e-15 +
                      local_648 * -4.48915985e-11 +
                      local_768 * 1.66485593e-07 + local_1bb8 * -2.47012365e-05 + 2.3372792;
          dStack_2f0 = dVar42 * 25473.6599 +
                       local_6b8 * 9.96394714e-23 +
                       local_648 * -1.18378809e-18 +
                       local_768 * 5.38539827e-15 + local_1bb8 * -1.15421486e-11 + 1.50000001;
          local_2e8 = dVar42 * 29217.5791 +
                      local_6b8 * 2.45667382e-16 +
                      local_648 * -2.50444497e-12 +
                      local_768 * 1.39828196e-08 + local_1bb8 * -4.29870569e-05 + 1.56942078;
          dStack_2e0 = dVar42 * -1088.45772 +
                       local_6b8 * -4.33435588e-15 +
                       local_648 * 5.23676387e-11 +
                       local_768 * -2.52655556e-07 + local_1bb8 * 0.00074154377 + 2.28253784;
          local_2d8 = dVar42 * 3858.657 +
                      local_6b8 * 2.34824752e-15 +
                      local_648 * -2.19865389e-11 +
                      local_768 * 4.21684093e-08 + local_1bb8 * 0.000274214858 + 2.09288767;
          dStack_2d0 = dVar42 * -30004.2971 +
                       local_6b8 * 3.36401984e-15 +
                       local_648 * -2.42604967e-11 +
                       local_768 * -5.46908393e-08 + local_1bb8 * 0.00108845902 + 2.03399249;
          local_2c8 = dVar42 * 111.856713 +
                      local_6b8 * -2.1581707e-15 +
                      local_648 * 2.85615925e-11 +
                      local_768 * -2.11219383e-07 + local_1bb8 * 0.00111991006 + 3.0172109;
          dStack_2c0 = dVar42 * 46263.604 +
                       local_6b8 * -3.75455134e-15 +
                       local_648 * 6.50448872e-11 +
                       local_768 * -4.69648657e-07 + local_1bb8 * 0.00182819646 + 1.87410113;
          local_2b8 = dVar42 * 50925.9997 +
                      local_6b8 * -6.7943273e-15 +
                      local_648 * 1.044765e-10 +
                      local_768 * -6.70639823e-07 + local_1bb8 * 0.00232794318 + 1.29203842;
          dStack_2b0 = dVar42 * 16775.5843 +
                       local_6b8 * -9.34308788e-15 +
                       local_648 * 1.48921161e-10 +
                       local_768 * -9.95714493e-07 + local_1bb8 * 0.00361995018 + 1.28571772;
          local_2a8 = dVar42 * -9468.34459 +
                      local_6b8 * -2.0363046e-14 +
                      local_648 * 3.05731338e-10 +
                      local_768 * -1.9109527e-06 + local_1bb8 * 0.00669547335 + -0.925148505;
          dStack_2a0 = dVar42 * -14151.8724 +
                       local_6b8 * -4.07295432e-15 +
                       local_648 * 5.7513252e-11 +
                       local_768 * -3.32941924e-07 + local_1bb8 * 0.00103126372 + 1.71518561;
          local_298 = dVar42 * -48759.166 +
                      local_6b8 * -9.44168328e-15 +
                      local_648 * 1.30872547e-10 +
                      local_768 * -7.38271347e-07 + local_1bb8 * 0.00220718513 + 2.85746029;
          dStack_290 = dVar42 * 4011.91815 +
                       local_6b8 * -1.06701742e-14 +
                       local_648 * 1.47290445e-10 +
                       local_768 * -8.28152043e-07 + local_1bb8 * 0.00247847763 + 1.77217438;
          local_288 = dVar42 * -13995.8323 +
                      local_6b8 * -1.76771128e-14 +
                      local_648 * 2.5160303e-10 +
                      local_768 * -1.47419604e-06 + local_1bb8 * 0.00460000041 + 0.76069008;
          dStack_280 = dVar42 * 127.83252 +
                       local_6b8 * -4.225232e-15 +
                       local_648 * 9.8610775e-11 +
                       local_768 * -8.85461333e-07 + local_1bb8 * 0.0039357485 + 2.770799;
          local_278 = dVar42 * 4939.88614 +
                      local_6b8 * -2.51412122e-14 +
                      local_648 * 3.68057308e-10 +
                      local_768 * -2.23692638e-06 + local_1bb8 * 0.00732270755 + 1.03611116;
          dStack_270 = dVar42 * 12857.52 +
                       local_6b8 * -2.99283152e-14 +
                       local_648 * 4.38044223e-10 +
                       local_768 * -2.66068889e-06 + local_1bb8 * 0.0086986361 + 0.95465642;
          local_268 = dVar42 * -11426.3932 +
                      local_6b8 * -3.8000578e-14 +
                      local_648 * 5.53530003e-10 +
                      local_768 * -3.3418689e-06 + local_1bb8 * 0.0108426339 + 0.0718815;
          dVar43 = local_6b8 * -1.3506702e-15 +
                   local_648 * 2.5242595e-11 +
                   local_768 * -1.89492e-07 + local_1bb8 * 0.0007439884 + 1.92664;
          dVar19 = dVar42 * -922.7977;
        }
        else {
          local_2f8 = dVar42 * -917.935173 +
                      local_6b8 * -1.47522352e-12 +
                      local_648 * 5.03930235e-09 +
                      local_768 * -6.492717e-06 + local_1bb8 * 0.00399026037 + 1.34433112;
          dStack_2f0 = dVar42 * 25473.6599 +
                       local_6b8 * -1.85546466e-22 +
                       local_648 * 5.7520408e-19 +
                       local_768 * -6.65306547e-16 + local_1bb8 * 3.52666409e-13 + 1.5;
          local_2e8 = dVar42 * 29122.2592 +
                      local_6b8 * 4.22531942e-13 +
                      local_648 * -1.53201656e-09 +
                      local_768 * 2.21435465e-06 + local_1bb8 * -0.00163965942 + 2.1682671;
          dStack_2e0 = dVar42 * -1063.94356 +
                       local_6b8 * 6.48745674e-13 +
                       local_648 * -2.42032377e-09 +
                       local_768 * 3.282434e-06 + local_1bb8 * -0.00149836708 + 2.78245636;
          local_2d8 = dVar42 * 3615.08056 +
                      local_6b8 * 2.7282294e-13 +
                      local_648 * -9.70283332e-10 +
                      local_768 * 1.5393128e-06 + local_1bb8 * -0.00120065876 + 2.99201543;
          dStack_2d0 = dVar42 * -30293.7267 +
                       local_6b8 * 3.54395634e-13 +
                       local_648 * -1.37199266e-09 +
                       local_768 * 2.17346737e-06 + local_1bb8 * -0.00101821705 + 3.19864056;
          local_2c8 = dVar42 * 294.80804 +
                      local_6b8 * 1.85845025e-12 +
                      local_648 * -6.06909735e-09 +
                      local_768 * 7.05276303e-06 + local_1bb8 * -0.00237456025 + 3.30179801;
          dStack_2c0 = dVar42 * 46004.0401 +
                       local_6b8 * 3.37483438e-13 +
                       local_648 * -9.62727883e-10 +
                       local_768 * 9.31632803e-07 + local_1bb8 * 0.000484436072 + 2.76267867;
          local_2b8 = dVar42 * 50496.8163 +
                      local_6b8 * 3.88629474e-13 +
                      local_648 * -1.67203995e-09 +
                      local_768 * 2.74432073e-06 + local_1bb8 * -0.0011833071 + 3.19860411;
          dStack_2b0 = dVar42 * 16444.9988 +
                       local_6b8 * 5.08771468e-13 +
                       local_648 * -1.71779356e-09 +
                       local_768 * 1.91007285e-06 + local_1bb8 * 0.00100547588 + 2.6735904;
          local_2a8 = dVar42 * -10246.6476 +
                      local_6b8 * 3.33387912e-12 +
                      local_648 * -1.21185757e-08 +
                      local_768 * 1.63933533e-05 + local_1bb8 * -0.0068354894 + 4.14987613;
          dStack_2a0 = dVar42 * -14344.086 +
                       local_6b8 * -1.808849e-13 +
                       local_648 * 2.26751471e-10 +
                       local_768 * 3.3893811e-07 + local_1bb8 * -0.00030517684 + 2.57953347;
          local_298 = dVar42 * -48371.9697 +
                      local_6b8 * -2.87399096e-14 +
                      local_648 * 6.14797555e-10 +
                      local_768 * -2.3745209e-06 + local_1bb8 * 0.00449229839 + 1.35677352;
          dStack_290 = dVar42 * 3839.56496 +
                       local_6b8 * 8.6753773e-13 +
                       local_648 * -3.32860233e-09 +
                       local_768 * 4.59331487e-06 + local_1bb8 * -0.00162196266 + 3.22118584;
          local_288 = dVar42 * -14308.9567 +
                      local_6b8 * 2.63545304e-12 +
                      local_648 * -9.48213152e-09 +
                      local_768 * 1.24406669e-05 + local_1bb8 * -0.00495416684 + 3.79372315;
          dStack_280 = dVar42 * 978.6011 +
                       local_6b8 * 4.15122e-13 +
                       local_648 * -1.844409e-09 +
                       local_768 * 1.77949067e-06 + local_1bb8 * 0.0036082975 + 1.106204;
          local_278 = dVar42 * 5089.77593 +
                      local_6b8 * 5.39768746e-12 +
                      local_648 * -1.72897188e-08 +
                      local_768 * 1.90330097e-05 + local_1bb8 * -0.00378526124 + 2.95920148;
          dStack_270 = dVar42 * 12841.6265 +
                       local_6b8 * 4.61018008e-12 +
                       local_648 * -1.49781651e-08 +
                       local_768 * 1.65714269e-05 + local_1bb8 * -0.00209329446 + 3.30646568;
          local_268 = dVar42 * -11522.2055 +
                      local_6b8 * 5.37371542e-12 +
                      local_648 * -1.77116571e-08 +
                      local_768 * 1.99812763e-05 + local_1bb8 * -0.00275077135 + 3.29142492;
          dVar43 = local_6b8 * -4.889708e-13 +
                   local_648 * 1.41037875e-09 +
                   local_768 * -1.321074e-06 + local_1bb8 * 0.0007041202 + 2.298677;
          dVar19 = dVar42 * -1020.8999;
        }
        local_260 = dVar19 + dVar43;
        local_258 = dVar42 * -745.375 +
                    local_378 + (double)local_338._0_8_ + local_328 + local_318 + 1.5;
        pdVar13 = &local_2f8;
      }
      dVar43 = 0.0;
      dVar20 = 0.0;
      dVar19 = 0.0;
      lVar12 = 0;
      dVar118 = 0.0;
      do {
        dVar118 = dVar118 + *(double *)((long)local_558 + lVar12) *
                            *(double *)((long)local_1df8 + lVar12);
        dVar22 = *(double *)((long)pdVar13 + lVar12);
        dVar43 = dVar43 + *(double *)((long)local_1df8 + lVar12) *
                          *(double *)((long)local_4a8 + lVar12);
        dVar20 = dVar20 + *(double *)((long)local_1f38 + lVar12) * dVar22;
        dVar19 = dVar19 + (*(double *)((long)local_558 + lVar12) - dVar22) * dVar42 *
                          *(double *)((long)local_1f38 + lVar12) +
                          dVar22 * *(double *)((long)local_828 + lVar12);
        lVar12 = lVar12 + 8;
      } while (lVar12 != 0xa8);
      dVar20 = dVar20 * (1.0 / dVar118);
      dVar42 = local_1bb8 * (1.0 / dVar118);
      dVar118 = dVar20 * dVar42;
      dVar42 = -dVar42;
      lVar12 = 0;
      pdVar14 = __s;
      do {
        dVar22 = 0.0;
        lVar16 = 0;
        do {
          dVar22 = dVar22 + pdVar13[lVar16] * pdVar14[lVar16];
          lVar16 = lVar16 + 1;
        } while (lVar16 != 0x15);
        local_15f0[lVar12 * 0x16] = local_558[lVar12] * dVar118 + dVar22 * dVar42;
        lVar12 = lVar12 + 1;
        pdVar14 = pdVar14 + 0x16;
      } while (lVar12 != 0x15);
      local_780 = dVar42 * dVar19 + (dVar118 * dVar43 - dVar20);
      pdVar13 = local_15f0;
      lVar12 = 0;
      do {
        local_828[lVar12] = local_828[lVar12] * 1e-06;
        *pdVar13 = *pdVar13 * 1000000.0;
        lVar12 = lVar12 + 1;
        pdVar13 = pdVar13 + 0x16;
      } while (lVar12 != 0x15);
      lVar12 = *(long *)((long)local_358->content + 0x18);
      lVar16 = 0;
      pdVar13 = __s;
      do {
        lVar2 = *(long *)(lVar12 + lVar15 * 0xb0 + lVar16 * 8);
        dVar42 = local_238[lVar16];
        lVar17 = 0;
        do {
          *(double *)(lVar2 + lVar18 + lVar17 * 8) = (pdVar13[lVar17] * local_238[lVar17]) / dVar42;
          lVar17 = lVar17 + 1;
        } while (lVar17 != 0x15);
        *(double *)(lVar2 + 0xa8 + lVar15 * 0xb0) = local_15f0[lVar16 * 0x16] / dVar42;
        lVar16 = lVar16 + 1;
        pdVar13 = pdVar13 + 0x16;
      } while (lVar16 != 0x15);
      lVar12 = *(long *)(lVar12 + 0xa8 + lVar15 * 0xb0);
      lVar16 = 0;
      do {
        *(double *)(lVar12 + lVar18 + lVar16 * 8) = local_828[lVar16] * local_238[lVar16];
        lVar16 = lVar16 + 1;
      } while (lVar16 != 0x15);
      lVar15 = lVar15 + 1;
      prVar11 = prVar11 + 0x16;
      lVar18 = lVar18 + 0xb0;
    } while (lVar15 != local_360);
  }
  return 0;
}

Assistant:

int
cJac(
  amrex::Real /* tn */,
  N_Vector u,
  N_Vector /* fu */,
  SUNMatrix J,
  void* user_data,
  N_Vector /* tmp1 */,
  N_Vector /* tmp2 */,
  N_Vector /* tmp3 */)
{
  BL_PROFILE("Pele::ReactorCvode::cJacDense()");

  // Make local copies of pointers to input data
  amrex::Real* ydata = N_VGetArrayPointer(u);

  // Make local copies of pointers in user_data
  auto* udata = static_cast<CVODEUserData*>(user_data);
  auto ncells = udata->ncells;
  auto reactor_type = udata->reactor_type;

  for (int tid = 0; tid < ncells; tid++) {
    // Offset in case several cells
    int offset = tid * (NUM_SPECIES + 1);

    // MW CGS
    amrex::Real mw[NUM_SPECIES] = {0.0};
    get_mw(mw);

    // rho MKS
    amrex::Real rho = 0.0;
    for (int i = 0; i < NUM_SPECIES; i++) {
      rho = rho + ydata[offset + i];
    }

    amrex::Real temp = ydata[offset + NUM_SPECIES];

    amrex::Real massfrac[NUM_SPECIES] = {0.0};
    // Yks
    for (int i = 0; i < NUM_SPECIES; i++) {
      massfrac[i] = ydata[offset + i] / rho;
    }

    // Jac
    amrex::Real Jmat_tmp[(NUM_SPECIES + 1) * (NUM_SPECIES + 1)] = {0.0};
    const int consP =
      static_cast<int>(reactor_type == ReactorTypes::h_reactor_type);
    auto eos = pele::physics::PhysicsType::eos();
    eos.RTY2JAC(rho, temp, massfrac, Jmat_tmp, consP);

    // fill the sunMat and scale
    for (int i = 0; i < NUM_SPECIES; i++) {
      // cppcheck-suppress cstyleCast
      amrex::Real* J_col = SM_COLUMN_D(J, offset + i);
      for (int k = 0; k < NUM_SPECIES; k++) {
        J_col[offset + k] = Jmat_tmp[i * (NUM_SPECIES + 1) + k] * mw[k] / mw[i];
      }
      J_col[offset + NUM_SPECIES] =
        Jmat_tmp[i * (NUM_SPECIES + 1) + NUM_SPECIES] / mw[i];
    }
    // cppcheck-suppress cstyleCast
    amrex::Real* J_col = SM_COLUMN_D(J, offset + NUM_SPECIES);
    for (int i = 0; i < NUM_SPECIES; i++) {
      J_col[offset + i] = Jmat_tmp[NUM_SPECIES * (NUM_SPECIES + 1) + i] * mw[i];
    }
    // J_col = SM_COLUMN_D(J, offset); // Never read
  }

  return (0);
}